

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol_edge_state.cpp
# Opt level: O2

void EBMOL::ComputeEdgeState
               (Box *bx,Array4<double> *xedge,Array4<double> *yedge,Array4<double> *zedge,
               Array4<const_double> *q,int ncomp,Array4<const_double> *umac,
               Array4<const_double> *vmac,Array4<const_double> *wmac,Box *domain,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Array4<const_double> *fcx,Array4<const_double> *fcy,Array4<const_double> *fcz,
               Array4<const_double> *ccc,Array4<const_double> *vfrac,
               Array4<const_amrex::EBCellFlag> *flag,bool is_velocity)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uint uVar18;
  BCRec *bcrec;
  long lVar19;
  long lVar20;
  double *pdVar21;
  long lVar22;
  long lVar23;
  double *pdVar24;
  long lVar25;
  double *pdVar26;
  double *pdVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  double *pdVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  double *pdVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  double *pdVar40;
  EBCellFlag *pEVar41;
  double *pdVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined4 uVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  undefined4 uVar49;
  undefined4 uVar50;
  undefined4 uVar51;
  undefined4 uVar52;
  undefined4 uVar53;
  undefined4 uVar54;
  undefined4 uVar55;
  undefined4 uVar56;
  undefined4 uVar57;
  undefined4 uVar58;
  undefined4 uVar59;
  undefined4 uVar60;
  undefined4 uVar61;
  undefined4 uVar62;
  undefined4 uVar63;
  undefined4 uVar64;
  undefined4 uVar65;
  undefined4 uVar66;
  undefined4 uVar67;
  undefined4 uVar68;
  undefined4 uVar69;
  undefined4 uVar70;
  undefined4 uVar71;
  undefined4 uVar72;
  undefined4 uVar73;
  undefined4 uVar74;
  undefined4 uVar75;
  undefined4 uVar76;
  undefined4 uVar77;
  undefined4 uVar78;
  undefined4 uVar79;
  undefined4 uVar80;
  undefined4 uVar81;
  undefined4 uVar82;
  undefined4 uVar83;
  undefined4 uVar84;
  undefined4 uVar85;
  undefined4 uVar86;
  undefined4 uVar87;
  undefined4 uVar88;
  undefined4 uVar89;
  undefined4 uVar90;
  pair<bool,_bool> pVar91;
  pair<bool,_bool> pVar92;
  int iVar93;
  int iVar94;
  int iVar95;
  int iVar96;
  int iVar97;
  int iVar98;
  int iVar99;
  int iVar100;
  int iVar101;
  ulong uVar102;
  long lVar103;
  long lVar104;
  long lVar105;
  long lVar106;
  long lVar107;
  long lVar108;
  double *pdVar109;
  long lVar110;
  long lVar111;
  double *pdVar112;
  Real *pRVar113;
  int iVar114;
  int iVar115;
  int iVar116;
  int iVar117;
  int iVar118;
  int iVar119;
  long lVar120;
  long lVar121;
  long lVar122;
  long lVar123;
  long lVar124;
  long lVar125;
  long lVar126;
  long lVar127;
  long lVar128;
  long lVar129;
  long lVar130;
  long lVar131;
  long lVar132;
  double *pdVar133;
  ulong uVar134;
  int iVar135;
  int iVar136;
  int iVar137;
  int iVar138;
  int iVar139;
  long lVar140;
  long lVar141;
  long lVar142;
  long lVar143;
  long lVar144;
  long lVar145;
  long lVar146;
  long lVar147;
  long lVar148;
  long lVar149;
  long lVar150;
  long lVar151;
  int kk_14;
  int iVar152;
  int iVar153;
  int n;
  int iVar154;
  int iVar155;
  int iVar156;
  int iVar157;
  int iVar158;
  long lVar159;
  long lVar160;
  long lVar161;
  long lVar162;
  Real (*paRVar163) [3];
  long lVar164;
  long lVar165;
  char cVar166;
  int iVar167;
  long lVar168;
  long lVar169;
  long lVar170;
  long lVar171;
  long lVar172;
  long lVar173;
  int iVar174;
  long lVar175;
  int kk_28;
  long lVar176;
  long lVar177;
  long lVar178;
  int kk;
  int iVar179;
  long lVar180;
  long lVar181;
  int kk_15;
  int iVar182;
  int iVar183;
  long lVar184;
  long lVar185;
  int cuts_x;
  int iVar186;
  int iVar187;
  int iVar188;
  long lVar189;
  long lVar190;
  int iVar191;
  long lVar192;
  long lVar193;
  long lVar194;
  char cVar195;
  int kk_31;
  int iVar196;
  long lVar197;
  long lVar198;
  long lVar199;
  bool bVar200;
  bool bVar201;
  ulong uVar202;
  ulong uVar203;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  double dVar209;
  Real RVar210;
  double dVar211;
  double dVar212;
  EBCellFlag *pEVar213;
  EBCellFlag *pEVar214;
  undefined1 auVar215 [16];
  double dVar216;
  ulong uVar217;
  undefined4 uVar218;
  undefined4 uVar219;
  undefined4 uVar220;
  undefined4 uVar221;
  double dVar222;
  undefined1 auVar223 [16];
  double dVar224;
  double dVar225;
  double dVar226;
  double dVar227;
  double dVar232;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  double dVar233;
  double dVar235;
  undefined1 auVar234 [16];
  Real delta_z;
  double dVar236;
  double dVar237;
  double dVar238;
  double dVar239;
  double dVar240;
  double dVar241;
  double dVar242;
  Real delta_x;
  Real delta_z_1;
  double dVar243;
  double dVar247;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  double dVar248;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  double dStack_9f0;
  long local_9e0;
  long local_968;
  double *local_950;
  double *local_840;
  double *local_838;
  double *local_830;
  double *local_808;
  double *local_800;
  double *local_740;
  double *local_738;
  double *local_730;
  double local_668 [9];
  int local_620;
  undefined4 uStack_61c;
  int local_4c8;
  Array4<double> *local_4b8;
  long local_4b0;
  double local_4a8;
  double local_4a0;
  double dStack_498;
  double local_488;
  double dStack_480;
  double local_468;
  double local_458;
  double local_448;
  EBCellFlag *local_438;
  long local_428;
  double *local_420;
  double *local_418;
  double *local_410;
  long local_408;
  double *local_400;
  Long local_3f8;
  long local_3f0;
  Long local_3e8;
  EBCellFlag *local_3e0;
  long local_3d8;
  Long local_3d0;
  double *local_3c8;
  long local_3c0;
  double *local_3b8;
  double *local_3a8;
  double *local_3a0;
  Real du [27];
  Real A [27] [3];
  
  iVar1 = (bx->smallend).vect[0];
  iVar2 = (bx->smallend).vect[1];
  iVar3 = (bx->smallend).vect[2];
  iVar4 = (bx->bigend).vect[0];
  iVar135 = (bx->bigend).vect[1];
  local_4b0 = (long)iVar135;
  uVar5 = (bx->btype).itype;
  iVar135 = iVar135 + (uint)((uVar5 & 2) == 0);
  iVar196 = (bx->bigend).vect[2];
  _local_620 = CONCAT44(uStack_61c,iVar196 + (uint)((uVar5 & 4) == 0));
  bcrec = (bcs->super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>).
          super__Vector_base<amrex::BCRec,_std::allocator<amrex::BCRec>_>._M_impl.
          super__Vector_impl_data._M_start;
  iVar114 = (~uVar5 & 1) + iVar4;
  iVar154 = (domain->smallend).vect[0];
  iVar182 = (domain->smallend).vect[2];
  iVar152 = (domain->bigend).vect[0];
  iVar188 = (domain->bigend).vect[2];
  iVar191 = 0;
  local_4b8 = zedge;
  pVar91 = anon_unknown.dwarf_605a40::has_extdir_or_ho(bcrec,ncomp,0);
  pVar92 = anon_unknown.dwarf_605a40::has_extdir_or_ho(bcrec,ncomp,2);
  iVar93 = iVar1 + -1;
  if ((iVar154 < iVar93 || (~pVar91.first & 1U) != 0) &&
     (((ushort)pVar91 >> 8 & 1) == 0 || iVar114 < iVar152)) {
    pVar91 = anon_unknown.dwarf_605a40::has_extdir_or_ho(bcrec,ncomp,1);
    if (((domain->smallend).vect[1] < iVar2 + -1 || (~pVar91.first & 1U) != 0) &&
       (((ushort)pVar91 >> 8 & 1) == 0 || iVar135 < (domain->bigend).vect[1])) {
      if ((iVar182 < iVar3 + -1 || (~pVar92.first & 1U) != 0) &&
         (((ushort)pVar92 >> 8 & 1) == 0 || local_620 < iVar188)) {
        local_3c0 = (long)iVar2;
        lVar120 = (long)iVar3;
        lVar19 = ccc->kstride;
        lVar20 = ccc->nstride;
        iVar2 = (ccc->begin).x;
        lVar184 = (long)iVar2;
        iVar3 = (ccc->begin).z;
        pdVar21 = umac->p;
        uVar102 = (ulong)(uint)ncomp;
        if (ncomp < 1) {
          uVar102 = 0;
        }
        lVar140 = (~(long)iVar3 + lVar120) * lVar19;
        lVar22 = umac->jstride;
        lVar23 = umac->kstride;
        iVar182 = (umac->begin).x;
        iVar188 = (umac->begin).y;
        iVar191 = (umac->begin).z;
        pdVar24 = xedge->p;
        lVar25 = xedge->jstride;
        lVar146 = xedge->kstride;
        lVar199 = xedge->nstride;
        iVar6 = (xedge->begin).x;
        iVar7 = (xedge->begin).y;
        iVar8 = (xedge->begin).z;
        uVar5 = (vfrac->begin).y;
        lVar159 = (long)(int)uVar5;
        uVar9 = (vfrac->begin).z;
        lVar160 = (long)(int)uVar9;
        iVar152 = iVar152 + 1;
        uVar10 = (q->begin).x;
        pdVar26 = ccc->p;
        iVar11 = (ccc->begin).y;
        pdVar27 = q->p;
        lVar28 = q->jstride;
        lVar29 = q->kstride;
        lVar30 = q->nstride;
        iVar12 = (q->begin).y;
        iVar13 = (q->begin).z;
        lVar31 = ccc->jstride;
        pdVar32 = fcx->p;
        lVar33 = fcx->jstride;
        lVar34 = fcx->kstride;
        lVar35 = fcx->nstride;
        iVar14 = (fcx->begin).x;
        iVar15 = (fcx->begin).y;
        iVar16 = (fcx->begin).z;
        pdVar36 = fcy->p;
        lVar37 = fcy->jstride;
        lVar38 = fcy->kstride;
        lVar39 = fcy->nstride;
        iVar101 = (fcy->begin).x;
        iVar179 = (fcy->begin).y;
        iVar158 = (fcy->begin).z;
        pdVar40 = fcz->p;
        lVar151 = fcz->jstride;
        lVar107 = fcz->kstride;
        lVar147 = fcz->nstride;
        iVar117 = (fcz->begin).x;
        iVar118 = (fcz->begin).y;
        iVar17 = (fcz->begin).z;
        pEVar41 = flag->p;
        lVar148 = flag->jstride;
        lVar149 = flag->kstride;
        local_448 = (double)(ulong)(uint)(flag->begin).x;
        iVar153 = (flag->begin).y;
        iVar99 = (flag->begin).z;
        pdVar42 = vfrac->p;
        lVar164 = vfrac->jstride;
        lVar165 = vfrac->kstride;
        iVar98 = (vfrac->begin).x;
        for (uVar134 = 0; uVar134 != uVar102; uVar134 = uVar134 + 1) {
          lVar141 = lVar30 * uVar134;
          lVar150 = lVar120;
          local_950 = pdVar26 + ((lVar140 + lVar20 * 2 + -1) - lVar184);
          local_808 = pdVar26 + ((lVar140 + -1) - lVar184);
          local_800 = pdVar26 + ((lVar140 + lVar20 + -1) - lVar184);
          while (lVar150 <= iVar196) {
            lVar142 = (lVar150 - iVar16) * lVar34;
            iVar138 = (int)lVar150;
            iVar155 = iVar138 - iVar3;
            lVar161 = iVar155 * lVar19;
            iVar167 = iVar138 - iVar13;
            lVar192 = iVar167 * lVar29;
            lVar197 = (lVar150 - lVar160) * lVar165;
            lVar176 = ((lVar150 + -1) - lVar160) * lVar165;
            lVar110 = lVar150 + 1;
            lVar185 = (lVar110 - lVar160) * lVar165;
            lVar180 = ((lVar150 + -1) - (long)iVar13) * lVar29;
            lVar177 = (lVar110 - iVar13) * lVar29;
            lVar168 = (lVar150 - iVar158) * lVar38;
            lVar169 = ((iVar138 - iVar17) + 1) * lVar107;
            lVar170 = (lVar150 - iVar17) * lVar107;
            lVar171 = (int)(~uVar9 + iVar138) * lVar165;
            lVar172 = (int)((iVar138 - uVar9) + 1) * lVar165;
            lVar173 = (lVar150 - iVar191) * lVar23;
            lVar181 = local_3c0;
            while (lVar181 <= local_4b0) {
              if (iVar114 < iVar1) {
                lVar181 = lVar181 + 1;
              }
              else {
                local_438 = pEVar41 + (lVar150 - iVar99) * lVar149 + (lVar181 - iVar153) * lVar148;
                lVar121 = (lVar181 - iVar15) * lVar33;
                iVar138 = (int)lVar181;
                iVar115 = iVar138 - iVar11;
                lVar122 = iVar115 * lVar31;
                iVar116 = iVar138 - iVar12;
                lVar123 = iVar116 * lVar28;
                lVar124 = (lVar181 - lVar159) * lVar164;
                lVar143 = ((lVar181 + -1) - lVar159) * lVar164;
                lVar194 = lVar181 + 1;
                lVar144 = (lVar194 - lVar159) * lVar164;
                lVar125 = ((lVar181 + -1) - (long)iVar12) * lVar28;
                lVar126 = (lVar194 - iVar12) * lVar28;
                lVar127 = ((iVar138 - iVar179) + 1) * lVar37;
                lVar128 = (lVar181 - iVar179) * lVar37;
                lVar129 = (lVar181 - iVar118) * lVar151;
                lVar130 = (int)(~uVar5 + iVar138) * lVar164;
                lVar131 = (int)((iVar138 - uVar5) + 1) * lVar164;
                lVar132 = (lVar181 - iVar188) * lVar22;
                lVar103 = lVar181 - iVar7;
                lVar145 = (~(long)iVar11 + lVar181) * lVar31 * 8;
                local_4c8 = iVar93;
                iVar100 = (iVar1 - uVar10) + -2;
                iVar183 = iVar93 - uVar10;
                iVar138 = iVar93 - iVar2;
                iVar139 = iVar1 - uVar10;
                iVar119 = iVar1;
                do {
                  uVar18 = local_438[iVar119 - local_448._0_4_].flag;
                  dVar222 = 0.0;
                  if ((uVar18 >> 0x11 & 1) != 0) {
                    lVar104 = (long)local_4c8;
                    local_9e0 = (long)local_808 + lVar104 * 8 + lVar145;
                    lVar181 = (long)local_800 + lVar104 * 8 + lVar145;
                    lVar104 = (long)local_950 + lVar104 * 8 + lVar145;
                    iVar94 = iVar119 - iVar14;
                    pdVar112 = pdVar32 + lVar142 + lVar121 + iVar94;
                    dVar222 = *pdVar112;
                    dVar248 = pdVar112[lVar35];
                    pdVar109 = pdVar26 + lVar161 + lVar122 + (iVar119 - iVar2);
                    dVar239 = *pdVar109;
                    dVar238 = pdVar109[lVar20];
                    dVar212 = pdVar109[lVar20 * 2];
                    lVar105 = (long)(int)(iVar119 - uVar10);
                    pdVar109 = pdVar27 + lVar123 + lVar105 + lVar192;
                    iVar95 = iVar119 + -1;
                    lVar106 = (long)(int)(iVar95 - uVar10);
                    dVar224 = pdVar109[lVar141];
                    dVar240 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                    cVar195 = '\x05';
                    iVar174 = 0;
                    for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                      iVar97 = (int)lVar162;
                      iVar186 = iVar174;
                      cVar166 = cVar195;
                      for (lVar193 = -1; iVar174 = iVar174 + 3, lVar193 != 2; lVar193 = lVar193 + 1)
                      {
                        lVar189 = (long)iVar186;
                        paRVar163 = A + lVar189;
                        iVar137 = (int)lVar193;
                        iVar186 = iVar186 + 3;
                        for (lVar178 = 0; iVar174 - lVar189 != lVar178; lVar178 = lVar178 + 1) {
                          iVar96 = (int)lVar178 + -1;
                          if (((iVar137 == 0 && iVar97 == 0) && iVar96 == 0) ||
                             ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            pdVar133 = pdVar26 + (iVar155 + iVar97) * lVar19 +
                                                 (iVar115 + iVar137) * lVar31 +
                                                 (long)(iVar138 + (int)lVar178);
                            dVar209 = pdVar133[lVar20];
                            (*paRVar163)[0] = (*pdVar133 + (double)iVar96) - dVar239;
                            (*paRVar163)[1] = (dVar209 + (double)iVar137) - dVar238;
                            (*paRVar163)[2] = (pdVar133[lVar20 * 2] + (double)iVar97) - dVar212;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                      iVar174 = iVar186;
                    }
                    dVar209 = dVar222 - dVar238;
                    local_3b8 = (double *)(dVar239 + 0.5);
                    iVar174 = 0;
                    cVar195 = '\x05';
                    for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                      iVar186 = iVar174;
                      cVar166 = cVar195;
                      for (lVar193 = -1; iVar186 = iVar186 + 3, lVar193 != 2; lVar193 = lVar193 + 1)
                      {
                        lVar178 = (long)iVar174;
                        iVar174 = iVar174 + 3;
                        for (lVar189 = 0; iVar186 - lVar178 != lVar189; lVar189 = lVar189 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar189 != 1 || ((int)lVar193 != 0 || (int)lVar162 != 0)) &&
                             ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar27[lVar141 + (iVar167 + (int)lVar162) * lVar29 +
                                                        (iVar116 + (int)lVar193) * lVar28 +
                                                        (long)(iVar183 + (int)lVar189)] - dVar224;
                          }
                          du[lVar178 + lVar189] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    local_458 = dVar240;
                    if (dVar240 <= dVar224) {
                      local_458 = dVar224;
                    }
                    pdVar133 = &local_4a8;
                    for (lVar162 = 0; lVar162 != 3; lVar162 = lVar162 + 1) {
                      for (lVar193 = -0x48; lVar193 != 0; lVar193 = lVar193 + 0x18) {
                        *(undefined8 *)((long)pdVar133 + lVar193 + 0x48) = 0;
                      }
                      local_668[lVar162] = 0.0;
                      pdVar133 = pdVar133 + 1;
                    }
                    pRVar113 = A[0] + 2;
                    dVar236 = local_468;
                    dVar233 = local_668[0];
                    dVar235 = local_4a8;
                    dVar243 = dStack_480;
                    dVar247 = local_4a0;
                    dVar225 = local_488;
                    dVar242 = dStack_498;
                    dVar227 = local_668[1];
                    dVar232 = local_668[2];
                    for (lVar162 = 0; lVar162 != 0x1b; lVar162 = lVar162 + 1) {
                      dVar216 = (*(Real (*) [3])(pRVar113 + -2))[0];
                      dVar226 = pRVar113[-1];
                      dVar211 = *pRVar113;
                      dVar225 = dVar225 + dVar226 * pRVar113[-1];
                      dVar242 = dVar242 + dVar216 * *pRVar113;
                      dVar243 = dVar243 + dVar211 * dVar226;
                      dVar247 = dVar247 + dVar226 * dVar216;
                      dVar236 = dVar236 + dVar211 * dVar211;
                      dVar211 = du[lVar162];
                      dVar233 = dVar233 + dVar216 * dVar211;
                      dVar235 = dVar235 + dVar216 * dVar216;
                      dVar227 = dVar227 + dVar211 * pRVar113[-1];
                      dVar232 = dVar232 + dVar211 * *pRVar113;
                      pRVar113 = pRVar113 + 3;
                    }
                    dVar211 = dVar247 * dVar236 - dVar242 * dVar243;
                    dVar226 = dVar247 * dVar232 - dVar242 * dVar227;
                    dVar216 = dVar247 * dVar243 + dVar242 * -dVar225;
                    dVar237 = dVar236 * dVar225 - dVar243 * dVar243;
                    dVar241 = dVar236 * dVar227 - dVar243 * dVar232;
                    dVar236 = dVar216 * dVar242 + (dVar237 * dVar235 - dVar211 * dVar247);
                    auVar228._8_8_ = dVar242 * dVar226 + (dVar235 * dVar241 - dVar211 * dVar233);
                    auVar228._0_8_ =
                         dVar242 * (dVar243 * dVar227 - dVar232 * dVar225) +
                         (dVar233 * dVar237 - dVar241 * dVar247);
                    auVar229._8_8_ = dVar236;
                    auVar229._0_8_ = dVar236;
                    auVar229 = divpd(auVar228,auVar229);
                    dVar236 = (dVar216 * dVar233 +
                              ((dVar232 * dVar225 + -dVar227 * dVar243) * dVar235 -
                              dVar226 * dVar247)) / dVar236;
                    iVar174 = iVar119 - iVar98;
                    lVar162 = (long)iVar174;
                    dVar225 = pdVar42[lVar124 + lVar197 + lVar162];
                    dVar242 = auVar229._0_8_;
                    dVar233 = auVar229._8_8_;
                    if ((dVar225 == 1.0) && (!NAN(dVar225))) {
                      if ((pdVar42[lVar124 + lVar197 + (iVar95 - iVar98)] == 1.0) &&
                         (!NAN(pdVar42[lVar124 + lVar197 + (iVar95 - iVar98)]))) {
                        if ((pdVar42[lVar124 + lVar197 + ((iVar119 + 1) - iVar98)] == 1.0) &&
                           (!NAN(pdVar42[lVar124 + lVar197 + ((iVar119 + 1) - iVar98)]))) {
                          dVar235 = pdVar27[lVar123 + lVar192 + lVar141 + (int)((iVar119 + 1) -
                                                                               uVar10)] - dVar224;
                          dVar242 = (dVar224 - dVar240) + (dVar224 - dVar240);
                          dVar235 = dVar235 + dVar235;
                          dVar247 = (pdVar27[lVar123 + lVar192 + lVar141 + (int)((iVar119 + 1) -
                                                                                uVar10)] - dVar240)
                                    * 0.5;
                          dVar227 = ABS(dVar242);
                          uVar202 = -(ulong)(0.0 < dVar247);
                          dVar247 = ABS(dVar247);
                          dVar243 = ABS(dVar235);
                          if (dVar227 <= dVar247) {
                            dVar247 = dVar227;
                          }
                          if (dVar247 <= dVar243) {
                            dVar243 = dVar247;
                          }
                          uVar203 = -(ulong)(0.0 < dVar242 * dVar235) & (ulong)dVar243;
                          dVar242 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                            uVar202 & uVar203);
                        }
                      }
                      if ((((pdVar42[lVar197 + lVar143 + lVar162] == 1.0) &&
                           (!NAN(pdVar42[lVar197 + lVar143 + lVar162]))) &&
                          (pdVar42[lVar197 + lVar144 + lVar162] == 1.0)) &&
                         (!NAN(pdVar42[lVar197 + lVar144 + lVar162]))) {
                        dVar247 = dVar224 - pdVar27[lVar141 + lVar192 + lVar125 + lVar105];
                        dVar227 = pdVar27[lVar141 + lVar192 + lVar126 + lVar105] - dVar224;
                        dVar247 = dVar247 + dVar247;
                        dVar227 = dVar227 + dVar227;
                        dVar233 = (pdVar27[lVar141 + lVar192 + lVar126 + lVar105] -
                                  pdVar27[lVar141 + lVar192 + lVar125 + lVar105]) * 0.5;
                        dVar243 = ABS(dVar247);
                        uVar202 = -(ulong)(0.0 < dVar233);
                        dVar233 = ABS(dVar233);
                        dVar235 = ABS(dVar227);
                        if (dVar243 <= dVar233) {
                          dVar233 = dVar243;
                        }
                        if (dVar233 <= dVar235) {
                          dVar235 = dVar233;
                        }
                        uVar203 = -(ulong)(0.0 < dVar247 * dVar227) & (ulong)dVar235;
                        dVar233 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                      if (((pdVar42[lVar124 + lVar162 + lVar176] == 1.0) &&
                          (!NAN(pdVar42[lVar124 + lVar162 + lVar176]))) &&
                         ((pdVar42[lVar124 + lVar162 + lVar185] == 1.0 &&
                          (!NAN(pdVar42[lVar124 + lVar162 + lVar185]))))) {
                        dVar247 = dVar224 - pdVar27[lVar123 + lVar105 + lVar180 + lVar141];
                        dVar227 = pdVar27[lVar123 + lVar105 + lVar177 + lVar141] - dVar224;
                        dVar247 = dVar247 + dVar247;
                        dVar227 = dVar227 + dVar227;
                        dVar236 = (pdVar27[lVar123 + lVar105 + lVar177 + lVar141] -
                                  pdVar27[lVar123 + lVar105 + lVar180 + lVar141]) * 0.5;
                        dVar243 = ABS(dVar247);
                        uVar202 = -(ulong)(0.0 < dVar236);
                        dVar236 = ABS(dVar236);
                        dVar235 = ABS(dVar227);
                        if (dVar243 <= dVar236) {
                          dVar236 = dVar243;
                        }
                        if (dVar236 <= dVar235) {
                          dVar235 = dVar236;
                        }
                        uVar203 = -(ulong)(0.0 < dVar247 * dVar227) & (ulong)dVar235;
                        dVar236 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                    }
                    dVar243 = dVar248 - dVar212;
                    dVar235 = dVar240;
                    if (dVar224 <= dVar240) {
                      dVar235 = dVar224;
                    }
                    iVar137 = 0;
                    iVar96 = 0;
                    iVar187 = 0;
                    iVar186 = 0;
                    iVar97 = -1;
                    while (iVar97 != 2) {
                      iVar136 = iVar137;
                      iVar157 = -1;
                      while (iVar157 != 2) {
                        for (iVar156 = 5; iVar156 != 8; iVar156 = iVar156 + 1) {
                          if (((uVar18 >> (iVar136 + iVar156 & 0x1fU) & 1) != 0) &&
                             ((iVar156 != 6 || iVar157 != 0) || iVar97 != 0)) {
                            iVar186 = iVar186 + (uint)((iVar156 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar157 == 0 && iVar97 == 0));
                            iVar187 = iVar187 + (uint)((iVar156 == 6 && iVar97 == 0) &&
                                                      (iVar157 == 1 || iVar157 + 1 == 0));
                            iVar96 = iVar96 + (uint)((iVar156 == 6 && iVar157 == 0) &&
                                                    (iVar97 == 1 || iVar97 + 1 == 0));
                          }
                        }
                        iVar136 = iVar136 + 3;
                        iVar157 = iVar157 + 1;
                      }
                      iVar137 = iVar137 + 9;
                      iVar97 = iVar97 + 1;
                    }
                    dVar247 = 2.0;
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      cVar195 = '\b';
                      dVar227 = dVar224;
                      dVar247 = dVar224;
                      for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                        cVar166 = cVar195;
                        for (lVar193 = 0; lVar193 != 2; lVar193 = lVar193 + 1) {
                          for (lVar178 = 0; lVar178 != 3; lVar178 = lVar178 + 1) {
                            if (((int)lVar178 != 1 || ((int)lVar193 != 0 || (int)lVar105 != 0)) &&
                               ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                          (iVar116 + (int)lVar193) * lVar28 +
                                                          (long)(iVar183 + (int)lVar178)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar247) {
                                dVar211 = dVar247;
                              }
                              dVar247 = dVar211;
                              if (dVar232 < dVar227) {
                                dVar227 = dVar232;
                              }
                            }
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar232 = (((pdVar36 + lVar168 + lVar127 + (iVar119 - iVar101))[lVar39] -
                                 dVar212) * dVar236 +
                                (0.5 - dVar238) * dVar233 +
                                (pdVar36[lVar168 + lVar127 + (iVar119 - iVar101)] - dVar239) *
                                dVar242 + dVar224) - dVar224;
                      if (dVar232 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar232 < -1e-13) &&
                           (dVar247 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar232;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (2.0 <= dVar247) {
                        dVar247 = 2.0;
                      }
                    }
                    dVar227 = dVar247;
                    if ((short)uVar18 < 0) {
                      cVar195 = '\x05';
                      dVar232 = dVar224;
                      dVar227 = dVar224;
                      for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                        cVar166 = cVar195;
                        for (lVar193 = -1; lVar193 != 1; lVar193 = lVar193 + 1) {
                          for (lVar178 = 0; lVar178 != 3; lVar178 = lVar178 + 1) {
                            dVar211 = dVar227;
                            if (((int)lVar178 == 1 && ((int)lVar193 == 0 && (int)lVar105 == 0)) ||
                               ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) == 0)) {
LAB_00367258:
                              uVar218 = SUB84(dVar232,0);
                              uVar220 = (undefined4)((ulong)dVar232 >> 0x20);
                            }
                            else {
                              dVar216 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                          (iVar116 + (int)lVar193) * lVar28 +
                                                          (long)(iVar183 + (int)lVar178)];
                              uVar218 = SUB84(dVar216,0);
                              uVar220 = (undefined4)((ulong)dVar216 >> 0x20);
                              dVar211 = dVar216;
                              if (dVar216 <= dVar227) {
                                dVar211 = dVar227;
                              }
                              if (dVar232 <= dVar216) goto LAB_00367258;
                            }
                            dVar232 = (double)CONCAT44(uVar220,uVar218);
                            dVar227 = dVar211;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar211 = (((pdVar36 + lVar168 + lVar128 + (iVar119 - iVar101))[lVar39] -
                                 dVar212) * dVar236 +
                                -(dVar238 + 0.5) * dVar233 +
                                (pdVar36[lVar168 + lVar128 + (iVar119 - iVar101)] - dVar239) *
                                dVar242 + dVar224) - dVar224;
                      if (dVar211 <= 1e-13) {
                        dVar227 = 1.0;
                        if ((dVar211 < -1e-13) &&
                           (dVar227 = (dVar232 - dVar224) / dVar211, 1.0 <= dVar227)) {
                          dVar227 = 1.0;
                        }
                      }
                      else {
                        dVar227 = (dVar227 - dVar224) / dVar211;
                        if (1.0 <= dVar227) {
                          dVar227 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar227) {
                        dVar227 = dVar247;
                      }
                    }
                    dVar247 = dVar227;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      cVar195 = '\x06';
                      uVar218 = SUB84(dVar224,0);
                      uVar220 = (undefined4)((ulong)dVar224 >> 0x20);
                      dVar232 = dVar224;
                      for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                        cVar166 = cVar195;
                        for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                          for (lVar178 = 0; lVar178 != 2; lVar178 = lVar178 + 1) {
                            if ((((int)lVar193 == 0 && (int)lVar105 == 0) && (int)lVar178 == 0) ||
                               ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) == 0)) {
                              dVar211 = (double)CONCAT44(uVar220,uVar218);
                              dVar247 = dVar232;
                            }
                            else {
                              dVar247 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                          (iVar116 + (int)lVar193) * lVar28 +
                                                          (long)(iVar139 + (int)lVar178)];
                              dVar211 = dVar247;
                              if (dVar247 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar211 = (double)CONCAT44(uVar220,uVar218);
                              }
                              if (dVar232 <= dVar247) {
                                dVar247 = dVar232;
                              }
                            }
                            dVar232 = dVar247;
                            uVar218 = SUB84(dVar211,0);
                            uVar220 = (undefined4)((ulong)dVar211 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar211 = (((pdVar32 + lVar142 + lVar121 + (iVar94 + 1))[lVar35] - dVar212) *
                                 dVar236 +
                                (pdVar32[lVar142 + lVar121 + (iVar94 + 1)] - dVar238) * dVar233 +
                                (0.5 - dVar239) * dVar242 + dVar224) - dVar224;
                      if (dVar211 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar211 < -1e-13) &&
                           (dVar247 = (dVar232 - dVar224) / dVar211, 1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = ((double)CONCAT44(uVar220,uVar218) - dVar224) / dVar211;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar227 <= dVar247) {
                        dVar247 = dVar227;
                      }
                    }
                    cVar195 = '\x05';
                    dVar232 = dVar224;
                    dVar227 = dVar224;
                    for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                      cVar166 = cVar195;
                      for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                        for (lVar178 = 0; lVar178 != 2; lVar178 = lVar178 + 1) {
                          uVar218 = SUB84(dVar227,0);
                          uVar220 = (undefined4)((ulong)dVar227 >> 0x20);
                          dVar211 = dVar232;
                          if (((int)lVar178 != 1 || ((int)lVar193 != 0 || (int)lVar105 != 0)) &&
                             ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) != 0)) {
                            dVar211 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                        (iVar116 + (int)lVar193) * lVar28 +
                                                        (long)(iVar183 + (int)lVar178)];
                            uVar219 = SUB84(dVar211,0);
                            uVar221 = (int)((ulong)dVar211 >> 0x20);
                            if (dVar211 <= dVar227) {
                              uVar219 = uVar218;
                              uVar221 = uVar220;
                            }
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if (dVar232 <= dVar211) {
                              dVar211 = dVar232;
                            }
                          }
                          dVar232 = dVar211;
                          dVar227 = (double)CONCAT44(uVar220,uVar218);
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar211 = (dVar243 * dVar236 +
                              dVar209 * dVar233 + (dVar224 - dVar242 * (double)local_3b8)) - dVar224
                    ;
                    if (dVar211 <= 1e-13) {
                      dVar227 = 1.0;
                      if ((dVar211 < -1e-13) &&
                         (dVar227 = (dVar232 - dVar224) / dVar211, 1.0 <= dVar227)) {
                        dVar227 = 1.0;
                      }
                    }
                    else {
                      dVar227 = (dVar227 - dVar224) / dVar211;
                      if (1.0 <= dVar227) {
                        dVar227 = 1.0;
                      }
                    }
                    if (dVar247 <= dVar227) {
                      dVar227 = dVar247;
                    }
                    dVar247 = dVar227;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      cVar195 = '\x0e';
                      dVar247 = dVar224;
                      dVar232 = dVar224;
                      for (lVar105 = 0; lVar105 != 2; lVar105 = lVar105 + 1) {
                        cVar166 = cVar195;
                        for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                          for (lVar178 = 0; lVar178 != 3; lVar178 = lVar178 + 1) {
                            uVar219 = SUB84(dVar232,0);
                            uVar221 = (undefined4)((ulong)dVar232 >> 0x20);
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if (((int)lVar178 != 1 || ((int)lVar193 != 0 || (int)lVar105 != 0)) &&
                               ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) != 0)) {
                              dVar211 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                          (iVar116 + (int)lVar193) * lVar28 +
                                                          (long)(iVar183 + (int)lVar178)];
                              dVar216 = dVar211;
                              if (dVar211 <= dVar247) {
                                dVar216 = dVar247;
                              }
                              uVar218 = SUB84(dVar211,0);
                              uVar220 = (int)((ulong)dVar211 >> 0x20);
                              dVar247 = dVar216;
                              if (dVar232 <= dVar211) {
                                uVar218 = uVar219;
                                uVar220 = uVar221;
                              }
                            }
                            dVar232 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar211 = ((0.5 - dVar212) * dVar236 +
                                ((pdVar40 + lVar169 + lVar129 + (iVar119 - iVar117))[lVar147] -
                                dVar238) * dVar233 +
                                (pdVar40[lVar169 + lVar129 + (iVar119 - iVar117)] - dVar239) *
                                dVar242 + dVar224) - dVar224;
                      if (dVar211 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar211 < -1e-13) &&
                           (dVar247 = (dVar232 - dVar224) / dVar211, 1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar211;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar227 <= dVar247) {
                        dVar247 = dVar227;
                      }
                    }
                    dVar227 = dVar247;
                    if ((uVar18 >> 9 & 1) != 0) {
                      cVar195 = '\x05';
                      dVar232 = dVar224;
                      dVar227 = dVar224;
                      for (lVar105 = -1; lVar105 != 1; lVar105 = lVar105 + 1) {
                        cVar166 = cVar195;
                        for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                          for (lVar178 = 0; lVar178 != 3; lVar178 = lVar178 + 1) {
                            uVar219 = SUB84(dVar232,0);
                            uVar221 = (undefined4)((ulong)dVar232 >> 0x20);
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if (((int)lVar178 != 1 || ((int)lVar193 != 0 || (int)lVar105 != 0)) &&
                               ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) != 0)) {
                              dVar211 = pdVar27[lVar141 + (iVar167 + (int)lVar105) * lVar29 +
                                                          (iVar116 + (int)lVar193) * lVar28 +
                                                          (long)(iVar183 + (int)lVar178)];
                              dVar216 = dVar211;
                              if (dVar211 <= dVar227) {
                                dVar216 = dVar227;
                              }
                              uVar218 = SUB84(dVar211,0);
                              uVar220 = (int)((ulong)dVar211 >> 0x20);
                              dVar227 = dVar216;
                              if (dVar232 <= dVar211) {
                                uVar218 = uVar219;
                                uVar220 = uVar221;
                              }
                            }
                            dVar232 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar239 = ((((pdVar40 + lVar170 + lVar129 + (iVar119 - iVar117))[lVar147] -
                                  dVar238) * dVar233 +
                                 (pdVar40[lVar170 + lVar129 + (iVar119 - iVar117)] - dVar239) *
                                 dVar242 + dVar224) - (dVar212 + 0.5) * dVar236) - dVar224;
                      if (dVar239 <= 1e-13) {
                        dVar227 = 1.0;
                        if ((dVar239 < -1e-13) &&
                           (dVar227 = (dVar232 - dVar224) / dVar239, 1.0 <= dVar227)) {
                          dVar227 = 1.0;
                        }
                      }
                      else {
                        dVar227 = (dVar227 - dVar224) / dVar239;
                        if (1.0 <= dVar227) {
                          dVar227 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar227) {
                        dVar227 = dVar247;
                      }
                    }
                    dVar239 = 0.0;
                    if (1 < iVar186) {
                      dVar239 = dVar227;
                    }
                    dVar238 = 0.0;
                    if (1 < iVar187) {
                      dVar238 = dVar227;
                    }
                    dVar212 = 0.0;
                    if (1 < iVar96) {
                      dVar212 = dVar227;
                    }
                    if ((dVar225 == 1.0) && (!NAN(dVar225))) {
                      if ((pdVar42[lVar124 + lVar197 + (iVar95 - iVar98)] == 1.0) &&
                         (((!NAN(pdVar42[lVar124 + lVar197 + (iVar95 - iVar98)]) &&
                           (pdVar42[lVar124 + lVar197 + (iVar174 + 1)] == 1.0)) &&
                          (!NAN(pdVar42[lVar124 + lVar197 + (iVar174 + 1)]))))) {
                        dVar239 = 1.0;
                      }
                      if (((pdVar42[lVar197 + lVar130 + lVar162] == 1.0) &&
                          (!NAN(pdVar42[lVar197 + lVar130 + lVar162]))) &&
                         ((pdVar42[lVar197 + lVar131 + lVar162] == 1.0 &&
                          (!NAN(pdVar42[lVar197 + lVar131 + lVar162]))))) {
                        dVar238 = 1.0;
                      }
                      if (((pdVar42[lVar124 + lVar171 + lVar162] == 1.0) &&
                          (!NAN(pdVar42[lVar124 + lVar171 + lVar162]))) &&
                         ((pdVar42[lVar124 + lVar172 + lVar162] == 1.0 &&
                          (!NAN(pdVar42[lVar124 + lVar172 + lVar162]))))) {
                        dVar212 = 1.0;
                      }
                    }
                    dVar238 = dVar243 * dVar236 * dVar212 +
                              dVar209 * dVar233 * dVar238 +
                              (dVar224 - (double)local_3b8 * dVar239 * dVar242);
                    dVar239 = local_458;
                    if (dVar238 <= local_458) {
                      dVar239 = dVar238;
                    }
                    lVar105 = (long)(iVar95 - iVar2);
                    dVar238 = pdVar26[lVar161 + lVar122 + lVar105];
                    dVar212 = pdVar26[lVar161 + lVar122 + lVar105 + lVar20];
                    dVar224 = pdVar26[lVar161 + lVar122 + lVar105 + lVar20 * 2];
                    uVar18 = local_438[iVar95 - local_448._0_4_].flag;
                    iVar94 = 0;
                    cVar195 = '\x05';
                    for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                      lVar178 = lVar104;
                      lVar189 = local_9e0;
                      lVar108 = lVar181;
                      iVar186 = iVar94;
                      cVar166 = cVar195;
                      for (lVar193 = -1; iVar186 = iVar186 + 3, lVar193 != 2; lVar193 = lVar193 + 1)
                      {
                        lVar175 = (long)iVar94;
                        paRVar163 = A + lVar175;
                        iVar94 = iVar94 + 3;
                        for (lVar198 = 0; iVar186 - lVar175 != lVar198; lVar198 = lVar198 + 1) {
                          iVar97 = (int)lVar198 + -1;
                          if ((((int)lVar193 == 0 && (int)lVar105 == 0) && iVar97 == 0) ||
                             ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            dVar209 = *(double *)(lVar108 + lVar198 * 8);
                            (*paRVar163)[0] =
                                 (*(double *)(lVar189 + lVar198 * 8) + (double)iVar97) - dVar238;
                            (*paRVar163)[1] = (dVar209 + (double)(int)lVar193) - dVar212;
                            (*paRVar163)[2] =
                                 (*(double *)(lVar178 + lVar198 * 8) + (double)(int)lVar105) -
                                 dVar224;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        lVar189 = lVar189 + lVar31 * 8;
                        lVar108 = lVar108 + lVar31 * 8;
                        lVar178 = lVar178 + lVar31 * 8;
                        cVar166 = cVar166 + '\x03';
                      }
                      local_9e0 = local_9e0 + lVar19 * 8;
                      lVar181 = lVar181 + lVar19 * 8;
                      lVar104 = lVar104 + lVar19 * 8;
                      cVar195 = cVar195 + '\t';
                    }
                    iVar94 = 0;
                    cVar195 = '\x05';
                    for (lVar181 = -1; lVar181 != 2; lVar181 = lVar181 + 1) {
                      iVar186 = iVar94;
                      cVar166 = cVar195;
                      for (lVar104 = -1; iVar186 = iVar186 + 3, lVar104 != 2; lVar104 = lVar104 + 1)
                      {
                        lVar105 = (long)iVar94;
                        iVar94 = iVar94 + 3;
                        for (lVar193 = 0; iVar186 - lVar105 != lVar193; lVar193 = lVar193 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar193 != 1 || ((int)lVar104 != 0 || (int)lVar181 != 0)) &&
                             ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar27[lVar141 + (iVar167 + (int)lVar181) * lVar29 +
                                                        (iVar116 + (int)lVar104) * lVar28 +
                                                        (long)(iVar100 + (int)lVar193)] - dVar240;
                          }
                          du[lVar105 + lVar193] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar240 = dVar235;
                    if (dVar235 <= dVar239) {
                      dVar240 = dVar239;
                    }
                    pdVar133 = &local_4a8;
                    for (lVar181 = 0; lVar181 != 3; lVar181 = lVar181 + 1) {
                      for (lVar104 = -0x48; lVar104 != 0; lVar104 = lVar104 + 0x18) {
                        *(undefined8 *)((long)pdVar133 + lVar104 + 0x48) = 0;
                      }
                      local_668[lVar181] = 0.0;
                      pdVar133 = pdVar133 + 1;
                    }
                    pRVar113 = A[0] + 2;
                    dVar239 = local_468;
                    dVar209 = dStack_480;
                    dVar242 = local_4a0;
                    dVar236 = local_668[0];
                    dVar233 = local_4a8;
                    dVar243 = local_488;
                    dVar247 = dStack_498;
                    dVar227 = local_668[1];
                    dVar232 = local_668[2];
                    for (lVar181 = 0; lVar181 != 0x1b; lVar181 = lVar181 + 1) {
                      dVar216 = (*(Real (*) [3])(pRVar113 + -2))[0];
                      dVar226 = pRVar113[-1];
                      dVar211 = *pRVar113;
                      dVar243 = dVar243 + dVar226 * pRVar113[-1];
                      dVar247 = dVar247 + dVar216 * *pRVar113;
                      dVar209 = dVar209 + dVar211 * dVar226;
                      dVar242 = dVar242 + dVar226 * dVar216;
                      dVar239 = dVar239 + dVar211 * dVar211;
                      dVar211 = du[lVar181];
                      dVar236 = dVar236 + dVar216 * dVar211;
                      dVar233 = dVar233 + dVar216 * dVar216;
                      dVar227 = dVar227 + dVar211 * pRVar113[-1];
                      dVar232 = dVar232 + dVar211 * *pRVar113;
                      pRVar113 = pRVar113 + 3;
                    }
                    dVar211 = dVar242 * dVar239 - dVar247 * dVar209;
                    dVar237 = dVar242 * dVar232 - dVar247 * dVar227;
                    dVar216 = dVar242 * dVar209 + dVar247 * -dVar243;
                    dVar226 = dVar239 * dVar243 - dVar209 * dVar209;
                    dVar239 = dVar239 * dVar227 - dVar209 * dVar232;
                    auVar223._0_8_ =
                         dVar247 * (dVar209 * dVar227 - dVar232 * dVar243) +
                         (dVar236 * dVar226 - dVar239 * dVar242);
                    auVar223._8_8_ = dVar247 * dVar237 + (dVar233 * dVar239 - dVar211 * dVar236);
                    dVar247 = dVar216 * dVar247 + (dVar226 * dVar233 - dVar211 * dVar242);
                    auVar204._8_8_ = dVar247;
                    auVar204._0_8_ = dVar247;
                    auVar229 = divpd(auVar223,auVar204);
                    dVar247 = (dVar216 * dVar236 +
                              ((dVar232 * dVar243 + -dVar227 * dVar209) * dVar233 -
                              dVar237 * dVar242)) / dVar247;
                    lVar181 = (long)(iVar95 - iVar98);
                    dVar239 = pdVar42[lVar124 + lVar197 + lVar181];
                    dVar209 = auVar229._0_8_;
                    dVar242 = auVar229._8_8_;
                    if ((dVar239 == 1.0) && (!NAN(dVar239))) {
                      if ((pdVar42[lVar124 + lVar197 + ((iVar119 + -2) - iVar98)] == 1.0) &&
                         (((!NAN(pdVar42[lVar124 + lVar197 + ((iVar119 + -2) - iVar98)]) &&
                           (dVar225 == 1.0)) && (!NAN(dVar225))))) {
                        dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141] -
                                  pdVar27[lVar123 + lVar192 + lVar141 + (int)((iVar119 + -2) -
                                                                             uVar10)];
                        dVar243 = pdVar109[lVar141] - pdVar27[lVar123 + lVar106 + lVar192 + lVar141]
                        ;
                        dVar233 = dVar233 + dVar233;
                        dVar243 = dVar243 + dVar243;
                        dVar209 = (pdVar109[lVar141] -
                                  pdVar27[lVar123 + lVar192 + lVar141 + (int)((iVar119 + -2) -
                                                                             uVar10)]) * 0.5;
                        dVar236 = ABS(dVar233);
                        uVar202 = -(ulong)(0.0 < dVar209);
                        dVar209 = ABS(dVar209);
                        dVar225 = ABS(dVar243);
                        if (dVar236 <= dVar209) {
                          dVar209 = dVar236;
                        }
                        if (dVar209 <= dVar225) {
                          dVar225 = dVar209;
                        }
                        uVar203 = -(ulong)(0.0 < dVar233 * dVar243) & (ulong)dVar225;
                        dVar209 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                      if (((pdVar42[lVar197 + lVar143 + lVar181] == 1.0) &&
                          (!NAN(pdVar42[lVar197 + lVar143 + lVar181]))) &&
                         ((pdVar42[lVar197 + lVar144 + lVar181] == 1.0 &&
                          (!NAN(pdVar42[lVar197 + lVar144 + lVar181]))))) {
                        dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141] -
                                  pdVar27[lVar141 + lVar192 + lVar125 + lVar106];
                        dVar243 = pdVar27[lVar141 + lVar192 + lVar126 + lVar106] -
                                  pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                        dVar233 = dVar233 + dVar233;
                        dVar243 = dVar243 + dVar243;
                        dVar225 = (pdVar27[lVar141 + lVar192 + lVar126 + lVar106] -
                                  pdVar27[lVar141 + lVar192 + lVar125 + lVar106]) * 0.5;
                        dVar236 = ABS(dVar233);
                        uVar202 = -(ulong)(0.0 < dVar225);
                        dVar225 = ABS(dVar225);
                        dVar242 = ABS(dVar243);
                        if (dVar236 <= dVar225) {
                          dVar225 = dVar236;
                        }
                        if (dVar225 <= dVar242) {
                          dVar242 = dVar225;
                        }
                        uVar203 = -(ulong)(0.0 < dVar233 * dVar243) & (ulong)dVar242;
                        dVar242 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                      if (((pdVar42[lVar124 + lVar181 + lVar176] == 1.0) &&
                          (!NAN(pdVar42[lVar124 + lVar181 + lVar176]))) &&
                         ((pdVar42[lVar124 + lVar181 + lVar185] == 1.0 &&
                          (!NAN(pdVar42[lVar124 + lVar181 + lVar185]))))) {
                        dVar243 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141] -
                                  pdVar27[lVar123 + lVar106 + lVar180 + lVar141];
                        dVar247 = pdVar27[lVar123 + lVar106 + lVar177 + lVar141] -
                                  pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                        dVar243 = dVar243 + dVar243;
                        dVar247 = dVar247 + dVar247;
                        dVar225 = (pdVar27[lVar123 + lVar106 + lVar177 + lVar141] -
                                  pdVar27[lVar123 + lVar106 + lVar180 + lVar141]) * 0.5;
                        dVar233 = ABS(dVar243);
                        uVar202 = -(ulong)(0.0 < dVar225);
                        dVar225 = ABS(dVar225);
                        dVar236 = ABS(dVar247);
                        if (dVar233 <= dVar225) {
                          dVar225 = dVar233;
                        }
                        if (dVar225 <= dVar236) {
                          dVar236 = dVar225;
                        }
                        uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar236;
                        dVar247 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                    }
                    iVar97 = 0;
                    iVar96 = 0;
                    iVar137 = 0;
                    iVar94 = 0;
                    iVar186 = -1;
                    while (iVar186 != 2) {
                      iVar187 = iVar97;
                      iVar136 = -1;
                      while (iVar136 != 2) {
                        for (iVar157 = 5; iVar157 != 8; iVar157 = iVar157 + 1) {
                          if (((uVar18 >> (iVar187 + iVar157 & 0x1fU) & 1) != 0) &&
                             ((iVar157 != 6 || iVar136 != 0) || iVar186 != 0)) {
                            iVar94 = iVar94 + (uint)((iVar157 - 5U & 0xfffffffd) == 0 &&
                                                    (iVar136 == 0 && iVar186 == 0));
                            iVar137 = iVar137 + (uint)((iVar157 == 6 && iVar186 == 0) &&
                                                      (iVar136 == 1 || iVar136 + 1 == 0));
                            iVar96 = iVar96 + (uint)((iVar157 == 6 && iVar136 == 0) &&
                                                    (iVar186 == 1 || iVar186 + 1 == 0));
                          }
                        }
                        iVar187 = iVar187 + 3;
                        iVar136 = iVar136 + 1;
                      }
                      iVar97 = iVar97 + 9;
                      iVar186 = iVar186 + 1;
                    }
                    dVar225 = 2.0;
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      dVar236 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\b';
                      uVar218 = SUB84(dVar236,0);
                      uVar220 = (undefined4)((ulong)dVar236 >> 0x20);
                      dVar225 = dVar236;
                      for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = 0; lVar105 != 2; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 3; lVar193 = lVar193 + 1) {
                            if (((int)lVar193 == 1 && ((int)lVar105 == 0 && (int)lVar104 == 0)) ||
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) == 0)) {
LAB_00368424:
                              dVar233 = (double)CONCAT44(uVar220,uVar218);
                            }
                            else {
                              dVar233 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar100 + (int)lVar193)];
                              dVar243 = dVar233;
                              if (dVar233 <= dVar225) {
                                dVar243 = dVar225;
                              }
                              dVar225 = dVar243;
                              if ((double)CONCAT44(uVar220,uVar218) < dVar233 ||
                                  (double)CONCAT44(uVar220,uVar218) == dVar233) goto LAB_00368424;
                            }
                            uVar218 = SUB84(dVar233,0);
                            uVar220 = (undefined4)((ulong)dVar233 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar233 = (((pdVar36 + lVar168 + lVar127 + (iVar95 - iVar101))[lVar39] -
                                 dVar224) * dVar247 +
                                (0.5 - dVar212) * dVar242 +
                                (pdVar36[lVar168 + lVar127 + (iVar95 - iVar101)] - dVar238) *
                                dVar209 + dVar236) - dVar236;
                      if (dVar233 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar233 < -1e-13) &&
                           (dVar225 = ((double)CONCAT44(uVar220,uVar218) - dVar236) / dVar233,
                           1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = (dVar225 - dVar236) / dVar233;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (2.0 <= dVar225) {
                        dVar225 = 2.0;
                      }
                    }
                    dVar236 = dVar225;
                    if ((short)uVar18 < 0) {
                      dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\x05';
                      uVar218 = SUB84(dVar233,0);
                      uVar220 = (undefined4)((ulong)dVar233 >> 0x20);
                      dVar243 = dVar233;
                      for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = -1; lVar105 != 1; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 3; lVar193 = lVar193 + 1) {
                            if (((int)lVar193 == 1 && ((int)lVar105 == 0 && (int)lVar104 == 0)) ||
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) == 0)) {
                              dVar236 = (double)CONCAT44(uVar220,uVar218);
                            }
                            else {
                              dVar227 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar100 + (int)lVar193)];
                              dVar236 = dVar227;
                              if (dVar227 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar236 = (double)CONCAT44(uVar220,uVar218);
                              }
                              if (dVar227 < dVar243) {
                                dVar243 = dVar227;
                              }
                            }
                            uVar218 = SUB84(dVar236,0);
                            uVar220 = (undefined4)((ulong)dVar236 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar36 + lVar168 + lVar128 + (iVar95 - iVar101))[lVar39] -
                                 dVar224) * dVar247 +
                                -(dVar212 + 0.5) * dVar242 +
                                (pdVar36[lVar168 + lVar128 + (iVar95 - iVar101)] - dVar238) *
                                dVar209 + dVar233) - dVar233;
                      if (dVar227 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar236 = (dVar243 - dVar233) / dVar227, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = ((double)CONCAT44(uVar220,uVar218) - dVar233) / dVar227;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar236) {
                        dVar236 = dVar225;
                      }
                    }
                    dVar225 = dVar236;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\x06';
                      uVar218 = SUB84(dVar233,0);
                      uVar220 = (undefined4)((ulong)dVar233 >> 0x20);
                      uVar219 = 0;
                      uVar221 = 0;
                      dVar243 = dVar233;
                      for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 2; lVar193 = lVar193 + 1) {
                            if ((((int)lVar105 == 0 && (int)lVar104 == 0) && (int)lVar193 == 0) ||
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) == 0)) {
                              auVar244._4_4_ = uVar220;
                              auVar244._0_4_ = uVar218;
                              auVar244._12_4_ = uVar221;
                              auVar244._8_4_ = uVar219;
                              dVar225 = dVar243;
                            }
                            else {
                              dVar225 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar183 + (int)lVar193)];
                              dVar227 = dVar225;
                              if (dVar225 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar227 = (double)CONCAT44(uVar220,uVar218);
                              }
                              auVar244._8_8_ = 0;
                              auVar244._0_8_ = dVar227;
                              if (dVar243 <= dVar225) {
                                dVar225 = dVar243;
                              }
                            }
                            dVar243 = dVar225;
                            uVar218 = auVar244._0_4_;
                            uVar220 = auVar244._4_4_;
                            uVar219 = auVar244._8_4_;
                            uVar221 = auVar244._12_4_;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((pdVar112[lVar35] - dVar224) * dVar247 +
                                (*pdVar112 - dVar212) * dVar242 +
                                (0.5 - dVar238) * dVar209 + dVar233) - dVar233;
                      if (dVar227 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar225 = (dVar243 - dVar233) / dVar227, 1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = ((double)CONCAT44(uVar220,uVar218) - dVar233) / dVar227;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (dVar236 <= dVar225) {
                        dVar225 = dVar236;
                      }
                    }
                    dVar236 = dVar225;
                    if ((uVar18 >> 0x11 & 1) != 0) {
                      dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\x05';
                      uVar218 = SUB84(dVar233,0);
                      uVar220 = (undefined4)((ulong)dVar233 >> 0x20);
                      uVar219 = 0;
                      uVar221 = 0;
                      dVar243 = dVar233;
                      for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 2; lVar193 = lVar193 + 1) {
                            if (((int)lVar193 == 1 && ((int)lVar105 == 0 && (int)lVar104 == 0)) ||
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) == 0)) {
                              auVar245._4_4_ = uVar220;
                              auVar245._0_4_ = uVar218;
                              auVar245._12_4_ = uVar221;
                              auVar245._8_4_ = uVar219;
                              dVar236 = dVar243;
                            }
                            else {
                              dVar236 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar100 + (int)lVar193)];
                              dVar227 = dVar236;
                              if (dVar236 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar227 = (double)CONCAT44(uVar220,uVar218);
                              }
                              auVar245._8_8_ = 0;
                              auVar245._0_8_ = dVar227;
                              if (dVar243 <= dVar236) {
                                dVar236 = dVar243;
                              }
                            }
                            dVar243 = dVar236;
                            uVar218 = auVar245._0_4_;
                            uVar220 = auVar245._4_4_;
                            uVar219 = auVar245._8_4_;
                            uVar221 = auVar245._12_4_;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar32 + lVar142 + lVar121 + (iVar95 - iVar14))[lVar35] -
                                 dVar224) * dVar247 +
                                (pdVar32[lVar142 + lVar121 + (iVar95 - iVar14)] - dVar212) * dVar242
                                + (dVar233 - (dVar238 + 0.5) * dVar209)) - dVar233;
                      if (dVar227 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar236 = (dVar243 - dVar233) / dVar227, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = ((double)CONCAT44(uVar220,uVar218) - dVar233) / dVar227;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar236) {
                        dVar236 = dVar225;
                      }
                    }
                    dVar225 = dVar236;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\x0e';
                      uVar218 = SUB84(dVar233,0);
                      uVar220 = (undefined4)((ulong)dVar233 >> 0x20);
                      uVar219 = 0;
                      uVar221 = 0;
                      dVar243 = dVar233;
                      for (lVar104 = 0; lVar104 != 2; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 3; lVar193 = lVar193 + 1) {
                            if (((int)lVar193 == 1 && ((int)lVar105 == 0 && (int)lVar104 == 0)) ||
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) == 0)) {
                              auVar246._4_4_ = uVar220;
                              auVar246._0_4_ = uVar218;
                              auVar246._12_4_ = uVar221;
                              auVar246._8_4_ = uVar219;
                              dVar225 = dVar243;
                            }
                            else {
                              dVar225 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar100 + (int)lVar193)];
                              dVar227 = dVar225;
                              if (dVar225 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar227 = (double)CONCAT44(uVar220,uVar218);
                              }
                              auVar246._8_8_ = 0;
                              auVar246._0_8_ = dVar227;
                              if (dVar243 <= dVar225) {
                                dVar225 = dVar243;
                              }
                            }
                            dVar243 = dVar225;
                            uVar218 = auVar246._0_4_;
                            uVar220 = auVar246._4_4_;
                            uVar219 = auVar246._8_4_;
                            uVar221 = auVar246._12_4_;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((0.5 - dVar224) * dVar247 +
                                ((pdVar40 + lVar169 + lVar129 + (iVar95 - iVar117))[lVar147] -
                                dVar212) * dVar242 +
                                (pdVar40[lVar169 + lVar129 + (iVar95 - iVar117)] - dVar238) *
                                dVar209 + dVar233) - dVar233;
                      if (dVar227 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar225 = (dVar243 - dVar233) / dVar227, 1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = ((double)CONCAT44(uVar220,uVar218) - dVar233) / dVar227;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (dVar236 <= dVar225) {
                        dVar225 = dVar236;
                      }
                    }
                    dVar236 = dVar225;
                    if ((uVar18 >> 9 & 1) != 0) {
                      dVar233 = pdVar27[lVar123 + lVar106 + lVar192 + lVar141];
                      cVar195 = '\x05';
                      dVar243 = dVar233;
                      dVar236 = dVar233;
                      for (lVar104 = -1; lVar104 != 1; lVar104 = lVar104 + 1) {
                        cVar166 = cVar195;
                        for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                          for (lVar193 = 0; lVar193 != 3; lVar193 = lVar193 + 1) {
                            dVar227 = dVar243;
                            if (((int)lVar193 != 1 || ((int)lVar105 != 0 || (int)lVar104 != 0)) &&
                               ((1 << (cVar166 + (char)lVar193 & 0x1fU) & uVar18) != 0)) {
                              dVar227 = pdVar27[lVar141 + (iVar167 + (int)lVar104) * lVar29 +
                                                          (iVar116 + (int)lVar105) * lVar28 +
                                                          (long)(iVar100 + (int)lVar193)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar236) {
                                dVar232 = dVar236;
                              }
                              dVar236 = dVar232;
                              if (dVar243 <= dVar227) {
                                dVar227 = dVar243;
                              }
                            }
                            dVar243 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((((pdVar40 + lVar170 + lVar129 + (iVar95 - iVar117))[lVar147] -
                                  dVar212) * dVar242 +
                                 (pdVar40[lVar170 + lVar129 + (iVar95 - iVar117)] - dVar238) *
                                 dVar209 + dVar233) - (dVar224 + 0.5) * dVar247) - dVar233;
                      if (dVar227 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar236 = (dVar243 - dVar233) / dVar227, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = (dVar236 - dVar233) / dVar227;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar236) {
                        dVar236 = dVar225;
                      }
                    }
                    uVar218 = 0;
                    uVar220 = 0;
                    dVar225 = 0.0;
                    if (1 < iVar94) {
                      dVar225 = dVar236;
                    }
                    dVar233 = 0.0;
                    if (1 < iVar137) {
                      dVar233 = dVar236;
                    }
                    if (1 < iVar96) {
                      uVar218 = SUB84(dVar236,0);
                      uVar220 = (undefined4)((ulong)dVar236 >> 0x20);
                    }
                    if ((dVar239 == 1.0) && (!NAN(dVar239))) {
                      if ((pdVar42[lVar124 + lVar197 + (iVar174 + -2)] == 1.0) &&
                         (((!NAN(pdVar42[lVar124 + lVar197 + (iVar174 + -2)]) &&
                           (pdVar42[lVar124 + lVar197 + lVar162] == 1.0)) &&
                          (!NAN(pdVar42[lVar124 + lVar197 + lVar162]))))) {
                        dVar225 = 1.0;
                      }
                      if (((pdVar42[lVar197 + lVar130 + lVar181] == 1.0) &&
                          (!NAN(pdVar42[lVar197 + lVar130 + lVar181]))) &&
                         ((pdVar42[lVar197 + lVar131 + lVar181] == 1.0 &&
                          (!NAN(pdVar42[lVar197 + lVar131 + lVar181]))))) {
                        dVar233 = 1.0;
                      }
                      if (((pdVar42[lVar124 + lVar171 + lVar181] == 1.0) &&
                          (!NAN(pdVar42[lVar124 + lVar171 + lVar181]))) &&
                         ((pdVar42[lVar124 + lVar172 + lVar181] == 1.0 &&
                          (!NAN(pdVar42[lVar124 + lVar172 + lVar181]))))) {
                        uVar218 = 0;
                        uVar220 = 0x3ff00000;
                      }
                    }
                    dVar222 = (0.5 - dVar238) * dVar209 * dVar225 +
                              pdVar27[lVar123 + lVar106 + lVar192 + lVar141] +
                              (dVar222 - dVar212) * dVar242 * dVar233 +
                              (dVar248 - dVar224) * dVar247 * (double)CONCAT44(uVar220,uVar218);
                    if (dVar222 <= local_458) {
                      local_458 = dVar222;
                    }
                    if (dVar235 <= local_458) {
                      dVar235 = local_458;
                    }
                    iVar174 = d_bcrec_ptr[uVar134].bc[3];
                    if (iVar154 == iVar119) {
                      switch(d_bcrec_ptr[uVar134].bc[0]) {
                      case 1:
switchD_00368f14_caseD_1:
                        dVar235 = dVar240;
                        break;
                      case 2:
                      case 4:
                        if ((uVar134 != 0 || !is_velocity) ||
                            pdVar21[lVar173 + lVar132 + (iVar154 - iVar182)] < 0.0)
                        goto switchD_00368f14_caseD_1;
                        dVar235 = 0.0;
                        if (dVar240 <= 0.0) {
                          dVar235 = dVar240;
                        }
switchD_00368f89_caseD_1:
                        dVar240 = dVar235;
                        break;
                      case 3:
                        dVar235 = pdVar27[lVar123 + lVar192 + (int)(~uVar10 + iVar154)];
                        if (is_velocity) goto switchD_00368f89_caseD_1;
                        break;
                      case -1:
switchD_00368f14_caseD_ffffffff:
                        dVar240 = 0.0;
                        dVar235 = 0.0;
                      }
                    }
                    else if (iVar152 == iVar119) {
                      switch(iVar174) {
                      case 1:
                      case 2:
                      case 4:
                        goto switchD_00368f89_caseD_1;
                      case 3:
                        dVar240 = *pdVar109;
                        if (is_velocity) goto switchD_00368f14_caseD_1;
                        break;
                      case -1:
                        goto switchD_00368f14_caseD_ffffffff;
                      }
                    }
                    dVar248 = dVar235;
                    if ((iVar152 == iVar119) &&
                       ((((iVar174 == 4 || (iVar174 == 2)) &&
                         (dVar240 = dVar235,
                         (uVar134 == 0 && is_velocity) &&
                         pdVar21[lVar173 + lVar132 + (iVar152 - iVar182)] <= 0.0)) &&
                        (dVar240 = 0.0, dVar248 = 0.0, 0.0 <= dVar235)))) {
                      dVar240 = dVar235;
                      dVar248 = dVar235;
                    }
                    dVar222 = dVar248;
                    if ((pdVar21[lVar173 + lVar132 + (iVar119 - iVar182)] <= 1e-08) &&
                       (dVar222 = dVar240,
                       -1e-08 <= pdVar21[lVar173 + lVar132 + (iVar119 - iVar182)])) {
                      dVar222 = (dVar240 + dVar248) * 0.5;
                    }
                  }
                  pdVar24[lVar199 * uVar134 +
                          (lVar150 - iVar8) * lVar146 +
                          lVar103 * lVar25 + ((long)iVar119 - (long)iVar6)] = dVar222;
                  iVar138 = iVar138 + 1;
                  iVar183 = iVar183 + 1;
                  iVar139 = iVar139 + 1;
                  local_4c8 = local_4c8 + 1;
                  iVar100 = iVar100 + 1;
                  bVar200 = iVar119 != iVar114;
                  lVar181 = lVar194;
                  iVar119 = iVar119 + 1;
                } while (bVar200);
              }
            }
            local_808 = local_808 + lVar19;
            local_800 = local_800 + lVar19;
            local_950 = local_950 + lVar19;
            lVar150 = lVar110;
          }
        }
        lVar19 = ccc->kstride;
        lVar20 = ccc->nstride;
        iVar2 = (ccc->begin).x;
        lVar199 = (long)iVar2;
        iVar3 = (ccc->begin).z;
        pdVar21 = vmac->p;
        lVar184 = vmac->jstride;
        lVar22 = vmac->kstride;
        lVar146 = (~(long)iVar3 + lVar120) * lVar19;
        iVar154 = (vmac->begin).x;
        iVar182 = (vmac->begin).y;
        iVar152 = (vmac->begin).z;
        local_400 = yedge->p;
        lVar23 = yedge->jstride;
        lVar25 = yedge->kstride;
        local_408 = yedge->nstride;
        local_3b8 = (double *)(long)(yedge->begin).x;
        iVar188 = (yedge->begin).y;
        iVar93 = (yedge->begin).z;
        uVar5 = (vfrac->begin).x;
        uVar9 = (vfrac->begin).z;
        lVar164 = (long)(int)uVar9;
        lVar165 = (long)(domain->bigend).vect[1] + 1;
        uVar10 = (q->begin).y;
        lVar140 = (long)(int)uVar10;
        iVar179 = iVar1 + -1;
        iVar114 = (q->begin).x;
        pdVar24 = ccc->p;
        local_410 = pdVar24 + ((lVar146 + -1) - lVar199);
        iVar191 = (ccc->begin).y;
        local_418 = pdVar24 + ((lVar146 + lVar20 + -1) - lVar199);
        local_420 = pdVar24 + ((lVar146 + lVar20 * 2 + -1) - lVar199);
        pdVar26 = q->p;
        lVar146 = q->jstride;
        lVar199 = q->kstride;
        local_428 = q->nstride;
        iVar6 = (q->begin).z;
        lVar28 = ccc->jstride;
        pdVar27 = fcx->p;
        lVar29 = fcx->jstride;
        lVar30 = fcx->kstride;
        lVar31 = fcx->nstride;
        iVar7 = (fcx->begin).x;
        lVar147 = (long)(fcx->begin).y;
        iVar8 = (fcx->begin).z;
        pdVar32 = fcy->p;
        lVar33 = fcy->jstride;
        lVar34 = fcy->kstride;
        lVar35 = fcy->nstride;
        iVar11 = (fcy->begin).x;
        iVar12 = (fcy->begin).y;
        iVar13 = (fcy->begin).z;
        local_3c8 = fcz->p;
        lVar37 = fcz->jstride;
        local_3d0 = fcz->kstride;
        lVar38 = fcz->nstride;
        iVar14 = (fcz->begin).x;
        lVar148 = (long)(fcz->begin).y;
        local_3d8 = (long)(fcz->begin).z;
        local_3e0 = flag->p;
        lVar39 = flag->jstride;
        local_3e8 = flag->kstride;
        iVar15 = (flag->begin).x;
        lVar149 = (long)(flag->begin).y;
        local_3f0 = (long)(flag->begin).z;
        pdVar36 = vfrac->p;
        lVar151 = vfrac->jstride;
        local_3f8 = vfrac->kstride;
        iVar16 = (vfrac->begin).y;
        lVar107 = (long)iVar16;
        iVar101 = (domain->smallend).vect[1];
        for (uVar134 = 0; pdVar40 = local_400, uVar134 != uVar102; uVar134 = uVar134 + 1) {
          lVar150 = local_428 * uVar134;
          lVar160 = local_408 * uVar134;
          local_730 = local_420;
          local_738 = local_418;
          local_740 = local_410;
          lVar159 = lVar120;
          while (pdVar42 = local_3c8, pEVar41 = local_3e0, lVar159 <= iVar196) {
            lVar181 = (lVar159 - local_3f0) * local_3e8;
            lVar142 = (lVar159 - iVar13) * lVar34;
            iVar158 = (int)lVar159;
            iVar117 = iVar158 - iVar3;
            lVar161 = iVar117 * lVar19;
            iVar118 = iVar158 - iVar6;
            lVar185 = iVar118 * lVar199;
            lVar192 = (lVar159 - lVar164) * local_3f8;
            lVar176 = ((lVar159 + -1) - lVar164) * local_3f8;
            lVar141 = lVar159 + 1;
            lVar197 = (lVar141 - lVar164) * local_3f8;
            lVar180 = ((lVar159 + -1) - (long)iVar6) * lVar199;
            lVar177 = (lVar141 - iVar6) * lVar199;
            lVar168 = (lVar159 - iVar8) * lVar30;
            lVar169 = ((iVar158 - (int)local_3d8) + 1) * local_3d0;
            lVar170 = (lVar159 - local_3d8) * local_3d0;
            lVar171 = (int)(~uVar9 + iVar158) * local_3f8;
            lVar172 = (int)((iVar158 - uVar9) + 1) * local_3f8;
            lVar173 = (lVar159 - iVar152) * lVar22;
            lVar110 = local_3c0;
            while (lVar194 = lVar110, lVar194 <= iVar135) {
              if (iVar4 < iVar1) {
                lVar110 = lVar194 + 1;
              }
              else {
                iVar155 = (int)lVar194;
                iVar98 = iVar155 - uVar10;
                lVar121 = iVar98 * lVar146;
                lVar103 = lVar194 + -1;
                lVar124 = lVar146 * (lVar103 - lVar140);
                lVar125 = (lVar194 - lVar107) * lVar151;
                lVar126 = (lVar103 - lVar107) * lVar151;
                lVar110 = lVar194 + 1;
                lVar129 = (lVar194 - lVar147) * lVar29;
                lVar130 = (lVar194 - lVar148) * lVar37;
                iVar138 = iVar155 - iVar16;
                lVar131 = (lVar103 - iVar191) * lVar28;
                lVar127 = (lVar103 - lVar147) * lVar29;
                lVar122 = (lVar103 - lVar148) * lVar37;
                lVar123 = (lVar194 - iVar182) * lVar184;
                lVar128 = ((-2 - (long)iVar191) + lVar194) * lVar28 * 8;
                iVar153 = iVar1 - iVar114;
                iVar158 = iVar179 - iVar2;
                iVar17 = iVar179 - iVar114;
                iVar99 = iVar1;
                do {
                  lVar132 = (long)iVar99;
                  lVar143 = lVar132 - iVar15;
                  uVar18 = pEVar41[lVar181 + (lVar194 - lVar149) * lVar39 + lVar143].flag;
                  dVar222 = 0.0;
                  if ((short)uVar18 < 0) {
                    lVar144 = (long)local_740 + lVar132 * 8 + lVar128;
                    local_968 = (long)local_738 + lVar132 * 8 + lVar128;
                    lVar145 = (long)local_730 + lVar132 * 8 + lVar128;
                    lVar162 = lVar132 - iVar11;
                    pdVar112 = pdVar32 + lVar142 + (lVar194 - iVar12) * lVar33 + lVar162;
                    dVar222 = *pdVar112;
                    dVar248 = pdVar112[lVar35];
                    lVar105 = (long)(iVar99 - iVar2);
                    pdVar109 = pdVar24 + lVar161 + (iVar155 - iVar191) * lVar28 + lVar105;
                    dVar239 = *pdVar109;
                    dVar238 = pdVar109[lVar20];
                    dVar212 = pdVar109[lVar20 * 2];
                    lVar106 = (long)(iVar99 - iVar114);
                    dVar224 = pdVar26[lVar121 + lVar106 + lVar185 + lVar150];
                    dVar240 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                    iVar167 = 0;
                    cVar195 = '\x05';
                    for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                      iVar139 = (int)lVar104;
                      iVar183 = iVar167;
                      cVar166 = cVar195;
                      for (lVar193 = -1; iVar183 = iVar183 + 3, lVar193 != 2; lVar193 = lVar193 + 1)
                      {
                        lVar189 = (long)iVar167;
                        paRVar163 = A + lVar189;
                        iVar100 = (int)lVar193;
                        iVar167 = iVar167 + 3;
                        for (lVar178 = 0; iVar183 - lVar189 != lVar178; lVar178 = lVar178 + 1) {
                          iVar119 = (int)lVar178 + -1;
                          if (((iVar100 == 0 && iVar139 == 0) && iVar119 == 0) ||
                             ((1 << ((char)lVar178 + cVar166 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            pdVar109 = pdVar24 + (iVar117 + iVar139) * lVar19 +
                                                 ((iVar155 - iVar191) + iVar100) * lVar28 +
                                                 (long)(iVar158 + (int)lVar178);
                            dVar209 = pdVar109[lVar20];
                            (*paRVar163)[0] = (*pdVar109 + (double)iVar119) - dVar239;
                            (*paRVar163)[1] = (dVar209 + (double)iVar100) - dVar238;
                            (*paRVar163)[2] = (pdVar109[lVar20 * 2] + (double)iVar139) - dVar212;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    local_448 = dVar238 + 0.5;
                    dVar209 = dVar222 - dVar239;
                    iVar167 = 0;
                    cVar195 = '\x05';
                    for (lVar104 = -1; lVar104 != 2; lVar104 = lVar104 + 1) {
                      iVar183 = iVar167;
                      cVar166 = cVar195;
                      for (lVar193 = -1; iVar183 = iVar183 + 3, lVar193 != 2; lVar193 = lVar193 + 1)
                      {
                        lVar178 = (long)iVar167;
                        iVar167 = iVar167 + 3;
                        for (lVar189 = 0; iVar183 - lVar178 != lVar189; lVar189 = lVar189 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar189 != 1 || ((int)lVar193 != 0 || (int)lVar104 != 0)) &&
                             ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar26[lVar150 + (iVar118 + (int)lVar104) * lVar199 +
                                                        (iVar98 + (int)lVar193) * lVar146 +
                                                        (long)(iVar17 + (int)lVar189)] - dVar224;
                          }
                          du[lVar178 + lVar189] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    local_438 = (EBCellFlag *)dVar240;
                    if (dVar240 <= dVar224) {
                      local_438 = (EBCellFlag *)dVar224;
                    }
                    pdVar109 = &local_4a8;
                    for (lVar104 = 0; lVar193 = -0x48, lVar104 != 3; lVar104 = lVar104 + 1) {
                      for (; lVar193 != 0; lVar193 = lVar193 + 0x18) {
                        *(undefined8 *)((long)pdVar109 + lVar193 + 0x48) = 0;
                      }
                      local_668[lVar104] = 0.0;
                      pdVar109 = pdVar109 + 1;
                    }
                    pRVar113 = A[0] + 2;
                    dVar225 = local_468;
                    dVar242 = local_488;
                    dVar236 = dStack_498;
                    dVar233 = local_668[0];
                    dVar235 = local_4a8;
                    dVar243 = dStack_480;
                    dVar247 = local_4a0;
                    dVar227 = local_668[1];
                    dVar232 = local_668[2];
                    for (lVar104 = 0; lVar104 != 0x1b; lVar104 = lVar104 + 1) {
                      dVar216 = (*(Real (*) [3])(pRVar113 + -2))[0];
                      dVar226 = pRVar113[-1];
                      dVar211 = *pRVar113;
                      dVar242 = dVar242 + dVar226 * pRVar113[-1];
                      dVar236 = dVar236 + dVar216 * *pRVar113;
                      dVar243 = dVar243 + dVar211 * dVar226;
                      dVar247 = dVar247 + dVar226 * dVar216;
                      dVar225 = dVar225 + dVar211 * dVar211;
                      dVar211 = du[lVar104];
                      dVar233 = dVar233 + dVar216 * dVar211;
                      dVar235 = dVar235 + dVar216 * dVar216;
                      dVar227 = dVar227 + dVar211 * pRVar113[-1];
                      dVar232 = dVar232 + dVar211 * *pRVar113;
                      pRVar113 = pRVar113 + 3;
                    }
                    auVar43._8_4_ = SUB84(dVar247,0);
                    auVar43._0_8_ = dVar247;
                    auVar43._12_4_ = (int)((ulong)dVar247 >> 0x20);
                    dVar211 = dVar247 * dVar225 - dVar236 * dVar243;
                    dVar226 = dVar247 * dVar232 - dVar236 * dVar227;
                    dStack_9f0 = auVar43._8_8_;
                    dVar216 = dVar247 * dVar243 + dVar236 * -dVar242;
                    dVar237 = dVar225 * dVar242 - dVar243 * dVar243;
                    dVar225 = dVar225 * dVar227 - dVar243 * dVar232;
                    auVar230._8_8_ = dVar236 * dVar226 + (dVar235 * dVar225 - dVar211 * dVar233);
                    auVar230._0_8_ =
                         dVar236 * (dVar243 * dVar227 - dVar232 * dVar242) +
                         (dVar233 * dVar237 - dVar225 * dVar247);
                    dVar225 = dVar216 * dVar236 + (dVar237 * dVar235 - dVar211 * dStack_9f0);
                    auVar215._8_8_ = dVar225;
                    auVar215._0_8_ = dVar225;
                    auVar229 = divpd(auVar230,auVar215);
                    dVar225 = (dVar216 * dVar233 +
                              ((dVar232 * dVar242 + -dVar227 * dVar243) * dVar235 -
                              dVar226 * dVar247)) / dVar225;
                    iVar167 = iVar99 - uVar5;
                    lVar104 = (long)iVar167;
                    local_458 = pdVar36[lVar125 + lVar192 + lVar104];
                    dVar242 = auVar229._0_8_;
                    dVar236 = auVar229._8_8_;
                    if ((local_458 == 1.0) && (!NAN(local_458))) {
                      if ((pdVar36[lVar125 + lVar192 + (int)((iVar99 + -1) - uVar5)] == 1.0) &&
                         (!NAN(pdVar36[lVar125 + lVar192 + (int)((iVar99 + -1) - uVar5)]))) {
                        if ((pdVar36[lVar125 + lVar192 + (int)((iVar99 + 1) - uVar5)] == 1.0) &&
                           (!NAN(pdVar36[lVar125 + lVar192 + (int)((iVar99 + 1) - uVar5)]))) {
                          dVar243 = dVar224 - pdVar26[lVar121 + lVar185 + lVar150 + ((iVar99 + -1) -
                                                                                    iVar114)];
                          dVar247 = pdVar26[lVar121 + lVar185 + lVar150 + ((iVar99 + 1) - iVar114)]
                                    - dVar224;
                          dVar243 = dVar243 + dVar243;
                          dVar247 = dVar247 + dVar247;
                          dVar242 = (pdVar26[lVar121 + lVar185 + lVar150 + ((iVar99 + 1) - iVar114)]
                                    - pdVar26[lVar121 + lVar185 + lVar150 + ((iVar99 + -1) - iVar114
                                                                            )]) * 0.5;
                          dVar235 = ABS(dVar243);
                          uVar202 = -(ulong)(0.0 < dVar242);
                          dVar242 = ABS(dVar242);
                          dVar233 = ABS(dVar247);
                          if (dVar235 <= dVar242) {
                            dVar242 = dVar235;
                          }
                          if (dVar242 <= dVar233) {
                            dVar233 = dVar242;
                          }
                          uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar233;
                          dVar242 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                            uVar202 & uVar203);
                        }
                      }
                      if ((((pdVar36[lVar192 + lVar126 + lVar104] == 1.0) &&
                           (!NAN(pdVar36[lVar192 + lVar126 + lVar104]))) &&
                          (pdVar36[lVar192 + (lVar110 - lVar107) * lVar151 + lVar104] == 1.0)) &&
                         (!NAN(pdVar36[lVar192 + (lVar110 - lVar107) * lVar151 + lVar104]))) {
                        dVar233 = pdVar26[lVar150 + lVar185 + (lVar110 - lVar140) * lVar146 +
                                                              lVar106] - dVar224;
                        dVar236 = (dVar224 - dVar240) + (dVar224 - dVar240);
                        dVar233 = dVar233 + dVar233;
                        dVar243 = (pdVar26[lVar150 + lVar185 + (lVar110 - lVar140) * lVar146 +
                                                               lVar106] - dVar240) * 0.5;
                        dVar247 = ABS(dVar236);
                        uVar202 = -(ulong)(0.0 < dVar243);
                        dVar243 = ABS(dVar243);
                        dVar235 = ABS(dVar233);
                        if (dVar247 <= dVar243) {
                          dVar243 = dVar247;
                        }
                        if (dVar243 <= dVar235) {
                          dVar235 = dVar243;
                        }
                        uVar203 = -(ulong)(0.0 < dVar236 * dVar233) & (ulong)dVar235;
                        dVar236 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                      if (((pdVar36[lVar125 + lVar104 + lVar176] == 1.0) &&
                          (!NAN(pdVar36[lVar125 + lVar104 + lVar176]))) &&
                         ((pdVar36[lVar125 + lVar104 + lVar197] == 1.0 &&
                          (!NAN(pdVar36[lVar125 + lVar104 + lVar197]))))) {
                        dVar243 = dVar224 - pdVar26[lVar121 + lVar106 + lVar180 + lVar150];
                        dVar247 = pdVar26[lVar121 + lVar106 + lVar177 + lVar150] - dVar224;
                        dVar243 = dVar243 + dVar243;
                        dVar247 = dVar247 + dVar247;
                        dVar225 = (pdVar26[lVar121 + lVar106 + lVar177 + lVar150] -
                                  pdVar26[lVar121 + lVar106 + lVar180 + lVar150]) * 0.5;
                        dVar235 = ABS(dVar243);
                        uVar202 = -(ulong)(0.0 < dVar225);
                        dVar225 = ABS(dVar225);
                        dVar233 = ABS(dVar247);
                        if (dVar235 <= dVar225) {
                          dVar225 = dVar235;
                        }
                        if (dVar225 <= dVar233) {
                          dVar233 = dVar225;
                        }
                        uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar233;
                        dVar225 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                    }
                    dVar235 = dVar248 - dVar212;
                    dVar233 = dVar240;
                    if (dVar224 <= dVar240) {
                      dVar233 = dVar224;
                    }
                    iVar100 = 0;
                    iVar183 = 0;
                    iVar119 = 0;
                    iVar115 = 0;
                    iVar139 = -1;
                    while (iVar139 != 2) {
                      iVar116 = iVar100;
                      iVar174 = -1;
                      while (iVar174 != 2) {
                        for (iVar94 = 5; iVar94 != 8; iVar94 = iVar94 + 1) {
                          if (((uVar18 >> (iVar116 + iVar94 & 0x1fU) & 1) != 0) &&
                             ((iVar94 != 6 || iVar174 != 0) || iVar139 != 0)) {
                            iVar115 = iVar115 + (uint)((iVar94 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar174 == 0 && iVar139 == 0));
                            iVar119 = iVar119 + (uint)((iVar94 == 6 && iVar139 == 0) &&
                                                      (iVar174 == 1 || iVar174 + 1 == 0));
                            iVar183 = iVar183 + (uint)((iVar94 == 6 && iVar174 == 0) &&
                                                      (iVar139 == 1 || iVar139 + 1 == 0));
                          }
                        }
                        iVar116 = iVar116 + 3;
                        iVar174 = iVar174 + 1;
                      }
                      iVar100 = iVar100 + 9;
                      iVar139 = iVar139 + 1;
                    }
                    dVar243 = 2.0;
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      cVar195 = '\b';
                      dVar247 = dVar224;
                      dVar243 = dVar224;
                      for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                        cVar166 = cVar195;
                        for (lVar178 = 0; lVar178 != 2; lVar178 = lVar178 + 1) {
                          for (lVar189 = 0; lVar189 != 3; lVar189 = lVar189 + 1) {
                            uVar218 = SUB84(dVar243,0);
                            uVar220 = (undefined4)((ulong)dVar243 >> 0x20);
                            if (((int)lVar189 != 1 || ((int)lVar178 != 0 || (int)lVar193 != 0)) &&
                               ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                          (iVar98 + (int)lVar178) * lVar146 +
                                                          (long)(iVar17 + (int)lVar189)];
                              uVar219 = SUB84(dVar227,0);
                              uVar221 = (int)((ulong)dVar227 >> 0x20);
                              if (dVar227 <= dVar243) {
                                uVar219 = uVar218;
                                uVar221 = uVar220;
                              }
                              uVar218 = uVar219;
                              uVar220 = uVar221;
                              if (dVar227 < dVar247) {
                                dVar247 = dVar227;
                              }
                            }
                            dVar243 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar32 + lVar142 + ((iVar155 - iVar12) + 1) * lVar33 + lVar162)
                                  [lVar35] - dVar212) * dVar225 +
                                (0.5 - dVar238) * dVar236 +
                                (pdVar32[lVar142 + ((iVar155 - iVar12) + 1) * lVar33 + lVar162] -
                                dVar239) * dVar242 + dVar224) - dVar224;
                      if (dVar227 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar243 = (dVar247 - dVar224) / dVar227, 1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar224) / dVar227;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (2.0 <= dVar243) {
                        dVar243 = 2.0;
                      }
                    }
                    cVar195 = '\x05';
                    dVar227 = dVar224;
                    dVar247 = dVar224;
                    for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                      cVar166 = cVar195;
                      for (lVar178 = -1; lVar178 != 1; lVar178 = lVar178 + 1) {
                        for (lVar189 = 0; lVar189 != 3; lVar189 = lVar189 + 1) {
                          uVar218 = SUB84(dVar247,0);
                          uVar220 = (undefined4)((ulong)dVar247 >> 0x20);
                          if (((int)lVar189 != 1 || ((int)lVar178 != 0 || (int)lVar193 != 0)) &&
                             ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) != 0)) {
                            dVar232 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                        (iVar98 + (int)lVar178) * lVar146 +
                                                        (long)(iVar17 + (int)lVar189)];
                            uVar219 = SUB84(dVar232,0);
                            uVar221 = (int)((ulong)dVar232 >> 0x20);
                            if (dVar232 <= dVar247) {
                              uVar219 = uVar218;
                              uVar221 = uVar220;
                            }
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if (dVar232 < dVar227) {
                              dVar227 = dVar232;
                            }
                          }
                          dVar247 = (double)CONCAT44(uVar220,uVar218);
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar232 = (dVar235 * dVar225 +
                              -local_448 * dVar236 + dVar209 * dVar242 + dVar224) - dVar224;
                    if (dVar232 <= 1e-13) {
                      dVar247 = 1.0;
                      if ((dVar232 < -1e-13) &&
                         (dVar247 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar247)) {
                        dVar247 = 1.0;
                      }
                    }
                    else {
                      dVar247 = (dVar247 - dVar224) / dVar232;
                      if (1.0 <= dVar247) {
                        dVar247 = 1.0;
                      }
                    }
                    if (dVar243 <= dVar247) {
                      dVar247 = dVar243;
                    }
                    dVar243 = dVar247;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      cVar195 = '\x06';
                      dVar227 = dVar224;
                      dVar243 = dVar224;
                      for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                        cVar166 = cVar195;
                        for (lVar178 = -1; lVar178 != 2; lVar178 = lVar178 + 1) {
                          for (lVar189 = 0; lVar189 != 2; lVar189 = lVar189 + 1) {
                            dVar232 = dVar227;
                            if ((((int)lVar178 != 0 || (int)lVar193 != 0) || (int)lVar189 != 0) &&
                               ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                          (iVar98 + (int)lVar178) * lVar146 +
                                                          (long)(iVar153 + (int)lVar189)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar243) {
                                dVar211 = dVar243;
                              }
                              dVar243 = dVar211;
                              if (dVar227 <= dVar232) {
                                dVar232 = dVar227;
                              }
                            }
                            dVar227 = dVar232;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar232 = (((pdVar27 + lVar168 + lVar129 + ((iVar99 - iVar7) + 1))[lVar31] -
                                 dVar212) * dVar225 +
                                (pdVar27[lVar168 + lVar129 + ((iVar99 - iVar7) + 1)] - dVar238) *
                                dVar236 + (0.5 - dVar239) * dVar242 + dVar224) - dVar224;
                      if (dVar232 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar232 < -1e-13) &&
                           (dVar243 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar224) / dVar232;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar243) {
                        dVar243 = dVar247;
                      }
                    }
                    uVar218 = SUB84(dVar224,0);
                    uVar220 = (undefined4)((ulong)dVar224 >> 0x20);
                    dVar247 = dVar243;
                    if ((uVar18 >> 0x11 & 1) != 0) {
                      cVar195 = '\x05';
                      uVar219 = uVar218;
                      uVar221 = uVar220;
                      dVar247 = dVar224;
                      for (lVar193 = -1; lVar193 != 2; lVar193 = lVar193 + 1) {
                        cVar166 = cVar195;
                        for (lVar178 = -1; lVar178 != 2; lVar178 = lVar178 + 1) {
                          for (lVar189 = 0; lVar189 != 2; lVar189 = lVar189 + 1) {
                            if (((int)lVar189 == 1 && ((int)lVar178 == 0 && (int)lVar193 == 0)) ||
                               ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) == 0)) {
                              dVar227 = (double)CONCAT44(uVar221,uVar219);
                            }
                            else {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                          (iVar98 + (int)lVar178) * lVar146 +
                                                          (long)(iVar17 + (int)lVar189)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar247) {
                                dVar232 = dVar247;
                              }
                              dVar247 = dVar232;
                              if ((double)CONCAT44(uVar221,uVar219) < dVar227 ||
                                  (double)CONCAT44(uVar221,uVar219) == dVar227) {
                                dVar227 = (double)CONCAT44(uVar221,uVar219);
                              }
                            }
                            uVar219 = SUB84(dVar227,0);
                            uVar221 = (undefined4)((ulong)dVar227 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar27 + lVar168 + lVar129 + (iVar99 - iVar7))[lVar31] - dVar212
                                 ) * dVar225 +
                                (pdVar27[lVar168 + lVar129 + (iVar99 - iVar7)] - dVar238) * dVar236
                                + (dVar224 - (dVar239 + 0.5) * dVar242)) - dVar224;
                      if (dVar227 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar247 = ((double)CONCAT44(uVar221,uVar219) - dVar224) / dVar227,
                           1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar227;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar243 <= dVar247) {
                        dVar247 = dVar243;
                      }
                    }
                    dVar243 = dVar247;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      cVar195 = '\x0e';
                      uVar219 = uVar218;
                      uVar221 = uVar220;
                      dVar243 = dVar224;
                      for (lVar193 = 0; lVar193 != 2; lVar193 = lVar193 + 1) {
                        cVar166 = cVar195;
                        for (lVar178 = -1; lVar178 != 2; lVar178 = lVar178 + 1) {
                          for (lVar189 = 0; lVar189 != 3; lVar189 = lVar189 + 1) {
                            if (((int)lVar189 == 1 && ((int)lVar178 == 0 && (int)lVar193 == 0)) ||
                               ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) == 0)) {
                              dVar227 = (double)CONCAT44(uVar221,uVar219);
                            }
                            else {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                          (iVar98 + (int)lVar178) * lVar146 +
                                                          (long)(iVar17 + (int)lVar189)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar243) {
                                dVar232 = dVar243;
                              }
                              dVar243 = dVar232;
                              if ((double)CONCAT44(uVar221,uVar219) < dVar227 ||
                                  (double)CONCAT44(uVar221,uVar219) == dVar227) {
                                dVar227 = (double)CONCAT44(uVar221,uVar219);
                              }
                            }
                            uVar219 = SUB84(dVar227,0);
                            uVar221 = (undefined4)((ulong)dVar227 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((0.5 - dVar212) * dVar225 +
                                ((pdVar42 + lVar169 + lVar130 + (iVar99 - iVar14))[lVar38] - dVar238
                                ) * dVar236 +
                                (pdVar42[lVar169 + lVar130 + (iVar99 - iVar14)] - dVar239) * dVar242
                                + dVar224) - dVar224;
                      if (dVar227 <= 1e-13) {
                        dVar243 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar243 = ((double)CONCAT44(uVar221,uVar219) - dVar224) / dVar227,
                           1.0 <= dVar243)) {
                          dVar243 = 1.0;
                        }
                      }
                      else {
                        dVar243 = (dVar243 - dVar224) / dVar227;
                        if (1.0 <= dVar243) {
                          dVar243 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar243) {
                        dVar243 = dVar247;
                      }
                    }
                    dVar247 = dVar243;
                    if ((uVar18 >> 9 & 1) != 0) {
                      cVar195 = '\x05';
                      uVar219 = 0;
                      uVar221 = 0;
                      dVar247 = dVar224;
                      for (lVar193 = -1; lVar193 != 1; lVar193 = lVar193 + 1) {
                        cVar166 = cVar195;
                        for (lVar178 = -1; lVar178 != 2; lVar178 = lVar178 + 1) {
                          for (lVar189 = 0; lVar189 != 3; lVar189 = lVar189 + 1) {
                            if (((int)lVar189 == 1 && ((int)lVar178 == 0 && (int)lVar193 == 0)) ||
                               ((1 << (cVar166 + (char)lVar189 & 0x1fU) & uVar18) == 0)) {
                              auVar231._4_4_ = uVar220;
                              auVar231._0_4_ = uVar218;
                              auVar231._12_4_ = uVar221;
                              auVar231._8_4_ = uVar219;
                            }
                            else {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar193) * lVar199 +
                                                          (iVar98 + (int)lVar178) * lVar146 +
                                                          (long)(iVar17 + (int)lVar189)];
                              auVar231._8_8_ = 0;
                              auVar231._0_8_ = dVar227;
                              dVar232 = dVar227;
                              if (dVar227 <= dVar247) {
                                dVar232 = dVar247;
                              }
                              dVar247 = dVar232;
                              if ((double)CONCAT44(uVar220,uVar218) < dVar227 ||
                                  (double)CONCAT44(uVar220,uVar218) == dVar227) {
                                auVar231._4_4_ = uVar220;
                                auVar231._0_4_ = uVar218;
                                auVar231._12_4_ = uVar221;
                                auVar231._8_4_ = uVar219;
                              }
                            }
                            uVar218 = auVar231._0_4_;
                            uVar220 = auVar231._4_4_;
                            uVar219 = auVar231._8_4_;
                            uVar221 = auVar231._12_4_;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar239 = ((((pdVar42 + lVar170 + lVar130 + (iVar99 - iVar14))[lVar38] -
                                  dVar238) * dVar236 +
                                 (pdVar42[lVar170 + lVar130 + (iVar99 - iVar14)] - dVar239) *
                                 dVar242 + dVar224) - (dVar212 + 0.5) * dVar225) - dVar224;
                      if (dVar239 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar239 < -1e-13) &&
                           (dVar247 = ((double)CONCAT44(uVar220,uVar218) - dVar224) / dVar239,
                           1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar239;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar243 <= dVar247) {
                        dVar247 = dVar243;
                      }
                    }
                    dVar239 = 0.0;
                    if (1 < iVar115) {
                      dVar239 = dVar247;
                    }
                    uVar218 = 0;
                    uVar220 = 0;
                    if (1 < iVar119) {
                      uVar218 = SUB84(dVar247,0);
                      uVar220 = (undefined4)((ulong)dVar247 >> 0x20);
                    }
                    dVar238 = 0.0;
                    if (1 < iVar183) {
                      dVar238 = dVar247;
                    }
                    if ((local_458 == 1.0) && (!NAN(local_458))) {
                      if ((pdVar36[lVar125 + lVar192 + (int)(~uVar5 + iVar99)] == 1.0) &&
                         (((!NAN(pdVar36[lVar125 + lVar192 + (int)(~uVar5 + iVar99)]) &&
                           (pdVar36[lVar125 + lVar192 + (iVar167 + 1)] == 1.0)) &&
                          (!NAN(pdVar36[lVar125 + lVar192 + (iVar167 + 1)]))))) {
                        dVar239 = 1.0;
                      }
                      if (((pdVar36[lVar192 + lVar126 + lVar104] == 1.0) &&
                          (!NAN(pdVar36[lVar192 + lVar126 + lVar104]))) &&
                         ((pdVar36[lVar192 + (iVar138 + 1) * lVar151 + lVar104] == 1.0 &&
                          (!NAN(pdVar36[lVar192 + (iVar138 + 1) * lVar151 + lVar104]))))) {
                        uVar218 = 0;
                        uVar220 = 0x3ff00000;
                      }
                      if (((pdVar36[lVar125 + lVar171 + lVar104] == 1.0) &&
                          (!NAN(pdVar36[lVar125 + lVar171 + lVar104]))) &&
                         ((pdVar36[lVar125 + lVar172 + lVar104] == 1.0 &&
                          (!NAN(pdVar36[lVar125 + lVar172 + lVar104]))))) {
                        dVar238 = 1.0;
                      }
                    }
                    dVar239 = dVar235 * dVar225 * dVar238 +
                              ((dVar209 * dVar242 * dVar239 + dVar224) -
                              local_448 * dVar236 * (double)CONCAT44(uVar220,uVar218));
                    pEVar213 = local_438;
                    if (dVar239 <= (double)local_438) {
                      pEVar213 = (EBCellFlag *)dVar239;
                    }
                    dVar239 = pdVar24[lVar161 + lVar131 + lVar105];
                    dVar238 = pdVar24[lVar161 + lVar131 + lVar105 + lVar20];
                    dVar212 = pdVar24[lVar161 + lVar131 + lVar105 + lVar20 * 2];
                    uVar18 = pEVar41[lVar181 + (lVar103 - lVar149) * lVar39 + lVar143].flag;
                    iVar183 = 0;
                    cVar195 = '\x05';
                    for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                      lVar193 = lVar145;
                      lVar178 = local_968;
                      lVar189 = lVar144;
                      iVar139 = iVar183;
                      cVar166 = cVar195;
                      for (lVar105 = -1; iVar139 = iVar139 + 3, lVar105 != 2; lVar105 = lVar105 + 1)
                      {
                        lVar108 = (long)iVar183;
                        paRVar163 = A + lVar108;
                        iVar183 = iVar183 + 3;
                        for (lVar175 = 0; iVar139 - lVar108 != lVar175; lVar175 = lVar175 + 1) {
                          iVar100 = (int)lVar175 + -1;
                          if ((((int)lVar105 == 0 && (int)lVar143 == 0) && iVar100 == 0) ||
                             ((1 << (cVar166 + (char)lVar175 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            dVar224 = *(double *)(lVar178 + lVar175 * 8);
                            (*paRVar163)[0] =
                                 (*(double *)(lVar189 + lVar175 * 8) + (double)iVar100) - dVar239;
                            (*paRVar163)[1] = (dVar224 + (double)(int)lVar105) - dVar238;
                            (*paRVar163)[2] =
                                 (*(double *)(lVar193 + lVar175 * 8) + (double)(int)lVar143) -
                                 dVar212;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        lVar189 = lVar189 + lVar28 * 8;
                        lVar178 = lVar178 + lVar28 * 8;
                        lVar193 = lVar193 + lVar28 * 8;
                        cVar166 = cVar166 + '\x03';
                      }
                      lVar144 = lVar144 + lVar19 * 8;
                      local_968 = local_968 + lVar19 * 8;
                      lVar145 = lVar145 + lVar19 * 8;
                      cVar195 = cVar195 + '\t';
                    }
                    iVar183 = 0;
                    cVar195 = '\x05';
                    for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                      iVar139 = iVar183;
                      cVar166 = cVar195;
                      for (lVar144 = -1; iVar139 = iVar139 + 3, lVar144 != 2; lVar144 = lVar144 + 1)
                      {
                        lVar145 = (long)iVar183;
                        iVar183 = iVar183 + 3;
                        for (lVar105 = 0; iVar139 - lVar145 != lVar105; lVar105 = lVar105 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar105 != 1 || ((int)lVar144 != 0 || (int)lVar143 != 0)) &&
                             ((1 << (cVar166 + (char)lVar105 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                        (int)(((int)lVar103 - uVar10) + (int)lVar144
                                                             ) * lVar146 +
                                                        (long)(iVar17 + (int)lVar105)] - dVar240;
                          }
                          du[lVar145 + lVar105] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar224 = dVar233;
                    if (dVar233 <= (double)pEVar213) {
                      dVar224 = (double)pEVar213;
                    }
                    pdVar109 = &local_4a8;
                    for (lVar143 = 0; lVar144 = -0x48, lVar143 != 3; lVar143 = lVar143 + 1) {
                      for (; lVar144 != 0; lVar144 = lVar144 + 0x18) {
                        *(undefined8 *)((long)pdVar109 + lVar144 + 0x48) = 0;
                      }
                      local_668[lVar143] = 0.0;
                      pdVar109 = pdVar109 + 1;
                    }
                    pRVar113 = A[0] + 1;
                    dVar240 = local_668[1];
                    dVar209 = local_668[2];
                    dVar225 = local_488;
                    dVar242 = local_468;
                    dVar236 = dStack_480;
                    dVar235 = local_4a0;
                    dVar243 = dStack_498;
                    dVar247 = local_668[0];
                    dVar227 = local_4a8;
                    for (lVar143 = 0; lVar143 != 0x1b; lVar143 = lVar143 + 1) {
                      dVar232 = (*(Real (*) [3])(pRVar113 + -1))[0];
                      dVar216 = *pRVar113;
                      dVar226 = pRVar113[1];
                      dVar211 = du[lVar143];
                      dVar243 = dVar243 + dVar226 * dVar232;
                      dVar236 = dVar236 + dVar226 * dVar216;
                      dVar235 = dVar235 + dVar216 * dVar232;
                      dVar225 = dVar225 + dVar216 * dVar216;
                      dVar242 = dVar242 + dVar226 * dVar226;
                      dVar247 = dVar247 + dVar232 * dVar211;
                      dVar227 = dVar227 + dVar232 * dVar232;
                      dVar240 = dVar240 + dVar211 * dVar216;
                      dVar209 = dVar209 + dVar211 * dVar226;
                      pRVar113 = pRVar113 + 3;
                    }
                    dVar216 = dVar242 * dVar235 - dVar243 * dVar236;
                    dVar226 = dVar209 * dVar235 - dVar243 * dVar240;
                    dVar232 = dVar235 * dVar236 + dVar243 * -dVar225;
                    dVar211 = dVar242 * dVar225 - dVar236 * dVar236;
                    dVar242 = dVar240 * dVar242 - dVar236 * dVar209;
                    auVar234._0_8_ =
                         dVar243 * (dVar240 * dVar236 - dVar209 * dVar225) +
                         (dVar247 * dVar211 - dVar242 * dVar235);
                    auVar234._8_8_ = dVar243 * dVar226 + (dVar227 * dVar242 - dVar216 * dVar247);
                    dVar242 = dVar232 * dVar243 + (dVar211 * dVar227 - dVar216 * dVar235);
                    auVar205._8_8_ = dVar242;
                    auVar205._0_8_ = dVar242;
                    auVar229 = divpd(auVar234,auVar205);
                    dVar242 = (dVar232 * dVar247 +
                              ((dVar209 * dVar225 + -dVar240 * dVar236) * dVar227 -
                              dVar226 * dVar235)) / dVar242;
                    dVar240 = pdVar36[lVar126 + lVar192 + lVar104];
                    dVar209 = auVar229._0_8_;
                    dVar225 = auVar229._8_8_;
                    if ((dVar240 == 1.0) && (!NAN(dVar240))) {
                      if ((pdVar36[lVar126 + lVar192 + (int)((iVar99 + -1) - uVar5)] == 1.0) &&
                         (!NAN(pdVar36[lVar126 + lVar192 + (int)((iVar99 + -1) - uVar5)]))) {
                        if ((pdVar36[lVar126 + lVar192 + (int)((iVar99 + 1) - uVar5)] == 1.0) &&
                           (!NAN(pdVar36[lVar126 + lVar192 + (int)((iVar99 + 1) - uVar5)]))) {
                          dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150] -
                                    pdVar26[lVar124 + lVar185 + lVar150 + ((iVar99 + -1) - iVar114)]
                          ;
                          dVar247 = pdVar26[lVar124 + lVar185 + lVar150 + ((iVar99 + 1) - iVar114)]
                                    - pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                          dVar243 = dVar243 + dVar243;
                          dVar247 = dVar247 + dVar247;
                          dVar209 = (pdVar26[lVar124 + lVar185 + lVar150 + ((iVar99 + 1) - iVar114)]
                                    - pdVar26[lVar124 + lVar185 + lVar150 + ((iVar99 + -1) - iVar114
                                                                            )]) * 0.5;
                          dVar235 = ABS(dVar243);
                          uVar202 = -(ulong)(0.0 < dVar209);
                          dVar209 = ABS(dVar209);
                          dVar236 = ABS(dVar247);
                          if (dVar235 <= dVar209) {
                            dVar209 = dVar235;
                          }
                          if (dVar209 <= dVar236) {
                            dVar236 = dVar209;
                          }
                          uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar236;
                          dVar209 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                            uVar202 & uVar203);
                        }
                      }
                      if ((((pdVar36[lVar192 + ((lVar194 + -2) - lVar107) * lVar151 + lVar104] ==
                             1.0) && (!NAN(pdVar36[lVar192 + ((lVar194 + -2) - lVar107) * lVar151 +
                                                             lVar104]))) && (local_458 == 1.0)) &&
                         (!NAN(local_458))) {
                        dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150] -
                                  pdVar26[lVar150 + lVar185 + ((lVar194 + -2) - lVar140) * lVar146 +
                                                              lVar106];
                        dVar247 = pdVar26[lVar121 + lVar106 + lVar185 + lVar150] -
                                  pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                        dVar243 = dVar243 + dVar243;
                        dVar247 = dVar247 + dVar247;
                        dVar225 = (pdVar26[lVar121 + lVar106 + lVar185 + lVar150] -
                                  pdVar26[lVar150 + lVar185 + ((lVar194 + -2) - lVar140) * lVar146 +
                                                              lVar106]) * 0.5;
                        dVar235 = ABS(dVar243);
                        uVar202 = -(ulong)(0.0 < dVar225);
                        dVar225 = ABS(dVar225);
                        dVar236 = ABS(dVar247);
                        if (dVar235 <= dVar225) {
                          dVar225 = dVar235;
                        }
                        if (dVar225 <= dVar236) {
                          dVar236 = dVar225;
                        }
                        uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar236;
                        dVar225 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                      if (((pdVar36[lVar126 + lVar104 + lVar176] == 1.0) &&
                          (!NAN(pdVar36[lVar126 + lVar104 + lVar176]))) &&
                         ((pdVar36[lVar126 + lVar104 + lVar197] == 1.0 &&
                          (!NAN(pdVar36[lVar126 + lVar104 + lVar197]))))) {
                        dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150] -
                                  pdVar26[lVar124 + lVar106 + lVar180 + lVar150];
                        dVar247 = pdVar26[lVar124 + lVar106 + lVar177 + lVar150] -
                                  pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                        dVar243 = dVar243 + dVar243;
                        dVar247 = dVar247 + dVar247;
                        dVar242 = (pdVar26[lVar124 + lVar106 + lVar177 + lVar150] -
                                  pdVar26[lVar124 + lVar106 + lVar180 + lVar150]) * 0.5;
                        dVar235 = ABS(dVar243);
                        uVar202 = -(ulong)(0.0 < dVar242);
                        dVar242 = ABS(dVar242);
                        dVar236 = ABS(dVar247);
                        if (dVar235 <= dVar242) {
                          dVar242 = dVar235;
                        }
                        if (dVar242 <= dVar236) {
                          dVar236 = dVar242;
                        }
                        uVar203 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar236;
                        dVar242 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                    }
                    iVar100 = 0;
                    iVar183 = 0;
                    iVar119 = 0;
                    iVar115 = 0;
                    iVar139 = -1;
                    while (iVar139 != 2) {
                      iVar116 = iVar100;
                      iVar174 = -1;
                      while (iVar174 != 2) {
                        for (iVar94 = 5; iVar94 != 8; iVar94 = iVar94 + 1) {
                          if (((uVar18 >> (iVar116 + iVar94 & 0x1fU) & 1) != 0) &&
                             ((iVar94 != 6 || iVar174 != 0) || iVar139 != 0)) {
                            iVar115 = iVar115 + (uint)((iVar94 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar174 == 0 && iVar139 == 0));
                            iVar119 = iVar119 + (uint)((iVar94 == 6 && iVar139 == 0) &&
                                                      (iVar174 == 1 || iVar174 + 1 == 0));
                            iVar183 = iVar183 + (uint)((iVar94 == 6 && iVar174 == 0) &&
                                                      (iVar139 == 1 || iVar139 + 1 == 0));
                          }
                        }
                        iVar116 = iVar116 + 3;
                        iVar174 = iVar174 + 1;
                      }
                      iVar100 = iVar100 + 9;
                      iVar139 = iVar139 + 1;
                    }
                    dVar236 = 2.0;
                    iVar139 = (int)(lVar103 - lVar140);
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      dVar235 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\b';
                      dVar243 = dVar235;
                      dVar236 = dVar235;
                      for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = 0; lVar144 != 2; lVar144 = lVar144 + 1) {
                          for (lVar145 = -1; lVar145 != 2; lVar145 = lVar145 + 1) {
                            uVar218 = SUB84(dVar236,0);
                            uVar220 = (undefined4)((ulong)dVar236 >> 0x20);
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar247 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              uVar219 = SUB84(dVar247,0);
                              uVar221 = (int)((ulong)dVar247 >> 0x20);
                              if (dVar247 <= dVar236) {
                                uVar219 = uVar218;
                                uVar221 = uVar220;
                              }
                              uVar218 = uVar219;
                              uVar220 = uVar221;
                              if (dVar247 < dVar243) {
                                dVar243 = dVar247;
                              }
                            }
                            dVar236 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar247 = ((pdVar112[lVar35] - dVar212) * dVar242 +
                                (0.5 - dVar238) * dVar225 +
                                (*pdVar112 - dVar239) * dVar209 + dVar235) - dVar235;
                      if (dVar247 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar247 < -1e-13) &&
                           (dVar236 = (dVar243 - dVar235) / dVar247, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = (dVar236 - dVar235) / dVar247;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (2.0 <= dVar236) {
                        dVar236 = 2.0;
                      }
                    }
                    dVar235 = dVar236;
                    if ((short)uVar18 < 0) {
                      dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = -1; lVar144 != 1; lVar144 = lVar144 + 1) {
                          for (lVar145 = -1; lVar145 != 2; lVar145 = lVar145 + 1) {
                            uVar218 = SUB84(dVar235,0);
                            uVar220 = (undefined4)((ulong)dVar235 >> 0x20);
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              uVar219 = SUB84(dVar227,0);
                              uVar221 = (int)((ulong)dVar227 >> 0x20);
                              if (dVar227 <= dVar235) {
                                uVar219 = uVar218;
                                uVar221 = uVar220;
                              }
                              uVar218 = uVar219;
                              uVar220 = uVar221;
                              if (dVar227 < dVar247) {
                                dVar247 = dVar227;
                              }
                            }
                            dVar235 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar32 + lVar142 + (lVar103 - iVar12) * lVar33 + lVar162)
                                  [lVar35] - dVar212) * dVar242 +
                                -(dVar238 + 0.5) * dVar225 +
                                (pdVar32[lVar142 + (lVar103 - iVar12) * lVar33 + lVar162] - dVar239)
                                * dVar209 + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar236 <= dVar235) {
                        dVar235 = dVar236;
                      }
                    }
                    dVar236 = dVar235;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\x06';
                      dVar236 = dVar243;
                      dVar247 = dVar243;
                      for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = -1; lVar144 != 2; lVar144 = lVar144 + 1) {
                          for (lVar145 = 0; lVar145 != 2; lVar145 = lVar145 + 1) {
                            uVar219 = SUB84(dVar247,0);
                            uVar221 = (undefined4)((ulong)dVar247 >> 0x20);
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 & 0x1fU) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar236) {
                                dVar232 = dVar236;
                              }
                              dVar236 = dVar232;
                              uVar218 = SUB84(dVar227,0);
                              uVar220 = (int)((ulong)dVar227 >> 0x20);
                              if (dVar247 <= dVar227) {
                                uVar218 = uVar219;
                                uVar220 = uVar221;
                              }
                            }
                            dVar247 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar27 + lVar168 + lVar127 + ((iVar99 - iVar7) + 1))[lVar31] -
                                 dVar212) * dVar242 +
                                (pdVar27[lVar168 + lVar127 + ((iVar99 - iVar7) + 1)] - dVar238) *
                                dVar225 + (0.5 - dVar239) * dVar209 + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar236 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = (dVar236 - dVar243) / dVar227;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar236) {
                        dVar236 = dVar235;
                      }
                    }
                    dVar235 = dVar236;
                    if ((uVar18 >> 0x11 & 1) != 0) {
                      dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar143 = -1; lVar143 != 2; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = -1; lVar144 != 2; lVar144 = lVar144 + 1) {
                          for (lVar145 = -1; lVar145 != 1; lVar145 = lVar145 + 1) {
                            uVar219 = SUB84(dVar247,0);
                            uVar221 = (undefined4)((ulong)dVar247 >> 0x20);
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar235) {
                                dVar232 = dVar235;
                              }
                              dVar235 = dVar232;
                              uVar218 = SUB84(dVar227,0);
                              uVar220 = (int)((ulong)dVar227 >> 0x20);
                              if (dVar247 <= dVar227) {
                                uVar218 = uVar219;
                                uVar220 = uVar221;
                              }
                            }
                            dVar247 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar27 + lVar168 + lVar127 + (iVar99 - iVar7))[lVar31] - dVar212
                                 ) * dVar242 +
                                (pdVar27[lVar168 + lVar127 + (iVar99 - iVar7)] - dVar238) * dVar225
                                + (dVar243 - (dVar239 + 0.5) * dVar209)) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar236 <= dVar235) {
                        dVar235 = dVar236;
                      }
                    }
                    dVar236 = dVar235;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\x0e';
                      dVar247 = dVar243;
                      dVar236 = dVar243;
                      for (lVar143 = 0; lVar143 != 2; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = -1; lVar144 != 2; lVar144 = lVar144 + 1) {
                          for (lVar145 = -1; lVar145 != 2; lVar145 = lVar145 + 1) {
                            uVar219 = SUB84(dVar247,0);
                            uVar221 = (undefined4)((ulong)dVar247 >> 0x20);
                            uVar218 = uVar219;
                            uVar220 = uVar221;
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar236) {
                                dVar232 = dVar236;
                              }
                              dVar236 = dVar232;
                              uVar218 = SUB84(dVar227,0);
                              uVar220 = (int)((ulong)dVar227 >> 0x20);
                              if (dVar247 <= dVar227) {
                                uVar218 = uVar219;
                                uVar220 = uVar221;
                              }
                            }
                            dVar247 = (double)CONCAT44(uVar220,uVar218);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((0.5 - dVar212) * dVar242 +
                                ((pdVar42 + lVar169 + lVar122 + (iVar99 - iVar14))[lVar38] - dVar238
                                ) * dVar225 +
                                (pdVar42[lVar169 + lVar122 + (iVar99 - iVar14)] - dVar239) * dVar209
                                + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar236 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar236 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar236)) {
                          dVar236 = 1.0;
                        }
                      }
                      else {
                        dVar236 = (dVar236 - dVar243) / dVar227;
                        if (1.0 <= dVar236) {
                          dVar236 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar236) {
                        dVar236 = dVar235;
                      }
                    }
                    dVar235 = dVar236;
                    if ((uVar18 >> 9 & 1) != 0) {
                      dVar243 = pdVar26[lVar124 + lVar106 + lVar185 + lVar150];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar143 = -1; lVar143 != 1; lVar143 = lVar143 + 1) {
                        cVar166 = cVar195;
                        for (lVar144 = -1; lVar144 != 2; lVar144 = lVar144 + 1) {
                          for (lVar145 = -1; lVar145 != 2; lVar145 = lVar145 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar144 != 0 || (int)lVar143 != 0) || (int)lVar145 != 0) &&
                               ((1 << (cVar166 + (char)lVar145 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar26[lVar150 + (iVar118 + (int)lVar143) * lVar199 +
                                                          (iVar139 + (int)lVar144) * lVar146 +
                                                          (long)(iVar153 + (int)lVar145)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar235) {
                                dVar232 = dVar235;
                              }
                              dVar235 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((((pdVar42 + lVar170 + lVar122 + (iVar99 - iVar14))[lVar38] -
                                  dVar238) * dVar225 +
                                 (pdVar42[lVar170 + lVar122 + (iVar99 - iVar14)] - dVar239) *
                                 dVar209 + dVar243) - (dVar212 + 0.5) * dVar242) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar236 <= dVar235) {
                        dVar235 = dVar236;
                      }
                    }
                    uVar218 = 0;
                    uVar220 = 0;
                    dVar236 = 0.0;
                    if (1 < iVar115) {
                      dVar236 = dVar235;
                    }
                    dVar243 = 0.0;
                    if (1 < iVar119) {
                      dVar243 = dVar235;
                    }
                    if (1 < iVar183) {
                      uVar218 = SUB84(dVar235,0);
                      uVar220 = (undefined4)((ulong)dVar235 >> 0x20);
                    }
                    if ((dVar240 == 1.0) && (!NAN(dVar240))) {
                      if ((pdVar36[lVar126 + lVar192 + (int)(~uVar5 + iVar99)] == 1.0) &&
                         (((!NAN(pdVar36[lVar126 + lVar192 + (int)(~uVar5 + iVar99)]) &&
                           (pdVar36[lVar126 + lVar192 + (iVar167 + 1)] == 1.0)) &&
                          (!NAN(pdVar36[lVar126 + lVar192 + (iVar167 + 1)]))))) {
                        dVar236 = 1.0;
                      }
                      if (((pdVar36[lVar192 + (iVar138 + -2) * lVar151 + lVar104] == 1.0) &&
                          (!NAN(pdVar36[lVar192 + (iVar138 + -2) * lVar151 + lVar104]))) &&
                         ((pdVar36[lVar192 + lVar125 + lVar104] == 1.0 &&
                          (!NAN(pdVar36[lVar192 + lVar125 + lVar104]))))) {
                        dVar243 = 1.0;
                      }
                      if (((pdVar36[lVar126 + lVar171 + lVar104] == 1.0) &&
                          (!NAN(pdVar36[lVar126 + lVar171 + lVar104]))) &&
                         ((pdVar36[lVar126 + lVar172 + lVar104] == 1.0 &&
                          (!NAN(pdVar36[lVar126 + lVar172 + lVar104]))))) {
                        uVar218 = 0;
                        uVar220 = 0x3ff00000;
                      }
                    }
                    dVar222 = (0.5 - dVar238) * dVar225 * dVar243 +
                              (dVar222 - dVar239) * dVar209 * dVar236 +
                              pdVar26[lVar124 + lVar106 + lVar185 + lVar150] +
                              (dVar248 - dVar212) * dVar242 * (double)CONCAT44(uVar220,uVar218);
                    if (dVar222 <= (double)local_438) {
                      local_438 = (EBCellFlag *)dVar222;
                    }
                    if (dVar233 <= (double)local_438) {
                      dVar233 = (double)local_438;
                    }
                    iVar167 = d_bcrec_ptr[uVar134].bc[4];
                    if (lVar194 == iVar101) {
                      switch(d_bcrec_ptr[uVar134].bc[1]) {
                      case 1:
switchD_0036cfc3_caseD_1:
                        dVar233 = dVar224;
                        break;
                      case 2:
                      case 4:
                        if ((uVar134 != 1 || !is_velocity) ||
                            pdVar21[lVar173 + lVar123 + (iVar99 - iVar154)] < 0.0)
                        goto switchD_0036cfc3_caseD_1;
                        dVar233 = 0.0;
                        if (dVar224 <= 0.0) {
                          dVar233 = dVar224;
                        }
LAB_0036d07e:
                        dVar224 = dVar233;
                        break;
                      case 3:
                        dVar233 = pdVar26[lVar150 + lVar185 + (int)(~uVar10 + iVar155) * lVar146 +
                                                              lVar106];
                        if (uVar134 == 1 && is_velocity) goto LAB_0036d07e;
                        break;
                      case -1:
                        dVar224 = 0.0;
                        dVar233 = 0.0;
                      }
                      if (lVar194 == lVar165) goto switchD_0036d037_caseD_0;
                    }
                    else {
                      if (lVar194 != lVar165) goto LAB_0036d11d;
                      switch(iVar167) {
                      case 1:
                      case 2:
                      case 4:
                        dVar224 = dVar233;
                        break;
                      case 3:
                        dVar224 = pdVar26[lVar121 + lVar106 + lVar185 + lVar150];
                        dVar222 = pdVar26[lVar121 + lVar106 + lVar185 + lVar150];
                        if (uVar134 != 1 || !is_velocity) goto LAB_0036d11d;
                        goto LAB_0036d0e7;
                      case -1:
                        dVar233 = 0.0;
                        dVar224 = 0.0;
                        goto LAB_0036d11d;
                      }
switchD_0036d037_caseD_0:
                      if (((iVar167 == 4) || (iVar167 == 2)) &&
                         (dVar224 = dVar233,
                         (uVar134 == 1 && is_velocity) &&
                         pdVar21[lVar173 + lVar123 + (iVar99 - iVar154)] <= 0.0)) {
                        dVar222 = 0.0;
                        if (0.0 <= dVar233) {
                          dVar222 = dVar233;
                        }
LAB_0036d0e7:
                        dVar233 = dVar222;
                        dVar224 = dVar233;
                      }
                    }
LAB_0036d11d:
                    dVar222 = dVar233;
                    if ((pdVar21[lVar173 + lVar123 + (iVar99 - iVar154)] <= 1e-08) &&
                       (dVar222 = dVar224, -1e-08 <= pdVar21[lVar173 + lVar123 + (iVar99 - iVar154)]
                       )) {
                      dVar222 = (dVar224 + dVar233) * 0.5;
                    }
                  }
                  pdVar40[lVar160 + (lVar159 - iVar93) * lVar25 +
                                    (lVar194 - iVar188) * lVar23 + (lVar132 - (long)local_3b8)] =
                       dVar222;
                  iVar158 = iVar158 + 1;
                  iVar17 = iVar17 + 1;
                  iVar153 = iVar153 + 1;
                  bVar200 = iVar99 != iVar4;
                  iVar99 = iVar99 + 1;
                } while (bVar200);
              }
            }
            local_740 = local_740 + lVar19;
            local_738 = local_738 + lVar19;
            local_730 = local_730 + lVar19;
            lVar159 = lVar141;
          }
        }
        lVar19 = ccc->nstride;
        iVar2 = (ccc->begin).z;
        lVar20 = ccc->kstride;
        lVar151 = ((lVar120 - iVar2) + -2) * lVar20;
        iVar3 = (ccc->begin).x;
        lVar164 = (long)iVar3;
        pdVar21 = q->p;
        lVar184 = q->jstride;
        lVar22 = q->kstride;
        local_418 = (double *)q->nstride;
        iVar135 = (q->begin).x;
        iVar196 = (q->begin).y;
        uVar5 = (q->begin).z;
        lVar107 = (long)(int)uVar5;
        pdVar24 = ccc->p;
        lVar23 = ccc->jstride;
        iVar154 = (ccc->begin).y;
        pdVar26 = fcx->p;
        lVar25 = fcx->jstride;
        lVar146 = fcx->kstride;
        lVar199 = fcx->nstride;
        iVar182 = (fcx->begin).x;
        iVar152 = (fcx->begin).y;
        lVar147 = (long)(fcx->begin).z;
        local_3c8 = fcy->p;
        lVar28 = fcy->jstride;
        local_3d0 = fcy->kstride;
        lVar29 = fcy->nstride;
        iVar188 = (fcy->begin).x;
        iVar93 = (fcy->begin).y;
        local_3d8 = (long)(fcy->begin).z;
        pdVar27 = fcz->p;
        lVar30 = fcz->jstride;
        lVar31 = fcz->kstride;
        lVar33 = fcz->nstride;
        iVar114 = (fcz->begin).x;
        iVar191 = (fcz->begin).y;
        iVar6 = (fcz->begin).z;
        pEVar41 = flag->p;
        lVar34 = flag->jstride;
        lVar35 = flag->kstride;
        iVar7 = (flag->begin).x;
        iVar8 = (flag->begin).y;
        lVar148 = (long)(flag->begin).z;
        local_3e0 = (EBCellFlag *)wmac->p;
        lVar37 = wmac->jstride;
        local_3e8 = wmac->kstride;
        iVar11 = (wmac->begin).x;
        iVar12 = (wmac->begin).y;
        local_3f0 = (long)(wmac->begin).z;
        local_420 = local_4b8->p;
        lVar38 = local_4b8->jstride;
        local_3f8 = local_4b8->kstride;
        local_428 = local_4b8->nstride;
        iVar13 = (local_4b8->begin).x;
        iVar14 = (local_4b8->begin).y;
        iVar15 = (local_4b8->begin).z;
        pdVar32 = vfrac->p;
        lVar39 = vfrac->jstride;
        local_400 = (double *)vfrac->kstride;
        uVar9 = (vfrac->begin).x;
        uVar10 = (vfrac->begin).y;
        lVar165 = (long)(int)uVar10;
        local_408 = (long)(vfrac->begin).z;
        iVar16 = (domain->smallend).vect[2];
        lVar149 = (long)(domain->bigend).vect[2] + 1;
        local_410 = (double *)(ulong)~uVar5;
        local_3a0 = pdVar24 + ((lVar151 + lVar19 + -1) - lVar164);
        local_3a8 = pdVar24 + ((lVar151 + lVar19 * 2 + -1) - lVar164);
        uVar134 = 0;
        do {
          pdVar36 = local_420;
          if (uVar134 == uVar102) {
            return;
          }
          lVar160 = (long)local_418 * uVar134;
          bVar200 = uVar134 == 2 && is_velocity;
          lVar159 = local_428 * uVar134;
          local_830 = local_3a8;
          local_838 = local_3a0;
          lVar140 = lVar120;
          local_840 = pdVar24 + ((lVar151 + -1) - lVar164);
          while (pdVar40 = local_3c8, pEVar213 = local_3e0, lVar140 <= local_620) {
            iVar117 = (int)lVar140;
            iVar101 = iVar117 - uVar5;
            lVar181 = iVar101 * lVar22;
            lVar150 = lVar140 + -1;
            lVar171 = lVar22 * (lVar150 - lVar107);
            lVar192 = (lVar140 - local_408) * (long)local_400;
            lVar185 = (lVar150 - local_408) * (long)local_400;
            lVar141 = lVar140 + 1;
            lVar172 = (lVar141 - local_408) * (long)local_400;
            lVar142 = (lVar140 - local_3d8) * local_3d0;
            lVar161 = (lVar140 - lVar147) * lVar146;
            iVar158 = iVar117 - (int)local_408;
            lVar173 = (long)(iVar158 + 1) * (long)local_400;
            lVar176 = (lVar150 - iVar2) * lVar20;
            lVar168 = ((lVar140 + -2) - local_408) * (long)local_400;
            lVar177 = (lVar150 - local_3d8) * local_3d0;
            lVar180 = (lVar150 - lVar147) * lVar146;
            lVar169 = (long)(iVar158 + -2) * (long)local_400;
            lVar170 = (lVar140 - local_3f0) * local_3e8;
            iVar158 = (int)local_410;
            lVar197 = (lVar140 - iVar15) * local_3f8;
            lVar110 = local_3c0;
            while (lVar110 <= local_4b0) {
              if (iVar4 < iVar1) {
                lVar110 = lVar110 + 1;
              }
              else {
                lVar103 = (lVar110 - iVar8) * lVar34;
                lVar121 = (lVar110 - iVar191) * lVar30;
                iVar118 = (int)lVar110;
                iVar98 = iVar118 - iVar154;
                lVar122 = iVar98 * lVar23;
                iVar138 = iVar118 - iVar196;
                lVar123 = iVar138 * lVar184;
                lVar124 = (lVar110 - lVar165) * lVar39;
                lVar127 = ((lVar110 + -1) - lVar165) * lVar39;
                lVar194 = lVar110 + 1;
                lVar130 = (lVar194 - lVar165) * lVar39;
                lVar125 = ((lVar110 + -1) - (long)iVar196) * lVar184;
                lVar131 = (lVar194 - iVar196) * lVar184;
                lVar132 = ((iVar118 - iVar93) + 1) * lVar28;
                lVar143 = (lVar110 - iVar93) * lVar28;
                lVar144 = (lVar110 - iVar152) * lVar25;
                lVar145 = (int)(~uVar10 + iVar118) * lVar39;
                lVar129 = (int)((iVar118 - uVar10) + 1) * lVar39;
                lVar126 = (lVar110 - iVar12) * lVar37;
                local_3b8 = pdVar36 + lVar159 + lVar197 + (lVar110 - iVar14) * lVar38;
                lVar128 = (~(long)iVar154 + lVar110) * lVar23 * 8;
                iVar118 = iVar179 - iVar3;
                iVar17 = iVar179 - iVar135;
                iVar153 = iVar1 - iVar135;
                iVar99 = iVar1;
                do {
                  lVar104 = (long)iVar99;
                  lVar110 = lVar104 - iVar7;
                  uVar18 = pEVar41[lVar103 + lVar110 + (lVar140 - lVar148) * lVar35].flag;
                  dVar222 = 0.0;
                  if ((uVar18 >> 9 & 1) != 0) {
                    local_9e0 = (long)local_840 + lVar104 * 8 + lVar128;
                    lVar162 = (long)local_838 + lVar104 * 8 + lVar128;
                    lVar105 = (long)local_830 + lVar104 * 8 + lVar128;
                    lVar193 = lVar104 - iVar114;
                    pdVar42 = pdVar27 + lVar121 + lVar193 + (lVar140 - iVar6) * lVar31;
                    dVar222 = *pdVar42;
                    dVar248 = pdVar42[lVar33];
                    lVar178 = (long)(iVar99 - iVar3);
                    pdVar112 = pdVar24 + lVar122 + lVar178 + (iVar117 - iVar2) * lVar20;
                    dVar239 = *pdVar112;
                    dVar238 = pdVar112[lVar19];
                    dVar212 = pdVar112[lVar19 * 2];
                    lVar189 = (long)(iVar99 - iVar135);
                    dVar224 = pdVar21[lVar123 + lVar189 + lVar181 + lVar160];
                    dVar240 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                    iVar155 = 0;
                    cVar195 = '\x05';
                    for (lVar106 = -1; lVar106 != 2; lVar106 = lVar106 + 1) {
                      iVar183 = (int)lVar106;
                      iVar167 = iVar155;
                      cVar166 = cVar195;
                      for (lVar108 = -1; iVar167 = iVar167 + 3, lVar108 != 2; lVar108 = lVar108 + 1)
                      {
                        lVar175 = (long)iVar155;
                        paRVar163 = A + lVar175;
                        iVar139 = (int)lVar108;
                        iVar155 = iVar155 + 3;
                        for (lVar198 = 0; iVar167 - lVar175 != lVar198; lVar198 = lVar198 + 1) {
                          iVar100 = (int)lVar198 + -1;
                          if (((iVar139 == 0 && iVar183 == 0) && iVar100 == 0) ||
                             ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            pdVar112 = pdVar24 + ((iVar117 - iVar2) + iVar183) * lVar20 +
                                                 (iVar98 + iVar139) * lVar23 +
                                                 (long)(iVar118 + (int)lVar198);
                            dVar209 = pdVar112[lVar19];
                            (*paRVar163)[0] = (*pdVar112 + (double)iVar100) - dVar239;
                            (*paRVar163)[1] = (dVar209 + (double)iVar139) - dVar238;
                            (*paRVar163)[2] = (pdVar112[lVar19 * 2] + (double)iVar183) - dVar212;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar209 = dVar248 - dVar238;
                    dVar225 = dVar222 - dVar239;
                    iVar155 = 0;
                    cVar195 = '\x05';
                    for (lVar106 = -1; lVar106 != 2; lVar106 = lVar106 + 1) {
                      iVar167 = iVar155;
                      cVar166 = cVar195;
                      for (lVar108 = -1; iVar167 = iVar167 + 3, lVar108 != 2; lVar108 = lVar108 + 1)
                      {
                        lVar175 = (long)iVar155;
                        iVar155 = iVar155 + 3;
                        for (lVar198 = 0; iVar167 - lVar175 != lVar198; lVar198 = lVar198 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar198 != 1 || ((int)lVar108 != 0 || (int)lVar106 != 0)) &&
                             ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar21[lVar160 + (iVar101 + (int)lVar106) * lVar22 +
                                                        (iVar138 + (int)lVar108) * lVar184 +
                                                        (long)(iVar17 + (int)lVar198)] - dVar224;
                          }
                          du[lVar175 + lVar198] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    local_438 = (EBCellFlag *)dVar240;
                    if (dVar240 <= dVar224) {
                      local_438 = (EBCellFlag *)dVar224;
                    }
                    pdVar112 = &local_4a8;
                    for (lVar106 = 0; lVar108 = -0x48, lVar106 != 3; lVar106 = lVar106 + 1) {
                      for (; lVar108 != 0; lVar108 = lVar108 + 0x18) {
                        *(undefined8 *)((long)pdVar112 + lVar108 + 0x48) = 0;
                      }
                      local_668[lVar106] = 0.0;
                      pdVar112 = pdVar112 + 1;
                    }
                    pRVar113 = A[0] + 2;
                    dVar242 = local_488;
                    dVar236 = dStack_498;
                    dVar233 = dStack_480;
                    dVar235 = local_4a0;
                    dVar243 = local_468;
                    dVar247 = local_668[0];
                    dVar227 = local_4a8;
                    dVar232 = local_668[1];
                    dVar211 = local_668[2];
                    for (lVar106 = 0; lVar106 != 0x1b; lVar106 = lVar106 + 1) {
                      dVar226 = (*(Real (*) [3])(pRVar113 + -2))[0];
                      dVar237 = pRVar113[-1];
                      dVar216 = *pRVar113;
                      dVar242 = dVar242 + dVar237 * pRVar113[-1];
                      dVar236 = dVar236 + dVar226 * *pRVar113;
                      dVar233 = dVar233 + dVar216 * dVar237;
                      dVar235 = dVar235 + dVar237 * dVar226;
                      dVar243 = dVar243 + dVar216 * dVar216;
                      dVar216 = du[lVar106];
                      dVar247 = dVar247 + dVar226 * dVar216;
                      dVar227 = dVar227 + dVar226 * dVar226;
                      dVar232 = dVar232 + dVar216 * pRVar113[-1];
                      dVar211 = dVar211 + dVar216 * *pRVar113;
                      pRVar113 = pRVar113 + 3;
                    }
                    dVar216 = dVar235 * dVar243 - dVar236 * dVar233;
                    dVar237 = dVar235 * dVar211 - dVar236 * dVar232;
                    dVar226 = dVar235 * dVar233 + dVar236 * -dVar242;
                    dVar241 = dVar243 * dVar242 - dVar233 * dVar233;
                    dVar243 = dVar243 * dVar232 - dVar233 * dVar211;
                    auVar206._0_8_ =
                         dVar236 * (dVar233 * dVar232 - dVar211 * dVar242) +
                         (dVar247 * dVar241 - dVar243 * dVar235);
                    auVar206._8_8_ = dVar236 * dVar237 + (dVar227 * dVar243 - dVar216 * dVar247);
                    dVar236 = dVar226 * dVar236 + (dVar241 * dVar227 - dVar216 * dVar235);
                    auVar44._8_4_ = SUB84(dVar236,0);
                    auVar44._0_8_ = dVar236;
                    auVar44._12_4_ = (int)((ulong)dVar236 >> 0x20);
                    auVar207 = divpd(auVar206,auVar44);
                    dVar236 = (dVar226 * dVar247 +
                              ((dVar211 * dVar242 + -dVar232 * dVar233) * dVar227 -
                              dVar237 * dVar235)) / dVar236;
                    iVar155 = iVar99 - uVar9;
                    lVar106 = (long)iVar155;
                    local_458 = pdVar32[lVar124 + lVar192 + lVar106];
                    uVar202 = auVar207._0_8_;
                    uVar203 = auVar207._8_8_;
                    if ((local_458 == 1.0) && (!NAN(local_458))) {
                      if ((pdVar32[lVar124 + lVar192 + (int)((iVar99 + -1) - uVar9)] == 1.0) &&
                         (!NAN(pdVar32[lVar124 + lVar192 + (int)((iVar99 + -1) - uVar9)]))) {
                        if ((pdVar32[lVar124 + lVar192 + (int)((iVar99 + 1) - uVar9)] == 1.0) &&
                           (!NAN(pdVar32[lVar124 + lVar192 + (int)((iVar99 + 1) - uVar9)]))) {
                          dVar243 = dVar224 - pdVar21[lVar123 + lVar181 + lVar160 + ((iVar99 + -1) -
                                                                                    iVar135)];
                          dVar247 = pdVar21[lVar123 + lVar181 + lVar160 + ((iVar99 + 1) - iVar135)]
                                    - dVar224;
                          dVar243 = dVar243 + dVar243;
                          dVar247 = dVar247 + dVar247;
                          dVar235 = (pdVar21[lVar123 + lVar181 + lVar160 + ((iVar99 + 1) - iVar135)]
                                    - pdVar21[lVar123 + lVar181 + lVar160 + ((iVar99 + -1) - iVar135
                                                                            )]) * 0.5;
                          dVar242 = ABS(dVar243);
                          uVar202 = -(ulong)(0.0 < dVar235);
                          dVar235 = ABS(dVar235);
                          dVar233 = ABS(dVar247);
                          if (dVar242 <= dVar235) {
                            dVar235 = dVar242;
                          }
                          if (dVar235 <= dVar233) {
                            dVar233 = dVar235;
                          }
                          uVar217 = -(ulong)(0.0 < dVar243 * dVar247) & (ulong)dVar233;
                          uVar202 = ~uVar202 & (uVar217 ^ 0x8000000000000000) | uVar202 & uVar217;
                        }
                      }
                      if ((((pdVar32[lVar192 + lVar127 + lVar106] == 1.0) &&
                           (!NAN(pdVar32[lVar192 + lVar127 + lVar106]))) &&
                          (pdVar32[lVar192 + lVar130 + lVar106] == 1.0)) &&
                         (!NAN(pdVar32[lVar192 + lVar130 + lVar106]))) {
                        dVar235 = dVar224 - pdVar21[lVar160 + lVar181 + lVar125 + lVar189];
                        dVar243 = pdVar21[lVar160 + lVar181 + lVar131 + lVar189] - dVar224;
                        dVar235 = dVar235 + dVar235;
                        dVar243 = dVar243 + dVar243;
                        dVar242 = (pdVar21[lVar160 + lVar181 + lVar131 + lVar189] -
                                  pdVar21[lVar160 + lVar181 + lVar125 + lVar189]) * 0.5;
                        dVar247 = ABS(dVar235);
                        uVar203 = -(ulong)(0.0 < dVar242);
                        dVar242 = ABS(dVar242);
                        dVar233 = ABS(dVar243);
                        if (dVar247 <= dVar242) {
                          dVar242 = dVar247;
                        }
                        if (dVar242 <= dVar233) {
                          dVar233 = dVar242;
                        }
                        uVar217 = -(ulong)(0.0 < dVar235 * dVar243) & (ulong)dVar233;
                        uVar203 = ~uVar203 & (uVar217 ^ 0x8000000000000000) | uVar203 & uVar217;
                      }
                      auVar207._8_8_ = uVar203;
                      auVar207._0_8_ = uVar202;
                      if (((pdVar32[lVar124 + lVar106 + lVar185] == 1.0) &&
                          (!NAN(pdVar32[lVar124 + lVar106 + lVar185]))) &&
                         ((pdVar32[lVar124 + lVar106 + lVar172] == 1.0 &&
                          (!NAN(pdVar32[lVar124 + lVar106 + lVar172]))))) {
                        dVar236 = pdVar21[lVar123 + lVar189 + (lVar141 - lVar107) * lVar22 + lVar160
                                         ] - dVar224;
                        dVar242 = (dVar224 - dVar240) + (dVar224 - dVar240);
                        dVar236 = dVar236 + dVar236;
                        dVar235 = (pdVar21[lVar123 + lVar189 + (lVar141 - lVar107) * lVar22 +
                                                               lVar160] - dVar240) * 0.5;
                        dVar243 = ABS(dVar242);
                        uVar202 = -(ulong)(0.0 < dVar235);
                        dVar235 = ABS(dVar235);
                        dVar233 = ABS(dVar236);
                        if (dVar243 <= dVar235) {
                          dVar235 = dVar243;
                        }
                        if (dVar235 <= dVar233) {
                          dVar233 = dVar235;
                        }
                        uVar203 = -(ulong)(0.0 < dVar242 * dVar236) & (ulong)dVar233;
                        dVar236 = (double)(~uVar202 & (uVar203 ^ 0x8000000000000000) |
                                          uVar202 & uVar203);
                      }
                    }
                    dVar242 = dVar240;
                    if (dVar224 <= dVar240) {
                      dVar242 = dVar224;
                    }
                    iVar139 = 0;
                    iVar167 = 0;
                    iVar119 = 0;
                    iVar100 = 0;
                    iVar183 = -1;
                    while (iVar183 != 2) {
                      iVar115 = iVar139;
                      iVar116 = -1;
                      while (iVar116 != 2) {
                        for (iVar174 = 5; iVar174 != 8; iVar174 = iVar174 + 1) {
                          if (((uVar18 >> (iVar115 + iVar174 & 0x1fU) & 1) != 0) &&
                             ((iVar174 != 6 || iVar116 != 0) || iVar183 != 0)) {
                            iVar100 = iVar100 + (uint)((iVar174 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar116 == 0 && iVar183 == 0));
                            iVar119 = iVar119 + (uint)((iVar174 == 6 && iVar183 == 0) &&
                                                      (iVar116 == 1 || iVar116 + 1 == 0));
                            iVar167 = iVar167 + (uint)((iVar174 == 6 && iVar116 == 0) &&
                                                      (iVar183 == 1 || iVar183 + 1 == 0));
                          }
                        }
                        iVar115 = iVar115 + 3;
                        iVar116 = iVar116 + 1;
                      }
                      iVar139 = iVar139 + 9;
                      iVar183 = iVar183 + 1;
                    }
                    dVar235 = auVar207._0_8_;
                    dVar243 = auVar207._8_8_;
                    dVar233 = 2.0;
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      cVar195 = '\b';
                      dVar247 = dVar224;
                      dVar233 = dVar224;
                      for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                        cVar166 = cVar195;
                        for (lVar175 = 0; lVar175 != 2; lVar175 = lVar175 + 1) {
                          for (lVar198 = 0; lVar198 != 3; lVar198 = lVar198 + 1) {
                            dVar227 = dVar247;
                            if (((int)lVar198 != 1 || ((int)lVar175 != 0 || (int)lVar108 != 0)) &&
                               ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                          (iVar138 + (int)lVar175) * lVar184 +
                                                          (long)(iVar17 + (int)lVar198)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar233) {
                                dVar232 = dVar233;
                              }
                              dVar233 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar40 + lVar142 + lVar132 + (iVar99 - iVar188))[lVar29] -
                                 dVar212) * dVar236 +
                                (0.5 - dVar238) * dVar243 +
                                (pdVar40[lVar142 + lVar132 + (iVar99 - iVar188)] - dVar239) *
                                dVar235 + dVar224) - dVar224;
                      if (dVar227 <= 1e-13) {
                        dVar233 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar233 = (dVar247 - dVar224) / dVar227, 1.0 <= dVar233)) {
                          dVar233 = 1.0;
                        }
                      }
                      else {
                        dVar233 = (dVar233 - dVar224) / dVar227;
                        if (1.0 <= dVar233) {
                          dVar233 = 1.0;
                        }
                      }
                      if (2.0 <= dVar233) {
                        dVar233 = 2.0;
                      }
                    }
                    dVar247 = dVar233;
                    if ((short)uVar18 < 0) {
                      cVar195 = '\x05';
                      dVar247 = dVar224;
                      dVar227 = dVar224;
                      for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                        cVar166 = cVar195;
                        for (lVar175 = -1; lVar175 != 1; lVar175 = lVar175 + 1) {
                          for (lVar198 = 0; lVar198 != 3; lVar198 = lVar198 + 1) {
                            dVar232 = dVar227;
                            if (((int)lVar198 != 1 || ((int)lVar175 != 0 || (int)lVar108 != 0)) &&
                               ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                          (iVar138 + (int)lVar175) * lVar184 +
                                                          (long)(iVar17 + (int)lVar198)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar247) {
                                dVar211 = dVar247;
                              }
                              dVar247 = dVar211;
                              if (dVar227 <= dVar232) {
                                dVar232 = dVar227;
                              }
                            }
                            dVar227 = dVar232;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar232 = (((pdVar40 + lVar142 + lVar143 + (iVar99 - iVar188))[lVar29] -
                                 dVar212) * dVar236 +
                                -(dVar238 + 0.5) * dVar243 +
                                (pdVar40[lVar142 + lVar143 + (iVar99 - iVar188)] - dVar239) *
                                dVar235 + dVar224) - dVar224;
                      if (dVar232 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar232 < -1e-13) &&
                           (dVar247 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar232;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar233 <= dVar247) {
                        dVar247 = dVar233;
                      }
                    }
                    dVar233 = dVar247;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      cVar195 = '\x06';
                      dVar227 = dVar224;
                      dVar233 = dVar224;
                      for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                        cVar166 = cVar195;
                        for (lVar175 = -1; lVar175 != 2; lVar175 = lVar175 + 1) {
                          for (lVar198 = 0; lVar198 != 2; lVar198 = lVar198 + 1) {
                            dVar232 = dVar227;
                            if ((((int)lVar175 != 0 || (int)lVar108 != 0) || (int)lVar198 != 0) &&
                               ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                          (iVar138 + (int)lVar175) * lVar184 +
                                                          (long)(iVar153 + (int)lVar198)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar233) {
                                dVar211 = dVar233;
                              }
                              dVar233 = dVar211;
                              if (dVar227 <= dVar232) {
                                dVar232 = dVar227;
                              }
                            }
                            dVar227 = dVar232;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar232 = (((pdVar26 + lVar161 + lVar144 + ((iVar99 - iVar182) + 1))[lVar199]
                                 - dVar212) * dVar236 +
                                (pdVar26[lVar161 + lVar144 + ((iVar99 - iVar182) + 1)] - dVar238) *
                                dVar243 + (0.5 - dVar239) * dVar235 + dVar224) - dVar224;
                      if (dVar232 <= 1e-13) {
                        dVar233 = 1.0;
                        if ((dVar232 < -1e-13) &&
                           (dVar233 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar233)) {
                          dVar233 = 1.0;
                        }
                      }
                      else {
                        dVar233 = (dVar233 - dVar224) / dVar232;
                        if (1.0 <= dVar233) {
                          dVar233 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar233) {
                        dVar233 = dVar247;
                      }
                    }
                    dVar247 = dVar233;
                    if ((uVar18 >> 0x11 & 1) != 0) {
                      cVar195 = '\x05';
                      dVar227 = dVar224;
                      dVar247 = dVar224;
                      for (lVar108 = -1; lVar108 != 2; lVar108 = lVar108 + 1) {
                        cVar166 = cVar195;
                        for (lVar175 = -1; lVar175 != 2; lVar175 = lVar175 + 1) {
                          for (lVar198 = 0; lVar198 != 2; lVar198 = lVar198 + 1) {
                            dVar232 = dVar227;
                            if (((int)lVar198 != 1 || ((int)lVar175 != 0 || (int)lVar108 != 0)) &&
                               ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                          (iVar138 + (int)lVar175) * lVar184 +
                                                          (long)(iVar17 + (int)lVar198)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar247) {
                                dVar211 = dVar247;
                              }
                              dVar247 = dVar211;
                              if (dVar227 <= dVar232) {
                                dVar232 = dVar227;
                              }
                            }
                            dVar227 = dVar232;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar232 = (((pdVar26 + lVar161 + lVar144 + (iVar99 - iVar182))[lVar199] -
                                 dVar212) * dVar236 +
                                (pdVar26[lVar161 + lVar144 + (iVar99 - iVar182)] - dVar238) *
                                dVar243 + (dVar224 - (dVar239 + 0.5) * dVar235)) - dVar224;
                      if (dVar232 <= 1e-13) {
                        dVar247 = 1.0;
                        if ((dVar232 < -1e-13) &&
                           (dVar247 = (dVar227 - dVar224) / dVar232, 1.0 <= dVar247)) {
                          dVar247 = 1.0;
                        }
                      }
                      else {
                        dVar247 = (dVar247 - dVar224) / dVar232;
                        if (1.0 <= dVar247) {
                          dVar247 = 1.0;
                        }
                      }
                      if (dVar233 <= dVar247) {
                        dVar247 = dVar233;
                      }
                    }
                    dVar233 = dVar247;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      cVar195 = '\x0e';
                      dVar227 = dVar224;
                      dVar233 = dVar224;
                      for (lVar108 = 0; lVar108 != 2; lVar108 = lVar108 + 1) {
                        cVar166 = cVar195;
                        for (lVar175 = -1; lVar175 != 2; lVar175 = lVar175 + 1) {
                          for (lVar198 = 0; lVar198 != 3; lVar198 = lVar198 + 1) {
                            dVar232 = dVar227;
                            if (((int)lVar198 != 1 || ((int)lVar175 != 0 || (int)lVar108 != 0)) &&
                               ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                              dVar232 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                          (iVar138 + (int)lVar175) * lVar184 +
                                                          (long)(iVar17 + (int)lVar198)];
                              dVar211 = dVar232;
                              if (dVar232 <= dVar233) {
                                dVar211 = dVar233;
                              }
                              dVar233 = dVar211;
                              if (dVar227 <= dVar232) {
                                dVar232 = dVar227;
                              }
                            }
                            dVar227 = dVar232;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar239 = ((0.5 - dVar212) * dVar236 +
                                ((pdVar27 + lVar121 + lVar193 + ((iVar117 - iVar6) + 1) * lVar31)
                                 [lVar33] - dVar238) * dVar243 +
                                (pdVar27[lVar121 + lVar193 + ((iVar117 - iVar6) + 1) * lVar31] -
                                dVar239) * dVar235 + dVar224) - dVar224;
                      if (dVar239 <= 1e-13) {
                        dVar233 = 1.0;
                        if ((dVar239 < -1e-13) &&
                           (dVar233 = (dVar227 - dVar224) / dVar239, 1.0 <= dVar233)) {
                          dVar233 = 1.0;
                        }
                      }
                      else {
                        dVar233 = (dVar233 - dVar224) / dVar239;
                        if (1.0 <= dVar233) {
                          dVar233 = 1.0;
                        }
                      }
                      if (dVar247 <= dVar233) {
                        dVar233 = dVar247;
                      }
                    }
                    cVar195 = '\x05';
                    dVar239 = dVar224;
                    dVar238 = dVar224;
                    for (lVar108 = -1; lVar108 != 1; lVar108 = lVar108 + 1) {
                      cVar166 = cVar195;
                      for (lVar175 = -1; lVar175 != 2; lVar175 = lVar175 + 1) {
                        for (lVar198 = 0; lVar198 != 3; lVar198 = lVar198 + 1) {
                          dVar247 = dVar239;
                          if (((int)lVar198 != 1 || ((int)lVar175 != 0 || (int)lVar108 != 0)) &&
                             ((1 << (cVar166 + (char)lVar198 & 0x1fU) & uVar18) != 0)) {
                            dVar247 = pdVar21[lVar160 + (iVar101 + (int)lVar108) * lVar22 +
                                                        (iVar138 + (int)lVar175) * lVar184 +
                                                        (long)(iVar17 + (int)lVar198)];
                            dVar227 = dVar247;
                            if (dVar247 <= dVar238) {
                              dVar227 = dVar238;
                            }
                            dVar238 = dVar227;
                            if (dVar239 <= dVar247) {
                              dVar247 = dVar239;
                            }
                          }
                          dVar239 = dVar247;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar247 = ((dVar209 * dVar243 + dVar235 * dVar225 + dVar224) -
                              (dVar212 + 0.5) * dVar236) - dVar224;
                    if (dVar247 <= 1e-13) {
                      dVar238 = 1.0;
                      if ((dVar247 < -1e-13) &&
                         (dVar238 = (dVar239 - dVar224) / dVar247, 1.0 <= dVar238)) {
                        dVar238 = 1.0;
                      }
                    }
                    else {
                      dVar238 = (dVar238 - dVar224) / dVar247;
                      if (1.0 <= dVar238) {
                        dVar238 = 1.0;
                      }
                    }
                    if (dVar233 <= dVar238) {
                      dVar238 = dVar233;
                    }
                    uVar218 = 0;
                    uVar220 = 0;
                    if (1 < iVar100) {
                      uVar218 = SUB84(dVar238,0);
                      uVar220 = (undefined4)((ulong)dVar238 >> 0x20);
                    }
                    dVar239 = 0.0;
                    if (1 < iVar119) {
                      dVar239 = dVar238;
                    }
                    dVar233 = 0.0;
                    if (1 < iVar167) {
                      dVar233 = dVar238;
                    }
                    if ((local_458 == 1.0) && (!NAN(local_458))) {
                      if ((pdVar32[lVar124 + lVar192 + (int)(~uVar9 + iVar99)] == 1.0) &&
                         (((!NAN(pdVar32[lVar124 + lVar192 + (int)(~uVar9 + iVar99)]) &&
                           (pdVar32[lVar124 + lVar192 + (iVar155 + 1)] == 1.0)) &&
                          (!NAN(pdVar32[lVar124 + lVar192 + (iVar155 + 1)]))))) {
                        uVar218 = 0;
                        uVar220 = 0x3ff00000;
                      }
                      if (((pdVar32[lVar192 + lVar145 + lVar106] == 1.0) &&
                          (!NAN(pdVar32[lVar192 + lVar145 + lVar106]))) &&
                         ((pdVar32[lVar192 + lVar129 + lVar106] == 1.0 &&
                          (!NAN(pdVar32[lVar192 + lVar129 + lVar106]))))) {
                        dVar239 = 1.0;
                      }
                      if (((pdVar32[lVar124 + lVar185 + lVar106] == 1.0) &&
                          (!NAN(pdVar32[lVar124 + lVar185 + lVar106]))) &&
                         ((pdVar32[lVar124 + lVar173 + lVar106] == 1.0 &&
                          (!NAN(pdVar32[lVar124 + lVar173 + lVar106]))))) {
                        dVar233 = 1.0;
                      }
                    }
                    dVar239 = (dVar209 * dVar243 * dVar239 +
                              dVar225 * (double)CONCAT44(uVar220,uVar218) * dVar235 + dVar224) -
                              (dVar212 + 0.5) * dVar236 * dVar233;
                    pEVar214 = local_438;
                    if (dVar239 <= (double)local_438) {
                      pEVar214 = (EBCellFlag *)dVar239;
                    }
                    dVar239 = pdVar24[lVar122 + lVar178 + lVar176];
                    dVar238 = pdVar24[lVar122 + lVar178 + lVar176 + lVar19];
                    dVar212 = pdVar24[lVar122 + lVar178 + lVar176 + lVar19 * 2];
                    uVar18 = pEVar41[lVar103 + lVar110 + (lVar150 - lVar148) * lVar35].flag;
                    iVar167 = 0;
                    cVar195 = '\x05';
                    for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                      lVar108 = lVar162;
                      lVar175 = local_9e0;
                      lVar198 = lVar105;
                      iVar183 = iVar167;
                      cVar166 = cVar195;
                      for (lVar178 = -1; iVar183 = iVar183 + 3, lVar178 != 2; lVar178 = lVar178 + 1)
                      {
                        lVar111 = (long)iVar167;
                        paRVar163 = A + lVar111;
                        iVar167 = iVar167 + 3;
                        for (lVar190 = 0; iVar183 - lVar111 != lVar190; lVar190 = lVar190 + 1) {
                          iVar139 = (int)lVar190 + -1;
                          if ((((int)lVar178 == 0 && (int)lVar110 == 0) && iVar139 == 0) ||
                             ((1 << (cVar166 + (char)lVar190 & 0x1fU) & uVar18) == 0)) {
                            (*paRVar163)[0] = 0.0;
                            (*paRVar163)[1] = 0.0;
                            (*paRVar163)[2] = 0.0;
                          }
                          else {
                            dVar224 = *(double *)(lVar108 + lVar190 * 8);
                            (*paRVar163)[0] =
                                 (*(double *)(lVar175 + lVar190 * 8) + (double)iVar139) - dVar239;
                            (*paRVar163)[1] = (dVar224 + (double)(int)lVar178) - dVar238;
                            (*paRVar163)[2] =
                                 (*(double *)(lVar198 + lVar190 * 8) + (double)(int)lVar110) -
                                 dVar212;
                          }
                          paRVar163 = paRVar163 + 1;
                        }
                        lVar175 = lVar175 + lVar23 * 8;
                        lVar108 = lVar108 + lVar23 * 8;
                        lVar198 = lVar198 + lVar23 * 8;
                        cVar166 = cVar166 + '\x03';
                      }
                      local_9e0 = local_9e0 + lVar20 * 8;
                      lVar162 = lVar162 + lVar20 * 8;
                      lVar105 = lVar105 + lVar20 * 8;
                      cVar195 = cVar195 + '\t';
                    }
                    iVar167 = 0;
                    cVar195 = '\x05';
                    for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                      iVar183 = iVar167;
                      cVar166 = cVar195;
                      for (lVar162 = -1; iVar183 = iVar183 + 3, lVar162 != 2; lVar162 = lVar162 + 1)
                      {
                        lVar105 = (long)iVar167;
                        iVar167 = iVar167 + 3;
                        for (lVar178 = 0; iVar183 - lVar105 != lVar178; lVar178 = lVar178 + 1) {
                          RVar210 = 0.0;
                          if (((int)lVar178 != 1 || ((int)lVar162 != 0 || (int)lVar110 != 0)) &&
                             ((1 << (cVar166 + (char)lVar178 & 0x1fU) & uVar18) != 0)) {
                            RVar210 = pdVar21[lVar160 + (int)(((int)lVar150 - uVar5) + (int)lVar110)
                                                        * lVar22 +
                                                        (iVar138 + (int)lVar162) * lVar184 +
                                                        (long)(iVar17 + (int)lVar178)] - dVar240;
                          }
                          du[lVar105 + lVar178] = RVar210;
                        }
                        cVar166 = cVar166 + '\x03';
                      }
                      cVar195 = cVar195 + '\t';
                    }
                    dVar224 = dVar242;
                    if (dVar242 <= (double)pEVar214) {
                      dVar224 = (double)pEVar214;
                    }
                    pdVar112 = &local_4a8;
                    for (lVar110 = 0; lVar162 = -0x48, lVar110 != 3; lVar110 = lVar110 + 1) {
                      for (; lVar162 != 0; lVar162 = lVar162 + 0x18) {
                        *(undefined8 *)((long)pdVar112 + lVar162 + 0x48) = 0;
                      }
                      local_668[lVar110] = 0.0;
                      pdVar112 = pdVar112 + 1;
                    }
                    pRVar113 = A[0] + 2;
                    dVar240 = local_488;
                    dVar209 = dStack_480;
                    dVar225 = local_4a8;
                    dVar236 = local_668[0];
                    dVar233 = dStack_498;
                    dVar235 = local_4a0;
                    dVar243 = local_668[1];
                    dVar247 = local_668[2];
                    dVar227 = local_468;
                    for (lVar110 = 0; lVar110 != 0x1b; lVar110 = lVar110 + 1) {
                      dVar216 = (*(Real (*) [3])(pRVar113 + -2))[0];
                      dVar226 = pRVar113[-1];
                      dVar232 = du[lVar110];
                      dVar225 = dVar225 + dVar216 * dVar216;
                      dVar240 = dVar240 + dVar226 * pRVar113[-1];
                      dVar209 = dVar209 + dVar226 * *pRVar113;
                      dVar211 = *pRVar113;
                      dVar236 = dVar236 + dVar216 * dVar232;
                      dVar233 = dVar233 + dVar216 * dVar211;
                      dVar235 = dVar235 + dVar226 * dVar216;
                      dVar243 = dVar243 + dVar232 * dVar226;
                      dVar247 = dVar247 + dVar211 * dVar232;
                      dVar227 = dVar227 + dVar211 * dVar211;
                      pRVar113 = pRVar113 + 3;
                    }
                    dVar211 = dVar227 * dVar235 + -dVar209 * dVar233;
                    dVar226 = dVar240 * dVar227 - dVar209 * dVar209;
                    dVar216 = dVar235 * dVar209 - dVar240 * dVar233;
                    dVar232 = dVar235 * dVar247 - dVar233 * dVar243;
                    dVar227 = dVar227 * dVar243 - dVar247 * dVar209;
                    auVar249._0_8_ =
                         dVar236 * dVar216 +
                         (dVar225 * (dVar240 * dVar247 - dVar209 * dVar243) - dVar235 * dVar232);
                    auVar249._8_8_ =
                         dVar233 * (dVar243 * dVar209 - dVar240 * dVar247) +
                         (dVar236 * dVar226 - dVar235 * dVar227);
                    dVar209 = dVar216 * dVar233 + (dVar226 * dVar225 - dVar211 * dVar235);
                    auVar208._8_8_ = dVar209;
                    auVar208._0_8_ = dVar209;
                    dVar209 = (dVar232 * dVar233 + (dVar227 * dVar225 - dVar211 * dVar236)) /
                              dVar209;
                    auVar250 = divpd(auVar249,auVar208);
                    dVar240 = pdVar32[lVar124 + lVar185 + lVar106];
                    if ((dVar240 == 1.0) && (!NAN(dVar240))) {
                      uVar202 = auVar250._8_8_;
                      if ((pdVar32[lVar124 + lVar185 + (int)((iVar99 + -1) - uVar9)] == 1.0) &&
                         (!NAN(pdVar32[lVar124 + lVar185 + (int)((iVar99 + -1) - uVar9)]))) {
                        if ((pdVar32[lVar124 + lVar185 + (int)((iVar99 + 1) - uVar9)] == 1.0) &&
                           (!NAN(pdVar32[lVar124 + lVar185 + (int)((iVar99 + 1) - uVar9)]))) {
                          dVar225 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160] -
                                    pdVar21[lVar123 + lVar171 + lVar160 + ((iVar99 + -1) - iVar135)]
                          ;
                          dVar236 = pdVar21[lVar123 + lVar171 + lVar160 + ((iVar99 + 1) - iVar135)]
                                    - pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                          dVar225 = dVar225 + dVar225;
                          dVar236 = dVar236 + dVar236;
                          dVar235 = (pdVar21[lVar123 + lVar171 + lVar160 + ((iVar99 + 1) - iVar135)]
                                    - pdVar21[lVar123 + lVar171 + lVar160 + ((iVar99 + -1) - iVar135
                                                                            )]) * 0.5;
                          dVar243 = ABS(dVar225);
                          uVar202 = -(ulong)(0.0 < dVar235);
                          dVar235 = ABS(dVar235);
                          dVar233 = ABS(dVar236);
                          if (dVar243 <= dVar235) {
                            dVar235 = dVar243;
                          }
                          if (dVar235 <= dVar233) {
                            dVar233 = dVar235;
                          }
                          uVar203 = -(ulong)(0.0 < dVar225 * dVar236) & (ulong)dVar233;
                          uVar202 = ~uVar202 & (uVar203 ^ 0x8000000000000000) | uVar202 & uVar203;
                        }
                      }
                      if ((((pdVar32[lVar185 + lVar127 + lVar106] == 1.0) &&
                           (!NAN(pdVar32[lVar185 + lVar127 + lVar106]))) &&
                          (pdVar32[lVar185 + lVar130 + lVar106] == 1.0)) &&
                         (!NAN(pdVar32[lVar185 + lVar130 + lVar106]))) {
                        dVar209 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160] -
                                  pdVar21[lVar160 + lVar171 + lVar125 + lVar189];
                        dVar225 = pdVar21[lVar160 + lVar171 + lVar131 + lVar189] -
                                  pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                        dVar209 = dVar209 + dVar209;
                        dVar225 = dVar225 + dVar225;
                        dVar233 = (pdVar21[lVar160 + lVar171 + lVar131 + lVar189] -
                                  pdVar21[lVar160 + lVar171 + lVar125 + lVar189]) * 0.5;
                        dVar235 = ABS(dVar209);
                        uVar203 = -(ulong)(0.0 < dVar233);
                        dVar233 = ABS(dVar233);
                        dVar236 = ABS(dVar225);
                        if (dVar235 <= dVar233) {
                          dVar233 = dVar235;
                        }
                        if (dVar233 <= dVar236) {
                          dVar236 = dVar233;
                        }
                        uVar217 = -(ulong)(0.0 < dVar209 * dVar225) & (ulong)dVar236;
                        dVar209 = (double)(~uVar203 & (uVar217 ^ 0x8000000000000000) |
                                          uVar203 & uVar217);
                      }
                      auVar250._8_8_ = uVar202;
                      if (((pdVar32[lVar124 + lVar168 + lVar106] == 1.0) &&
                          (!NAN(pdVar32[lVar124 + lVar168 + lVar106]))) &&
                         ((local_458 == 1.0 && (!NAN(local_458))))) {
                        dVar225 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160] -
                                  pdVar21[lVar123 + lVar189 + ((lVar140 + -2) - lVar107) * lVar22 +
                                                              lVar160];
                        dVar236 = pdVar21[lVar123 + lVar189 + lVar181 + lVar160] -
                                  pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                        dVar225 = dVar225 + dVar225;
                        dVar236 = dVar236 + dVar236;
                        dVar235 = (pdVar21[lVar123 + lVar189 + lVar181 + lVar160] -
                                  pdVar21[lVar123 + lVar189 + ((lVar140 + -2) - lVar107) * lVar22 +
                                                              lVar160]) * 0.5;
                        dVar243 = ABS(dVar225);
                        uVar203 = -(ulong)(0.0 < dVar235);
                        dVar235 = ABS(dVar235);
                        dVar233 = ABS(dVar236);
                        if (dVar243 <= dVar235) {
                          dVar235 = dVar243;
                        }
                        if (dVar235 <= dVar233) {
                          dVar233 = dVar235;
                        }
                        uVar217 = -(ulong)(0.0 < dVar225 * dVar236) & (ulong)dVar233;
                        auVar250._0_8_ =
                             ~uVar203 & (uVar217 ^ 0x8000000000000000) | uVar203 & uVar217;
                      }
                    }
                    iVar100 = 0;
                    iVar167 = 0;
                    iVar139 = 0;
                    iVar119 = 0;
                    iVar183 = -1;
                    while (iVar183 != 2) {
                      iVar115 = iVar100;
                      iVar116 = -1;
                      while (iVar116 != 2) {
                        for (iVar174 = 5; iVar174 != 8; iVar174 = iVar174 + 1) {
                          if (((uVar18 >> (iVar115 + iVar174 & 0x1fU) & 1) != 0) &&
                             ((iVar174 != 6 || iVar116 != 0) || iVar183 != 0)) {
                            iVar119 = iVar119 + (uint)((iVar174 - 5U & 0xfffffffd) == 0 &&
                                                      (iVar116 == 0 && iVar183 == 0));
                            iVar139 = iVar139 + (uint)((iVar174 == 6 && iVar183 == 0) &&
                                                      (iVar116 == 1 || iVar116 + 1 == 0));
                            iVar167 = iVar167 + (uint)((iVar174 == 6 && iVar116 == 0) &&
                                                      (iVar183 == 1 || iVar183 + 1 == 0));
                          }
                        }
                        iVar115 = iVar115 + 3;
                        iVar116 = iVar116 + 1;
                      }
                      iVar100 = iVar100 + 9;
                      iVar183 = iVar183 + 1;
                    }
                    dVar236 = auVar250._0_8_;
                    dVar233 = auVar250._8_8_;
                    dVar225 = 2.0;
                    iVar183 = (int)(lVar150 - lVar107);
                    if ((uVar18 >> 0x15 & 1) != 0) {
                      dVar235 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\b';
                      uVar218 = SUB84(dVar235,0);
                      uVar220 = (undefined4)((ulong)dVar235 >> 0x20);
                      dVar243 = dVar235;
                      for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = 0; lVar162 != 2; lVar162 = lVar162 + 1) {
                          for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                            if ((((int)lVar162 == 0 && (int)lVar110 == 0) && (int)lVar105 == 0) ||
                               ((1 << (cVar166 + (char)lVar105 + 1U & 0x1f) & uVar18) == 0)) {
                              dVar247 = (double)CONCAT44(uVar220,uVar218);
                              dVar225 = dVar243;
                            }
                            else {
                              dVar225 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar247 = dVar225;
                              if (dVar225 <= (double)CONCAT44(uVar220,uVar218)) {
                                dVar247 = (double)CONCAT44(uVar220,uVar218);
                              }
                              if (dVar243 <= dVar225) {
                                dVar225 = dVar243;
                              }
                            }
                            dVar243 = dVar225;
                            uVar218 = SUB84(dVar247,0);
                            uVar220 = (undefined4)((ulong)dVar247 >> 0x20);
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar247 = (((pdVar40 + lVar177 + lVar132 + (iVar99 - iVar188))[lVar29] -
                                 dVar212) * dVar236 +
                                (0.5 - dVar238) * dVar209 +
                                (pdVar40[lVar177 + lVar132 + (iVar99 - iVar188)] - dVar239) *
                                dVar233 + dVar235) - dVar235;
                      if (dVar247 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar247 < -1e-13) &&
                           (dVar225 = (dVar243 - dVar235) / dVar247, 1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = ((double)CONCAT44(uVar220,uVar218) - dVar235) / dVar247;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (2.0 <= dVar225) {
                        dVar225 = 2.0;
                      }
                    }
                    dVar235 = dVar225;
                    if ((short)uVar18 < 0) {
                      dVar243 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = -1; lVar162 != 1; lVar162 = lVar162 + 1) {
                          for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar162 != 0 || (int)lVar110 != 0) || (int)lVar105 != 0) &&
                               ((1 << (cVar166 + (char)lVar105 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar235) {
                                dVar232 = dVar235;
                              }
                              dVar235 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar40 + lVar177 + lVar143 + (iVar99 - iVar188))[lVar29] -
                                 dVar212) * dVar236 +
                                -(dVar238 + 0.5) * dVar209 +
                                (pdVar40[lVar177 + lVar143 + (iVar99 - iVar188)] - dVar239) *
                                dVar233 + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar235) {
                        dVar235 = dVar225;
                      }
                    }
                    dVar225 = dVar235;
                    if ((uVar18 >> 0x13 & 1) != 0) {
                      dVar243 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\x06';
                      dVar247 = dVar243;
                      dVar225 = dVar243;
                      for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                          for (lVar105 = 0; lVar105 != 2; lVar105 = lVar105 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar162 != 0 || (int)lVar110 != 0) || (int)lVar105 != 0) &&
                               ((1 << (cVar166 + (char)lVar105 & 0x1fU) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar225) {
                                dVar232 = dVar225;
                              }
                              dVar225 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar26 + lVar180 + lVar144 + ((iVar99 - iVar182) + 1))[lVar199]
                                 - dVar212) * dVar236 +
                                (pdVar26[lVar180 + lVar144 + ((iVar99 - iVar182) + 1)] - dVar238) *
                                dVar209 + (0.5 - dVar239) * dVar233 + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar225 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = (dVar225 - dVar243) / dVar227;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar225) {
                        dVar225 = dVar235;
                      }
                    }
                    dVar235 = dVar225;
                    if ((uVar18 >> 0x11 & 1) != 0) {
                      dVar243 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar110 = -1; lVar110 != 2; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                          for (lVar105 = -1; lVar105 != 1; lVar105 = lVar105 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar162 != 0 || (int)lVar110 != 0) || (int)lVar105 != 0) &&
                               ((1 << (cVar166 + (char)lVar105 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar235) {
                                dVar232 = dVar235;
                              }
                              dVar235 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = (((pdVar26 + lVar180 + lVar144 + (iVar99 - iVar182))[lVar199] -
                                 dVar212) * dVar236 +
                                (pdVar26[lVar180 + lVar144 + (iVar99 - iVar182)] - dVar238) *
                                dVar209 + (dVar243 - (dVar239 + 0.5) * dVar233)) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar235) {
                        dVar235 = dVar225;
                      }
                    }
                    dVar225 = dVar235;
                    if ((uVar18 >> 0x1b & 1) != 0) {
                      dVar243 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\x0e';
                      dVar247 = dVar243;
                      dVar225 = dVar243;
                      for (lVar110 = 0; lVar110 != 2; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                          for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar162 != 0 || (int)lVar110 != 0) || (int)lVar105 != 0) &&
                               ((1 << (cVar166 + (char)lVar105 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar225) {
                                dVar232 = dVar225;
                              }
                              dVar225 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((0.5 - dVar212) * dVar236 +
                                (pdVar42[lVar33] - dVar238) * dVar209 +
                                (*pdVar42 - dVar239) * dVar233 + dVar243) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar225 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar225 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar225)) {
                          dVar225 = 1.0;
                        }
                      }
                      else {
                        dVar225 = (dVar225 - dVar243) / dVar227;
                        if (1.0 <= dVar225) {
                          dVar225 = 1.0;
                        }
                      }
                      if (dVar235 <= dVar225) {
                        dVar225 = dVar235;
                      }
                    }
                    dVar235 = dVar225;
                    if ((uVar18 >> 9 & 1) != 0) {
                      dVar243 = pdVar21[lVar123 + lVar189 + lVar171 + lVar160];
                      cVar195 = '\x05';
                      dVar247 = dVar243;
                      dVar235 = dVar243;
                      for (lVar110 = -1; lVar110 != 1; lVar110 = lVar110 + 1) {
                        cVar166 = cVar195;
                        for (lVar162 = -1; lVar162 != 2; lVar162 = lVar162 + 1) {
                          for (lVar105 = -1; lVar105 != 2; lVar105 = lVar105 + 1) {
                            dVar227 = dVar247;
                            if ((((int)lVar162 != 0 || (int)lVar110 != 0) || (int)lVar105 != 0) &&
                               ((1 << (cVar166 + (char)lVar105 + 1U & 0x1f) & uVar18) != 0)) {
                              dVar227 = pdVar21[lVar160 + (iVar183 + (int)lVar110) * lVar22 +
                                                          (iVar138 + (int)lVar162) * lVar184 +
                                                          (long)(iVar153 + (int)lVar105)];
                              dVar232 = dVar227;
                              if (dVar227 <= dVar235) {
                                dVar232 = dVar235;
                              }
                              dVar235 = dVar232;
                              if (dVar247 <= dVar227) {
                                dVar227 = dVar247;
                              }
                            }
                            dVar247 = dVar227;
                          }
                          cVar166 = cVar166 + '\x03';
                        }
                        cVar195 = cVar195 + '\t';
                      }
                      dVar227 = ((((pdVar27 + lVar121 + lVar193 + (lVar150 - iVar6) * lVar31)
                                   [lVar33] - dVar238) * dVar209 +
                                 (pdVar27[lVar121 + lVar193 + (lVar150 - iVar6) * lVar31] - dVar239)
                                 * dVar233 + dVar243) - (dVar212 + 0.5) * dVar236) - dVar243;
                      if (dVar227 <= 1e-13) {
                        dVar235 = 1.0;
                        if ((dVar227 < -1e-13) &&
                           (dVar235 = (dVar247 - dVar243) / dVar227, 1.0 <= dVar235)) {
                          dVar235 = 1.0;
                        }
                      }
                      else {
                        dVar235 = (dVar235 - dVar243) / dVar227;
                        if (1.0 <= dVar235) {
                          dVar235 = 1.0;
                        }
                      }
                      if (dVar225 <= dVar235) {
                        dVar235 = dVar225;
                      }
                    }
                    dVar225 = 0.0;
                    if (1 < iVar119) {
                      dVar225 = dVar235;
                    }
                    dVar243 = 0.0;
                    if (1 < iVar139) {
                      dVar243 = dVar235;
                    }
                    dVar247 = 0.0;
                    if (1 < iVar167) {
                      dVar247 = dVar235;
                    }
                    if ((dVar240 == 1.0) && (!NAN(dVar240))) {
                      if ((pdVar32[lVar124 + lVar185 + (int)(~uVar9 + iVar99)] == 1.0) &&
                         (((!NAN(pdVar32[lVar124 + lVar185 + (int)(~uVar9 + iVar99)]) &&
                           (pdVar32[lVar124 + lVar185 + (iVar155 + 1)] == 1.0)) &&
                          (!NAN(pdVar32[lVar124 + lVar185 + (iVar155 + 1)]))))) {
                        dVar225 = 1.0;
                      }
                      if (((pdVar32[lVar185 + lVar145 + lVar106] == 1.0) &&
                          (!NAN(pdVar32[lVar185 + lVar145 + lVar106]))) &&
                         ((pdVar32[lVar185 + lVar129 + lVar106] == 1.0 &&
                          (!NAN(pdVar32[lVar185 + lVar129 + lVar106]))))) {
                        dVar243 = 1.0;
                      }
                      if (((pdVar32[lVar124 + lVar169 + lVar106] == 1.0) &&
                          (!NAN(pdVar32[lVar124 + lVar169 + lVar106]))) &&
                         ((pdVar32[lVar124 + lVar192 + lVar106] == 1.0 &&
                          (!NAN(pdVar32[lVar124 + lVar192 + lVar106]))))) {
                        dVar247 = 1.0;
                      }
                    }
                    uVar218 = SUB84(dVar224,0);
                    uVar220 = (undefined4)((ulong)dVar224 >> 0x20);
                    dVar222 = (0.5 - dVar212) * dVar236 * dVar247 +
                              (dVar222 - dVar239) * dVar233 * dVar225 +
                              pdVar21[lVar123 + lVar189 + lVar171 + lVar160] +
                              (dVar248 - dVar238) * dVar209 * dVar243;
                    if (dVar222 <= (double)local_438) {
                      local_438 = (EBCellFlag *)dVar222;
                    }
                    if (dVar242 <= (double)local_438) {
                      dVar242 = (double)local_438;
                    }
                    iVar155 = d_bcrec_ptr[uVar134].bc[5];
                    if (lVar140 == iVar16) {
                      switch(d_bcrec_ptr[uVar134].bc[2]) {
                      case 0:
                        break;
                      case 1:
switchD_003708ac_caseD_1:
                        dVar242 = dVar224;
                        break;
                      case 2:
                      case 4:
                        if ((uVar134 != 2 || !is_velocity) ||
                            *(double *)
                             ((long)pEVar213 + (lVar170 + lVar126 + (iVar99 - iVar11)) * 8) < 0.0)
                        goto switchD_003708ac_caseD_1;
                        dVar242 = 0.0;
                        if (dVar224 <= 0.0) {
                          dVar242 = dVar224;
                        }
LAB_00370962:
                        uVar218 = SUB84(dVar242,0);
                        uVar220 = (undefined4)((ulong)dVar242 >> 0x20);
                        break;
                      case 3:
                        dVar242 = pdVar21[lVar123 + lVar189 + (iVar158 + iVar117) * lVar22 + lVar160
                                         ];
                        if (bVar200) goto LAB_00370962;
                        break;
                      case -1:
                        uVar218 = 0;
                        uVar220 = 0;
                        dVar242 = 0.0;
                        break;
                      default:
                        goto switchD_003708ac_default;
                      }
switchD_003708ac_default:
                      if (lVar140 == lVar149) {
LAB_0037097d:
                        if ((iVar155 == 4) || (iVar155 == 2)) {
                          uVar218 = SUB84(dVar242,0);
                          uVar220 = (undefined4)((ulong)dVar242 >> 0x20);
                          if ((uVar134 == 2 && is_velocity) &&
                              *(double *)
                               ((long)pEVar213 + (lVar170 + lVar126 + (iVar99 - iVar11)) * 8) <= 0.0
                             ) {
                            uVar219 = 0;
                            uVar221 = 0;
                            if (0.0 <= dVar242) {
                              uVar219 = uVar218;
                              uVar221 = uVar220;
                            }
                            uVar220 = uVar221;
                            uVar218 = uVar219;
                            dVar242 = (double)CONCAT44(uVar220,uVar218);
                          }
                        }
                      }
                    }
                    else {
                      if (lVar140 != lVar149) goto LAB_003709df;
                      switch(iVar155) {
                      case 1:
                      case 2:
                      case 4:
                        uVar218 = SUB84(dVar242,0);
                        uVar220 = (undefined4)((ulong)dVar242 >> 0x20);
                      default:
                        goto LAB_0037097d;
                      case 3:
                        dVar222 = pdVar21[lVar123 + lVar189 + lVar181 + lVar160];
                        uVar218 = SUB84(dVar222,0);
                        uVar220 = (undefined4)((ulong)dVar222 >> 0x20);
                        if (bVar200) {
                          dVar242 = dVar222;
                        }
                        break;
                      case -1:
                        uVar218 = 0;
                        uVar220 = 0;
                        dVar242 = 0.0;
                      }
                    }
LAB_003709df:
                    dVar222 = dVar242;
                    if ((*(double *)((long)pEVar213 + (lVar170 + lVar126 + (iVar99 - iVar11)) * 8)
                         <= 1e-08) &&
                       (dVar222 = (double)CONCAT44(uVar220,uVar218),
                       -1e-08 <= *(double *)
                                  ((long)pEVar213 + (lVar170 + lVar126 + (iVar99 - iVar11)) * 8))) {
                      dVar222 = ((double)CONCAT44(uVar220,uVar218) + dVar242) * 0.5;
                    }
                  }
                  local_3b8[lVar104 - iVar13] = dVar222;
                  iVar118 = iVar118 + 1;
                  iVar17 = iVar17 + 1;
                  iVar153 = iVar153 + 1;
                  bVar201 = iVar99 != iVar4;
                  lVar110 = lVar194;
                  iVar99 = iVar99 + 1;
                } while (bVar201);
              }
            }
            local_840 = local_840 + lVar20;
            local_838 = local_838 + lVar20;
            local_830 = local_830 + lVar20;
            lVar140 = lVar141;
          }
          uVar134 = uVar134 + 1;
        } while( true );
      }
    }
  }
  A[0][0] = (Real)d_bcrec_ptr;
  A[0][1] = (Real)q->p;
  A[0][2] = (Real)q->jstride;
  A[1][0] = (Real)q->kstride;
  A[1][1] = (Real)q->nstride;
  A[1][2] = *(Real *)&q->begin;
  uVar45 = *(undefined8 *)&(q->begin).z;
  uVar46 = (q->end).y;
  A[2]._12_8_ = *(undefined8 *)&(q->end).z;
  A[2][0]._0_4_ = (undefined4)uVar45;
  A[2][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[3][0] = (Real)ccc->p;
  A[3][1] = (Real)ccc->jstride;
  A[3][2] = (Real)ccc->kstride;
  A[4][0] = (Real)ccc->nstride;
  A[4][1] = *(Real *)&ccc->begin;
  uVar45 = *(undefined8 *)&(ccc->begin).z;
  uVar47 = (ccc->end).y;
  A[5]._4_8_ = *(undefined8 *)&(ccc->end).z;
  A[4][2]._0_4_ = (undefined4)uVar45;
  A[4][2]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[5][2] = (Real)fcx->p;
  A[6][0] = (Real)fcx->jstride;
  A[6][1] = (Real)fcx->kstride;
  A[6][2] = (Real)fcx->nstride;
  A[7][0] = *(Real *)&fcx->begin;
  uVar48 = (fcx->end).x;
  uVar49 = (fcx->end).y;
  A._188_8_ = *(undefined8 *)&(fcx->end).z;
  A[7][1]._0_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  A[8][1] = (Real)fcy->p;
  A[8][2] = (Real)fcy->jstride;
  A[9][0] = (Real)fcy->kstride;
  A[9][1] = (Real)fcy->nstride;
  A[9][2] = *(Real *)&fcy->begin;
  uVar50 = (fcy->end).x;
  uVar51 = (fcy->end).y;
  A[10]._12_8_ = *(undefined8 *)&(fcy->end).z;
  A[10][0]._0_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  A[0xb][0] = (Real)fcz->p;
  A[0xb][1] = (Real)fcz->jstride;
  A[0xb][2] = (Real)fcz->kstride;
  A[0xc][0] = (Real)fcz->nstride;
  A[0xc][1] = *(Real *)&fcz->begin;
  uVar52 = (fcz->end).x;
  uVar53 = (fcz->end).y;
  A[0xd]._4_8_ = *(undefined8 *)&(fcz->end).z;
  A[0xc][2]._0_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  A[0xd][2] = (Real)flag->p;
  A[0xe][0] = (Real)flag->jstride;
  A[0xe][1] = (Real)flag->kstride;
  A[0xe][2] = (Real)flag->nstride;
  A[0xf][0] = *(Real *)&flag->begin;
  uVar54 = (flag->end).x;
  uVar55 = (flag->end).y;
  A._380_8_ = *(undefined8 *)&(flag->end).z;
  A[0xf][1]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  A[0x10][1] = (Real)umac->p;
  A[0x10][2] = (Real)umac->jstride;
  A[0x11][0] = (Real)umac->kstride;
  A[0x11][1] = (Real)umac->nstride;
  A[0x11][2] = *(Real *)&umac->begin;
  uVar45 = *(undefined8 *)&(umac->begin).z;
  uVar56 = (umac->end).y;
  A[0x12]._12_8_ = *(undefined8 *)&(umac->end).z;
  A[0x12][0]._0_4_ = (undefined4)uVar45;
  A[0x12][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x13][0] = (Real)xedge->p;
  A[0x13][1] = (Real)xedge->jstride;
  A[0x13][2] = (Real)xedge->kstride;
  A[0x14][0] = (Real)xedge->nstride;
  A[0x14][1] = *(Real *)&xedge->begin;
  uVar57 = (xedge->end).x;
  uVar58 = (xedge->end).y;
  A[0x15]._4_8_ = *(undefined8 *)&(xedge->end).z;
  A[0x14][2]._0_4_ = (undefined4)*(undefined8 *)&(xedge->begin).z;
  A[0x15][2] = *(Real *)(domain->smallend).vect;
  uVar45 = *(undefined8 *)(domain->bigend).vect;
  A[0x16]._12_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  A[0x16][0]._0_4_ = (undefined4)*(undefined8 *)((domain->smallend).vect + 2);
  A[0x16][0]._4_4_ = (undefined4)uVar45;
  A[0x16][1]._0_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x17][0] = (Real)vfrac->p;
  A[0x17][1] = (Real)vfrac->jstride;
  A[0x17][2] = (Real)vfrac->kstride;
  A[0x18][0] = (Real)vfrac->nstride;
  A[0x18][1] = *(Real *)&vfrac->begin;
  uVar59 = (vfrac->end).x;
  uVar60 = (vfrac->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x18][2]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
  A[0x19][2]._0_4_ = 2;
  A[0x19][2]._4_1_ = is_velocity;
  if (ncomp < 1) {
    ncomp = 0;
  }
  A[2][1]._0_4_ = uVar46;
  A[5][0]._0_4_ = uVar47;
  A[7][1]._4_4_ = uVar48;
  A[7][2]._0_4_ = uVar49;
  A[10][0]._4_4_ = uVar50;
  A[10][1]._0_4_ = uVar51;
  A[0xc][2]._4_4_ = uVar52;
  A[0xd][0]._0_4_ = uVar53;
  A[0xf][1]._4_4_ = uVar54;
  A[0xf][2]._0_4_ = uVar55;
  A[0x12][1]._0_4_ = uVar56;
  A[0x14][2]._4_4_ = uVar57;
  A[0x15][0]._0_4_ = uVar58;
  A[0x18][2]._4_4_ = uVar59;
  A[0x19][0]._0_4_ = uVar60;
  for (; iVar154 = iVar3, iVar191 != ncomp; iVar191 = iVar191 + 1) {
    for (; iVar182 = iVar2, iVar154 <= iVar196; iVar154 = iVar154 + 1) {
      for (; iVar182 <= (int)local_4b0; iVar182 = iVar182 + 1) {
        iVar152 = iVar1;
        if (iVar1 <= iVar114) {
          do {
            ComputeEdgeState::anon_class_624_13_64a6b87d::operator()
                      ((anon_class_624_13_64a6b87d *)A,iVar152,iVar182,iVar154,iVar191);
            iVar152 = iVar152 + 1;
          } while (iVar4 + (~uVar5 & 1) + 1 != iVar152);
        }
      }
    }
  }
  A[0][0] = (Real)d_bcrec_ptr;
  A[0][1] = (Real)q->p;
  A[0][2] = (Real)q->jstride;
  A[1][0] = (Real)q->kstride;
  A[1][1] = (Real)q->nstride;
  A[1][2] = *(Real *)&q->begin;
  uVar45 = *(undefined8 *)&(q->begin).z;
  uVar61 = (q->end).y;
  A[2]._12_8_ = *(undefined8 *)&(q->end).z;
  A[2][0]._0_4_ = (undefined4)uVar45;
  A[2][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[3][0] = (Real)ccc->p;
  A[3][1] = (Real)ccc->jstride;
  A[3][2] = (Real)ccc->kstride;
  A[4][0] = (Real)ccc->nstride;
  A[4][1] = *(Real *)&ccc->begin;
  uVar45 = *(undefined8 *)&(ccc->begin).z;
  uVar62 = (ccc->end).y;
  A[5]._4_8_ = *(undefined8 *)&(ccc->end).z;
  A[4][2]._0_4_ = (undefined4)uVar45;
  A[4][2]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[5][2] = (Real)fcx->p;
  A[6][0] = (Real)fcx->jstride;
  A[6][1] = (Real)fcx->kstride;
  A[6][2] = (Real)fcx->nstride;
  A[7][0] = *(Real *)&fcx->begin;
  uVar63 = (fcx->end).x;
  uVar64 = (fcx->end).y;
  A._188_8_ = *(undefined8 *)&(fcx->end).z;
  A[7][1]._0_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  A[8][1] = (Real)fcy->p;
  A[8][2] = (Real)fcy->jstride;
  A[9][0] = (Real)fcy->kstride;
  A[9][1] = (Real)fcy->nstride;
  A[9][2] = *(Real *)&fcy->begin;
  uVar65 = (fcy->end).x;
  uVar66 = (fcy->end).y;
  A[10]._12_8_ = *(undefined8 *)&(fcy->end).z;
  A[10][0]._0_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  A[0xb][0] = (Real)fcz->p;
  A[0xb][1] = (Real)fcz->jstride;
  A[0xb][2] = (Real)fcz->kstride;
  A[0xc][0] = (Real)fcz->nstride;
  A[0xc][1] = *(Real *)&fcz->begin;
  uVar67 = (fcz->end).x;
  uVar68 = (fcz->end).y;
  A[0xd]._4_8_ = *(undefined8 *)&(fcz->end).z;
  A[0xc][2]._0_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  A[0xd][2] = (Real)flag->p;
  A[0xe][0] = (Real)flag->jstride;
  A[0xe][1] = (Real)flag->kstride;
  A[0xe][2] = (Real)flag->nstride;
  A[0xf][0] = *(Real *)&flag->begin;
  uVar69 = (flag->end).x;
  uVar70 = (flag->end).y;
  A._380_8_ = *(undefined8 *)&(flag->end).z;
  A[0xf][1]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  A[0x10][1] = (Real)vmac->p;
  A[0x10][2] = (Real)vmac->jstride;
  A[0x11][0] = (Real)vmac->kstride;
  A[0x11][1] = (Real)vmac->nstride;
  A[0x11][2] = *(Real *)&vmac->begin;
  uVar45 = *(undefined8 *)&(vmac->begin).z;
  uVar71 = (vmac->end).y;
  A[0x12]._12_8_ = *(undefined8 *)&(vmac->end).z;
  A[0x12][0]._0_4_ = (undefined4)uVar45;
  A[0x12][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x13][0] = (Real)yedge->p;
  A[0x13][1] = (Real)yedge->jstride;
  A[0x13][2] = (Real)yedge->kstride;
  A[0x14][0] = (Real)yedge->nstride;
  A[0x14][1] = *(Real *)&yedge->begin;
  uVar72 = (yedge->end).x;
  uVar73 = (yedge->end).y;
  A[0x15]._4_8_ = *(undefined8 *)&(yedge->end).z;
  A[0x14][2]._0_4_ = (undefined4)*(undefined8 *)&(yedge->begin).z;
  A[0x15][2] = *(Real *)(domain->smallend).vect;
  uVar45 = *(undefined8 *)(domain->bigend).vect;
  A[0x16]._12_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  A[0x16][0]._0_4_ = (undefined4)*(undefined8 *)((domain->smallend).vect + 2);
  A[0x16][0]._4_4_ = (undefined4)uVar45;
  A[0x16][1]._0_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x17][0] = (Real)vfrac->p;
  A[0x17][1] = (Real)vfrac->jstride;
  A[0x17][2] = (Real)vfrac->kstride;
  A[0x18][0] = (Real)vfrac->nstride;
  A[0x18][1] = *(Real *)&vfrac->begin;
  uVar74 = (vfrac->end).x;
  uVar75 = (vfrac->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x18][2]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
  A[0x19][2]._0_4_ = 2;
  A[0x19][2]._4_1_ = is_velocity;
  A[2][1]._0_4_ = uVar61;
  A[5][0]._0_4_ = uVar62;
  A[7][1]._4_4_ = uVar63;
  A[7][2]._0_4_ = uVar64;
  A[10][0]._4_4_ = uVar65;
  A[10][1]._0_4_ = uVar66;
  A[0xc][2]._4_4_ = uVar67;
  A[0xd][0]._0_4_ = uVar68;
  A[0xf][1]._4_4_ = uVar69;
  A[0xf][2]._0_4_ = uVar70;
  A[0x12][1]._0_4_ = uVar71;
  A[0x14][2]._4_4_ = uVar72;
  A[0x15][0]._0_4_ = uVar73;
  A[0x18][2]._4_4_ = uVar74;
  A[0x19][0]._0_4_ = uVar75;
  for (iVar154 = 0; iVar182 = iVar3, iVar154 != ncomp; iVar154 = iVar154 + 1) {
    for (; iVar152 = iVar2, iVar182 <= iVar196; iVar182 = iVar182 + 1) {
      for (; iVar152 <= iVar135; iVar152 = iVar152 + 1) {
        iVar188 = iVar1;
        if (iVar1 <= iVar4) {
          do {
            ComputeEdgeState::anon_class_624_13_8d2f967f::operator()
                      ((anon_class_624_13_8d2f967f *)A,iVar188,iVar152,iVar182,iVar154);
            iVar188 = iVar188 + 1;
          } while (iVar4 + 1 != iVar188);
        }
      }
    }
  }
  A[0][0] = (Real)d_bcrec_ptr;
  A[0][1] = (Real)q->p;
  A[0][2] = (Real)q->jstride;
  A[1][0] = (Real)q->kstride;
  A[1][1] = (Real)q->nstride;
  A[1][2] = *(Real *)&q->begin;
  uVar45 = *(undefined8 *)&(q->begin).z;
  uVar76 = (q->end).y;
  A[2]._12_8_ = *(undefined8 *)&(q->end).z;
  A[2][0]._0_4_ = (undefined4)uVar45;
  A[2][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[3][0] = (Real)ccc->p;
  A[3][1] = (Real)ccc->jstride;
  A[3][2] = (Real)ccc->kstride;
  A[4][0] = (Real)ccc->nstride;
  A[4][1] = *(Real *)&ccc->begin;
  uVar45 = *(undefined8 *)&(ccc->begin).z;
  uVar77 = (ccc->end).y;
  A[5]._4_8_ = *(undefined8 *)&(ccc->end).z;
  A[4][2]._0_4_ = (undefined4)uVar45;
  A[4][2]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[5][2] = (Real)fcx->p;
  A[6][0] = (Real)fcx->jstride;
  A[6][1] = (Real)fcx->kstride;
  A[6][2] = (Real)fcx->nstride;
  A[7][0] = *(Real *)&fcx->begin;
  uVar78 = (fcx->end).x;
  uVar79 = (fcx->end).y;
  A._188_8_ = *(undefined8 *)&(fcx->end).z;
  A[7][1]._0_4_ = (undefined4)*(undefined8 *)&(fcx->begin).z;
  A[8][1] = (Real)fcy->p;
  A[8][2] = (Real)fcy->jstride;
  A[9][0] = (Real)fcy->kstride;
  A[9][1] = (Real)fcy->nstride;
  A[9][2] = *(Real *)&fcy->begin;
  uVar80 = (fcy->end).x;
  uVar81 = (fcy->end).y;
  A[10]._12_8_ = *(undefined8 *)&(fcy->end).z;
  A[10][0]._0_4_ = (undefined4)*(undefined8 *)&(fcy->begin).z;
  A[0xb][0] = (Real)fcz->p;
  A[0xb][1] = (Real)fcz->jstride;
  A[0xb][2] = (Real)fcz->kstride;
  A[0xc][0] = (Real)fcz->nstride;
  A[0xc][1] = *(Real *)&fcz->begin;
  uVar82 = (fcz->end).x;
  uVar83 = (fcz->end).y;
  A[0xd]._4_8_ = *(undefined8 *)&(fcz->end).z;
  A[0xc][2]._0_4_ = (undefined4)*(undefined8 *)&(fcz->begin).z;
  A[0xd][2] = (Real)flag->p;
  A[0xe][0] = (Real)flag->jstride;
  A[0xe][1] = (Real)flag->kstride;
  A[0xe][2] = (Real)flag->nstride;
  A[0xf][0] = *(Real *)&flag->begin;
  uVar84 = (flag->end).x;
  uVar85 = (flag->end).y;
  A._380_8_ = *(undefined8 *)&(flag->end).z;
  A[0xf][1]._0_4_ = (undefined4)*(undefined8 *)&(flag->begin).z;
  A[0x10][1] = (Real)wmac->p;
  A[0x10][2] = (Real)wmac->jstride;
  A[0x11][0] = (Real)wmac->kstride;
  A[0x11][1] = (Real)wmac->nstride;
  A[0x11][2] = *(Real *)&wmac->begin;
  uVar45 = *(undefined8 *)&(wmac->begin).z;
  uVar86 = (wmac->end).y;
  A[0x12]._12_8_ = *(undefined8 *)&(wmac->end).z;
  A[0x12][0]._0_4_ = (undefined4)uVar45;
  A[0x12][0]._4_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x13][0] = (Real)local_4b8->p;
  A[0x13][1] = (Real)local_4b8->jstride;
  A[0x13][2] = (Real)local_4b8->kstride;
  A[0x14][0] = (Real)local_4b8->nstride;
  A[0x14][1] = *(Real *)&local_4b8->begin;
  uVar87 = (local_4b8->end).x;
  uVar88 = (local_4b8->end).y;
  A[0x15]._4_8_ = *(undefined8 *)&(local_4b8->end).z;
  A[0x14][2]._0_4_ = (undefined4)*(undefined8 *)&(local_4b8->begin).z;
  A[0x15][2] = *(Real *)(domain->smallend).vect;
  uVar45 = *(undefined8 *)(domain->bigend).vect;
  A[0x16]._12_8_ = *(undefined8 *)((domain->bigend).vect + 2);
  A[0x16][0]._0_4_ = (undefined4)*(undefined8 *)((domain->smallend).vect + 2);
  A[0x16][0]._4_4_ = (undefined4)uVar45;
  A[0x16][1]._0_4_ = (undefined4)((ulong)uVar45 >> 0x20);
  A[0x17][0] = (Real)vfrac->p;
  A[0x17][1] = (Real)vfrac->jstride;
  A[0x17][2] = (Real)vfrac->kstride;
  A[0x18][0] = (Real)vfrac->nstride;
  A[0x18][1] = *(Real *)&vfrac->begin;
  uVar89 = (vfrac->end).x;
  uVar90 = (vfrac->end).y;
  A[0x19]._4_8_ = *(undefined8 *)&(vfrac->end).z;
  A[0x18][2]._0_4_ = (undefined4)*(undefined8 *)&(vfrac->begin).z;
  A[0x19][2]._0_4_ = 2;
  A[0x19][2]._4_1_ = is_velocity;
  A[2][1]._0_4_ = uVar76;
  A[5][0]._0_4_ = uVar77;
  A[7][1]._4_4_ = uVar78;
  A[7][2]._0_4_ = uVar79;
  A[10][0]._4_4_ = uVar80;
  A[10][1]._0_4_ = uVar81;
  A[0xc][2]._4_4_ = uVar82;
  A[0xd][0]._0_4_ = uVar83;
  A[0xf][1]._4_4_ = uVar84;
  A[0xf][2]._0_4_ = uVar85;
  A[0x12][1]._0_4_ = uVar86;
  A[0x14][2]._4_4_ = uVar87;
  A[0x15][0]._0_4_ = uVar88;
  A[0x18][2]._4_4_ = uVar89;
  A[0x19][0]._0_4_ = uVar90;
  for (iVar135 = 0; iVar196 = iVar3, iVar135 != ncomp; iVar135 = iVar135 + 1) {
    for (; iVar154 = iVar2, iVar196 <= local_620; iVar196 = iVar196 + 1) {
      for (; iVar154 <= (int)local_4b0; iVar154 = iVar154 + 1) {
        iVar182 = iVar1;
        if (iVar1 <= iVar4) {
          do {
            ComputeEdgeState::anon_class_624_13_b5b87481::operator()
                      ((anon_class_624_13_b5b87481 *)A,iVar182,iVar154,iVar196,iVar135);
            iVar182 = iVar182 + 1;
          } while (iVar4 + 1 != iVar182);
        }
      }
    }
  }
  return;
}

Assistant:

void
EBMOL::ComputeEdgeState ( Box const& bx,
                          AMREX_D_DECL( Array4<Real> const& xedge,
                                        Array4<Real> const& yedge,
                                        Array4<Real> const& zedge),
                          Array4<Real const> const& q,
                          const int ncomp,
                          AMREX_D_DECL( Array4<Real const> const& umac,
                                        Array4<Real const> const& vmac,
                                        Array4<Real const> const& wmac),
                          const Box&       domain,
                          const Vector<BCRec>& bcs,
                          const        BCRec * d_bcrec_ptr,
                          AMREX_D_DECL( Array4<Real const> const& fcx,
                                        Array4<Real const> const& fcy,
                                        Array4<Real const> const& fcz),
                          Array4<Real const> const& ccc,
                          Array4<Real const> const& vfrac,
                          Array4<EBCellFlag const> const& flag,
                          const bool is_velocity)
{

    int order = 2;

    AMREX_D_TERM( const Box& ubx = amrex::surroundingNodes(bx,0);,
                  const Box& vbx = amrex::surroundingNodes(bx,1);,
                  const Box& wbx = amrex::surroundingNodes(bx,2););

    AMREX_D_TERM(
        const int domain_ilo = domain.smallEnd(0);
        const int domain_ihi = domain.bigEnd(0);,
        const int domain_jlo = domain.smallEnd(1);
        const int domain_jhi = domain.bigEnd(1);,
        const int domain_klo = domain.smallEnd(2);
        const int domain_khi = domain.bigEnd(2););

    // ****************************************************************************
    // Decide whether the stencil at each cell might need to see values that
    //     live on face centroids rather than cell centroids, i.e.
    //     are at a domain boundary with ext_dir or hoextrap boundary conditions
    // ****************************************************************************

    auto extdir_lohi_x = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::x));
    bool has_extdir_or_ho_lo_x = extdir_lohi_x.first;
    bool has_extdir_or_ho_hi_x = extdir_lohi_x.second;

    auto extdir_lohi_y = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::y));
    bool has_extdir_or_ho_lo_y = extdir_lohi_y.first;
    bool has_extdir_or_ho_hi_y = extdir_lohi_y.second;

#if (AMREX_SPACEDIM == 3)
    auto extdir_lohi_z = has_extdir_or_ho(bcs.dataPtr(), ncomp, static_cast<int>(Direction::z));
    bool has_extdir_or_ho_lo_z = extdir_lohi_z.first;
    bool has_extdir_or_ho_hi_z = extdir_lohi_z.second;
#endif


    if ((has_extdir_or_ho_lo_x && domain_ilo >= ubx.smallEnd(0)-1) ||
        (has_extdir_or_ho_hi_x && domain_ihi <= ubx.bigEnd(0)    ) ||
        (has_extdir_or_ho_lo_y && domain_jlo >= vbx.smallEnd(1)-1) ||
        (has_extdir_or_ho_hi_y && domain_jhi <= vbx.bigEnd(1)    )
#if (AMREX_SPACEDIM == 2)
        )
#elif (AMREX_SPACEDIM == 3)
        ||
        (has_extdir_or_ho_lo_z && domain_klo >= wbx.smallEnd(2)-1) ||
        (has_extdir_or_ho_hi_z && domain_khi <= wbx.bigEnd(2)    ) )
#endif
    {

        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,umac, xedge, domain, vfrac, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
               xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                       AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                       flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
               xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,vmac,yedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state_extdir( AMREX_D_DECL(i, j, k), n, q, vmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr,q,ccc,AMREX_D_DECL(fcx,fcy,fcz),
                                        flag,wmac,zedge,domain,vfrac,order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state_extdir( i, j, k, n, q, wmac,
                                        AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                        flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }
    else // We assume below that the stencil does not need to use hoextrap or extdir boundaries
    {
        // ****************************************************************************
        // Predict to x-faces
        // ****************************************************************************
        amrex::ParallelFor(ubx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, umac, xedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
           if (flag(i,j,k).isConnected(-1,0,0))
           {
                xedge(i,j,k,n) = EBMOL::hydro_ebmol_xedge_state( AMREX_D_DECL(i, j, k), n, q, umac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
           }
           else
           {
                xedge(i,j,k,n) = 0.0;
           }
        });

        // ****************************************************************************
        // Predict to y-faces
        // ****************************************************************************
        amrex::ParallelFor(vbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, vmac, yedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,-1,0))
            {
                yedge(i,j,k,n) = EBMOL::hydro_ebmol_yedge_state( AMREX_D_DECL(i, j, k), n, q, vmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                yedge(i,j,k,n) = 0.0;
            }
        });

#if ( AMREX_SPACEDIM == 3 )
        // ****************************************************************************
        // Predict to z-faces
        // ****************************************************************************
        amrex::ParallelFor(wbx, ncomp, [d_bcrec_ptr, q,ccc,AMREX_D_DECL(fcx,fcy,fcz),flag, wmac, zedge, vfrac, domain, order, is_velocity]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
        {
            if (flag(i,j,k).isConnected(0,0,-1))
            {
                zedge(i,j,k,n) = EBMOL::hydro_ebmol_zedge_state( AMREX_D_DECL(i, j, k), n, q, wmac,
                                                                 AMREX_D_DECL(fcx,fcy,fcz), ccc, vfrac,
                                                                 flag, d_bcrec_ptr, domain, order, is_velocity );
            }
            else
            {
                zedge(i,j,k,n) = 0.0;
            }
        });
#endif
    }

}